

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined8 uVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Primitive PVar19;
  Geometry *pGVar20;
  __int_type_conflict _Var21;
  long lVar22;
  long lVar23;
  RTCFilterFunctionN p_Var24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [12];
  ulong uVar93;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  uint uVar103;
  ulong uVar104;
  ulong uVar105;
  uint uVar106;
  uint uVar107;
  uint uVar108;
  ulong uVar109;
  long lVar110;
  undefined4 uVar111;
  undefined8 unaff_R13;
  long lVar112;
  bool bVar113;
  __m128 a;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar117 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar135;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar167;
  float fVar168;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar136 [16];
  undefined1 auVar154 [32];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar169;
  undefined1 auVar137 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar170;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar175 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar187;
  float fVar214;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar212;
  float fVar213;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar218;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar219;
  float fVar244;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [28];
  float fVar242;
  float fVar243;
  float fVar245;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar246;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar247;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar248;
  float fVar265;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [28];
  float fVar263;
  float fVar264;
  float fVar266;
  float fVar267;
  undefined1 auVar254 [32];
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar271;
  float fVar277;
  float fVar279;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar281;
  float fVar283;
  float fVar285;
  float fVar287;
  undefined1 auVar275 [28];
  float fVar278;
  float fVar280;
  float fVar282;
  float fVar284;
  float fVar286;
  float fVar288;
  undefined1 auVar276 [32];
  undefined1 auVar289 [16];
  undefined1 auVar290 [28];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar299 [32];
  undefined1 auVar305 [64];
  undefined1 auVar306 [64];
  float s;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar315;
  float fVar318;
  float fVar321;
  float fVar324;
  float fVar327;
  float fVar330;
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  float fVar316;
  float fVar317;
  float fVar319;
  float fVar320;
  float fVar322;
  float fVar323;
  float fVar325;
  float fVar326;
  float fVar328;
  float fVar329;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  float fVar335;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  float fVar352;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [64];
  float fVar353;
  float fVar365;
  float fVar366;
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  float fVar368;
  float fVar369;
  float fVar370;
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  float fVar367;
  float fVar371;
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [64];
  float fVar372;
  float fVar373;
  float fVar378;
  float fVar380;
  float fVar382;
  float fVar384;
  float fVar386;
  float fVar388;
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  float fVar379;
  float fVar381;
  float fVar383;
  float fVar385;
  float fVar387;
  float fVar389;
  undefined1 auVar376 [32];
  undefined1 auVar377 [64];
  float fVar390;
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [64];
  float fVar401;
  float fVar402;
  float fVar406;
  float fVar407;
  float fVar408;
  float fVar409;
  float fVar410;
  float fVar411;
  float fVar412;
  float fVar413;
  float fVar414;
  float fVar415;
  float fVar416;
  float fVar417;
  float fVar418;
  float fVar419;
  float fVar420;
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  float fVar421;
  float fVar425;
  float fVar426;
  float fVar427;
  float fVar428;
  float fVar429;
  float fVar430;
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b8c;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  RTCFilterFunctionNArguments local_af8;
  int local_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  undefined1 local_9c0 [32];
  undefined8 local_990;
  float local_988;
  float local_984;
  undefined4 local_980;
  uint local_97c;
  uint local_978;
  uint local_974;
  uint local_970;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  undefined1 auStack_910 [16];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  float local_820;
  float fStack_81c;
  float fStack_818;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  undefined1 auStack_7f0 [16];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  undefined1 auStack_7d0 [16];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [16];
  Primitive *local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined4 uStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar19 = prim[1];
  uVar104 = (ulong)(byte)PVar19;
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 4 + 6)));
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 4 + 10)));
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 5 + 6)));
  auVar119 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 5 + 10)));
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 6 + 6)));
  lVar112 = uVar104 * 0x25;
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 6 + 10)));
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0xf + 6)));
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0xf + 10)));
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar19 * 0x10 + 6)));
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar19 * 0x10 + 10)));
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0x11 + 6)));
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0x11 + 10)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0x1a + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0x1a + 10)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0x1b + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0x1b + 10)));
  auStack_7b0 = auVar222;
  _local_7c0 = auVar194;
  fVar187 = *(float *)(prim + lVar112 + 0x12);
  auVar202._16_16_ = auVar119;
  auVar202._0_16_ = auVar191;
  auVar194 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar112 + 6));
  auVar272._0_4_ = fVar187 * auVar194._0_4_;
  auVar272._4_4_ = fVar187 * auVar194._4_4_;
  auVar272._8_4_ = fVar187 * auVar194._8_4_;
  auVar272._12_4_ = fVar187 * auVar194._12_4_;
  auVar354._0_4_ = fVar187 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar354._4_4_ = fVar187 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar354._8_4_ = fVar187 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar354._12_4_ = fVar187 * (ray->super_RayK<1>).dir.field_0.m128[3];
  _local_7e0 = vcvtdq2ps_avx(auVar202);
  auVar203._16_16_ = auVar139;
  auVar203._0_16_ = auVar138;
  auVar148 = vcvtdq2ps_avx(auVar203);
  auStack_7f0 = auVar28;
  _local_800 = auVar114;
  auVar232._16_16_ = auVar29;
  auVar232._0_16_ = auVar121;
  auVar159 = vcvtdq2ps_avx(auVar232);
  auVar233._16_16_ = auVar31;
  auVar233._0_16_ = auVar30;
  auVar25 = vcvtdq2ps_avx(auVar233);
  auVar422._16_16_ = auVar33;
  auVar422._0_16_ = auVar32;
  auVar336._16_16_ = auVar35;
  auVar336._0_16_ = auVar34;
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0x1c + 6)));
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0x1c + 10)));
  auVar403._16_16_ = auVar222;
  auVar403._0_16_ = auVar194;
  auVar194 = vshufps_avx(auVar354,auVar354,0x55);
  auVar222 = vshufps_avx(auVar354,auVar354,0xaa);
  fVar187 = auVar222._0_4_;
  fVar212 = auVar222._4_4_;
  fVar213 = auVar222._8_4_;
  fVar214 = auVar222._12_4_;
  fVar215 = auVar194._0_4_;
  fVar216 = auVar194._4_4_;
  fVar217 = auVar194._8_4_;
  fVar219 = auVar194._12_4_;
  auVar114 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar112 + 0x16)) * *(float *)(prim + lVar112 + 0x1a)))
  ;
  _local_920 = ZEXT1632(auVar114);
  auVar342 = vcvtdq2ps_avx(_local_7c0);
  auVar26 = vcvtdq2ps_avx(_local_800);
  auVar208 = vcvtdq2ps_avx(auVar422);
  auVar27 = vcvtdq2ps_avx(auVar336);
  auVar341 = vcvtdq2ps_avx(auVar403);
  auVar194 = vshufps_avx(auVar354,auVar354,0);
  fVar242 = auVar194._0_4_;
  fVar243 = auVar194._4_4_;
  fVar244 = auVar194._8_4_;
  fVar245 = auVar194._12_4_;
  auVar423._0_4_ = fVar242 * auVar342._0_4_ + fVar215 * local_7e0._0_4_ + fVar187 * auVar148._0_4_;
  auVar423._4_4_ = fVar243 * auVar342._4_4_ + fVar216 * local_7e0._4_4_ + fVar212 * auVar148._4_4_;
  auVar423._8_4_ = fVar244 * auVar342._8_4_ + fVar217 * local_7e0._8_4_ + fVar213 * auVar148._8_4_;
  auVar423._12_4_ =
       fVar245 * auVar342._12_4_ + fVar219 * local_7e0._12_4_ + fVar214 * auVar148._12_4_;
  auVar423._16_4_ =
       fVar242 * auVar342._16_4_ + fVar215 * local_7e0._16_4_ + fVar187 * auVar148._16_4_;
  auVar423._20_4_ =
       fVar243 * auVar342._20_4_ + fVar216 * local_7e0._20_4_ + fVar212 * auVar148._20_4_;
  auVar423._24_4_ =
       fVar244 * auVar342._24_4_ + fVar217 * local_7e0._24_4_ + fVar213 * auVar148._24_4_;
  auVar423._28_4_ = fVar219 + 0.0;
  auVar404._0_4_ = fVar242 * auVar26._0_4_ + fVar215 * auVar159._0_4_ + fVar187 * auVar25._0_4_;
  auVar404._4_4_ = fVar243 * auVar26._4_4_ + fVar216 * auVar159._4_4_ + fVar212 * auVar25._4_4_;
  auVar404._8_4_ = fVar244 * auVar26._8_4_ + fVar217 * auVar159._8_4_ + fVar213 * auVar25._8_4_;
  auVar404._12_4_ = fVar245 * auVar26._12_4_ + fVar219 * auVar159._12_4_ + fVar214 * auVar25._12_4_;
  auVar404._16_4_ = fVar242 * auVar26._16_4_ + fVar215 * auVar159._16_4_ + fVar187 * auVar25._16_4_;
  auVar404._20_4_ = fVar243 * auVar26._20_4_ + fVar216 * auVar159._20_4_ + fVar212 * auVar25._20_4_;
  auVar404._24_4_ = fVar244 * auVar26._24_4_ + fVar217 * auVar159._24_4_ + fVar213 * auVar25._24_4_;
  auVar404._28_4_ = 0;
  auVar357._0_4_ = fVar242 * auVar208._0_4_ + fVar215 * auVar27._0_4_ + fVar187 * auVar341._0_4_;
  auVar357._4_4_ = fVar243 * auVar208._4_4_ + fVar216 * auVar27._4_4_ + fVar212 * auVar341._4_4_;
  auVar357._8_4_ = fVar244 * auVar208._8_4_ + fVar217 * auVar27._8_4_ + fVar213 * auVar341._8_4_;
  auVar357._12_4_ = fVar245 * auVar208._12_4_ + fVar219 * auVar27._12_4_ + fVar214 * auVar341._12_4_
  ;
  auVar357._16_4_ = fVar242 * auVar208._16_4_ + fVar215 * auVar27._16_4_ + fVar187 * auVar341._16_4_
  ;
  auVar357._20_4_ = fVar243 * auVar208._20_4_ + fVar216 * auVar27._20_4_ + fVar212 * auVar341._20_4_
  ;
  auVar357._24_4_ = fVar244 * auVar208._24_4_ + fVar217 * auVar27._24_4_ + fVar213 * auVar341._24_4_
  ;
  auVar357._28_4_ = fVar219 + fVar214 + 0.0;
  auVar194 = vshufps_avx(auVar272,auVar272,0x55);
  auVar222 = vshufps_avx(auVar272,auVar272,0xaa);
  fVar215 = auVar222._0_4_;
  fVar216 = auVar222._4_4_;
  fVar217 = auVar222._8_4_;
  fVar219 = auVar222._12_4_;
  fVar242 = auVar194._0_4_;
  fVar243 = auVar194._4_4_;
  fVar244 = auVar194._8_4_;
  fVar245 = auVar194._12_4_;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar104 * 7 + 6);
  auVar194 = vpmovsxwd_avx(auVar194);
  fVar218 = auVar148._28_4_ + 0.0;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + uVar104 * 7 + 0xe);
  auVar222 = vpmovsxwd_avx(auVar222);
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + uVar104 * 0xb + 6);
  auVar191 = vpmovsxwd_avx(auVar191);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + uVar104 * 0xb + 0xe);
  auVar119 = vpmovsxwd_avx(auVar119);
  auVar138 = vshufps_avx(auVar272,auVar272,0);
  fVar187 = auVar138._0_4_;
  fVar212 = auVar138._4_4_;
  fVar213 = auVar138._8_4_;
  fVar214 = auVar138._12_4_;
  auVar179._0_4_ = auVar342._0_4_ * fVar187 + fVar242 * local_7e0._0_4_ + fVar215 * auVar148._0_4_;
  auVar179._4_4_ = auVar342._4_4_ * fVar212 + fVar243 * local_7e0._4_4_ + fVar216 * auVar148._4_4_;
  auVar179._8_4_ = auVar342._8_4_ * fVar213 + fVar244 * local_7e0._8_4_ + fVar217 * auVar148._8_4_;
  auVar179._12_4_ =
       auVar342._12_4_ * fVar214 + fVar245 * local_7e0._12_4_ + fVar219 * auVar148._12_4_;
  auVar179._16_4_ =
       auVar342._16_4_ * fVar187 + fVar242 * local_7e0._16_4_ + fVar215 * auVar148._16_4_;
  auVar179._20_4_ =
       auVar342._20_4_ * fVar212 + fVar243 * local_7e0._20_4_ + fVar216 * auVar148._20_4_;
  auVar179._24_4_ =
       auVar342._24_4_ * fVar213 + fVar244 * local_7e0._24_4_ + fVar217 * auVar148._24_4_;
  auVar179._28_4_ = fVar245 + fVar218;
  auVar374._0_4_ = auVar26._0_4_ * fVar187 + auVar159._0_4_ * fVar242 + fVar215 * auVar25._0_4_;
  auVar374._4_4_ = auVar26._4_4_ * fVar212 + auVar159._4_4_ * fVar243 + fVar216 * auVar25._4_4_;
  auVar374._8_4_ = auVar26._8_4_ * fVar213 + auVar159._8_4_ * fVar244 + fVar217 * auVar25._8_4_;
  auVar374._12_4_ = auVar26._12_4_ * fVar214 + auVar159._12_4_ * fVar245 + fVar219 * auVar25._12_4_;
  auVar374._16_4_ = auVar26._16_4_ * fVar187 + auVar159._16_4_ * fVar242 + fVar215 * auVar25._16_4_;
  auVar374._20_4_ = auVar26._20_4_ * fVar212 + auVar159._20_4_ * fVar243 + fVar216 * auVar25._20_4_;
  auVar374._24_4_ = auVar26._24_4_ * fVar213 + auVar159._24_4_ * fVar244 + fVar217 * auVar25._24_4_;
  auVar374._28_4_ = fVar218 + auVar159._28_4_ + auVar25._28_4_;
  auVar254._8_4_ = 0x7fffffff;
  auVar254._0_8_ = 0x7fffffff7fffffff;
  auVar254._12_4_ = 0x7fffffff;
  auVar254._16_4_ = 0x7fffffff;
  auVar254._20_4_ = 0x7fffffff;
  auVar254._24_4_ = 0x7fffffff;
  auVar254._28_4_ = 0x7fffffff;
  auVar124._0_4_ = fVar187 * auVar208._0_4_ + auVar27._0_4_ * fVar242 + fVar215 * auVar341._0_4_;
  auVar124._4_4_ = fVar212 * auVar208._4_4_ + auVar27._4_4_ * fVar243 + fVar216 * auVar341._4_4_;
  auVar124._8_4_ = fVar213 * auVar208._8_4_ + auVar27._8_4_ * fVar244 + fVar217 * auVar341._8_4_;
  auVar124._12_4_ = fVar214 * auVar208._12_4_ + auVar27._12_4_ * fVar245 + fVar219 * auVar341._12_4_
  ;
  auVar124._16_4_ = fVar187 * auVar208._16_4_ + auVar27._16_4_ * fVar242 + fVar215 * auVar341._16_4_
  ;
  auVar124._20_4_ = fVar212 * auVar208._20_4_ + auVar27._20_4_ * fVar243 + fVar216 * auVar341._20_4_
  ;
  auVar124._24_4_ = fVar213 * auVar208._24_4_ + auVar27._24_4_ * fVar244 + fVar217 * auVar341._24_4_
  ;
  auVar124._28_4_ = fVar218 + fVar245 + auVar341._28_4_;
  auVar148 = vandps_avx(auVar423,auVar254);
  auVar296._8_4_ = 0x219392ef;
  auVar296._0_8_ = 0x219392ef219392ef;
  auVar296._12_4_ = 0x219392ef;
  auVar296._16_4_ = 0x219392ef;
  auVar296._20_4_ = 0x219392ef;
  auVar296._24_4_ = 0x219392ef;
  auVar296._28_4_ = 0x219392ef;
  auVar148 = vcmpps_avx(auVar148,auVar296,1);
  auVar159 = vblendvps_avx(auVar423,auVar296,auVar148);
  auVar148 = vandps_avx(auVar404,auVar254);
  auVar148 = vcmpps_avx(auVar148,auVar296,1);
  auVar25 = vblendvps_avx(auVar404,auVar296,auVar148);
  auVar148 = vandps_avx(auVar357,auVar254);
  auVar148 = vcmpps_avx(auVar148,auVar296,1);
  auVar342 = vrcpps_avx(auVar159);
  auVar148 = vblendvps_avx(auVar357,auVar296,auVar148);
  auVar358._8_4_ = 0x3f800000;
  auVar358._0_8_ = 0x3f8000003f800000;
  auVar358._12_4_ = 0x3f800000;
  auVar358._16_4_ = 0x3f800000;
  auVar358._20_4_ = 0x3f800000;
  auVar358._24_4_ = 0x3f800000;
  auVar358._28_4_ = 0x3f800000;
  fVar187 = auVar342._0_4_;
  fVar212 = auVar342._4_4_;
  auVar26._4_4_ = auVar159._4_4_ * fVar212;
  auVar26._0_4_ = auVar159._0_4_ * fVar187;
  fVar213 = auVar342._8_4_;
  auVar26._8_4_ = auVar159._8_4_ * fVar213;
  fVar214 = auVar342._12_4_;
  auVar26._12_4_ = auVar159._12_4_ * fVar214;
  fVar215 = auVar342._16_4_;
  auVar26._16_4_ = auVar159._16_4_ * fVar215;
  fVar216 = auVar342._20_4_;
  auVar26._20_4_ = auVar159._20_4_ * fVar216;
  fVar217 = auVar342._24_4_;
  auVar26._24_4_ = auVar159._24_4_ * fVar217;
  auVar26._28_4_ = auVar159._28_4_;
  auVar208 = vsubps_avx(auVar358,auVar26);
  fVar187 = fVar187 + fVar187 * auVar208._0_4_;
  fVar212 = fVar212 + fVar212 * auVar208._4_4_;
  fVar213 = fVar213 + fVar213 * auVar208._8_4_;
  fVar214 = fVar214 + fVar214 * auVar208._12_4_;
  fVar215 = fVar215 + fVar215 * auVar208._16_4_;
  fVar216 = fVar216 + fVar216 * auVar208._20_4_;
  fVar217 = fVar217 + fVar217 * auVar208._24_4_;
  auVar26 = vrcpps_avx(auVar25);
  fVar219 = auVar26._0_4_;
  fVar242 = auVar26._4_4_;
  auVar159._4_4_ = fVar242 * auVar25._4_4_;
  auVar159._0_4_ = fVar219 * auVar25._0_4_;
  fVar243 = auVar26._8_4_;
  auVar159._8_4_ = fVar243 * auVar25._8_4_;
  fVar244 = auVar26._12_4_;
  auVar159._12_4_ = fVar244 * auVar25._12_4_;
  fVar245 = auVar26._16_4_;
  auVar159._16_4_ = fVar245 * auVar25._16_4_;
  fVar218 = auVar26._20_4_;
  auVar159._20_4_ = fVar218 * auVar25._20_4_;
  fVar246 = auVar26._24_4_;
  auVar159._24_4_ = fVar246 * auVar25._24_4_;
  auVar159._28_4_ = auVar25._28_4_;
  auVar25 = vsubps_avx(auVar358,auVar159);
  auVar159 = vrcpps_avx(auVar148);
  fVar219 = fVar219 + fVar219 * auVar25._0_4_;
  fVar242 = fVar242 + fVar242 * auVar25._4_4_;
  fVar243 = fVar243 + fVar243 * auVar25._8_4_;
  fVar244 = fVar244 + fVar244 * auVar25._12_4_;
  fVar245 = fVar245 + fVar245 * auVar25._16_4_;
  fVar218 = fVar218 + fVar218 * auVar25._20_4_;
  fVar246 = fVar246 + fVar246 * auVar25._24_4_;
  fVar248 = auVar159._0_4_;
  fVar263 = auVar159._4_4_;
  auVar27._4_4_ = fVar263 * auVar148._4_4_;
  auVar27._0_4_ = fVar248 * auVar148._0_4_;
  fVar264 = auVar159._8_4_;
  auVar27._8_4_ = fVar264 * auVar148._8_4_;
  fVar265 = auVar159._12_4_;
  auVar27._12_4_ = fVar265 * auVar148._12_4_;
  fVar266 = auVar159._16_4_;
  auVar27._16_4_ = fVar266 * auVar148._16_4_;
  fVar267 = auVar159._20_4_;
  auVar27._20_4_ = fVar267 * auVar148._20_4_;
  fVar269 = auVar159._24_4_;
  auVar27._24_4_ = fVar269 * auVar148._24_4_;
  auVar27._28_4_ = auVar148._28_4_;
  auVar148 = vsubps_avx(auVar358,auVar27);
  fVar248 = fVar248 + fVar248 * auVar148._0_4_;
  fVar263 = fVar263 + fVar263 * auVar148._4_4_;
  fVar264 = fVar264 + fVar264 * auVar148._8_4_;
  fVar265 = fVar265 + fVar265 * auVar148._12_4_;
  fVar266 = fVar266 + fVar266 * auVar148._16_4_;
  fVar267 = fVar267 + fVar267 * auVar148._20_4_;
  fVar269 = fVar269 + fVar269 * auVar148._24_4_;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + uVar104 * 9 + 6);
  auVar138 = vpmovsxwd_avx(auVar138);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + uVar104 * 9 + 0xe);
  auVar139 = vpmovsxwd_avx(auVar139);
  auVar114 = vpermilps_avx(auVar114,0);
  auVar148._16_16_ = auVar222;
  auVar148._0_16_ = auVar194;
  auVar148 = vcvtdq2ps_avx(auVar148);
  auVar291._16_16_ = auVar119;
  auVar291._0_16_ = auVar191;
  auVar159 = vcvtdq2ps_avx(auVar291);
  auVar159 = vsubps_avx(auVar159,auVar148);
  fVar268 = auVar114._0_4_;
  fVar270 = auVar114._4_4_;
  fVar307 = auVar114._8_4_;
  fVar315 = auVar114._12_4_;
  auVar292._0_4_ = auVar148._0_4_ + fVar268 * auVar159._0_4_;
  auVar292._4_4_ = auVar148._4_4_ + fVar270 * auVar159._4_4_;
  auVar292._8_4_ = auVar148._8_4_ + fVar307 * auVar159._8_4_;
  auVar292._12_4_ = auVar148._12_4_ + fVar315 * auVar159._12_4_;
  auVar292._16_4_ = auVar148._16_4_ + fVar268 * auVar159._16_4_;
  auVar292._20_4_ = auVar148._20_4_ + fVar270 * auVar159._20_4_;
  auVar292._24_4_ = auVar148._24_4_ + fVar307 * auVar159._24_4_;
  auVar292._28_4_ = auVar148._28_4_ + auVar159._28_4_;
  auVar149._16_16_ = auVar139;
  auVar149._0_16_ = auVar138;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar104 * 0xd + 6);
  auVar194 = vpmovsxwd_avx(auVar114);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar104 * 0xd + 0xe);
  auVar222 = vpmovsxwd_avx(auVar28);
  auVar148 = vcvtdq2ps_avx(auVar149);
  auVar297._16_16_ = auVar222;
  auVar297._0_16_ = auVar194;
  auVar159 = vcvtdq2ps_avx(auVar297);
  auVar159 = vsubps_avx(auVar159,auVar148);
  auVar298._0_4_ = auVar159._0_4_ * fVar268 + auVar148._0_4_;
  auVar298._4_4_ = auVar159._4_4_ * fVar270 + auVar148._4_4_;
  auVar298._8_4_ = auVar159._8_4_ * fVar307 + auVar148._8_4_;
  auVar298._12_4_ = auVar159._12_4_ * fVar315 + auVar148._12_4_;
  auVar298._16_4_ = auVar159._16_4_ * fVar268 + auVar148._16_4_;
  auVar298._20_4_ = auVar159._20_4_ * fVar270 + auVar148._20_4_;
  auVar298._24_4_ = auVar159._24_4_ * fVar307 + auVar148._24_4_;
  auVar298._28_4_ = auVar159._28_4_ + auVar148._28_4_;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + uVar104 * 0x12 + 6);
  auVar194 = vpmovsxwd_avx(auVar121);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar104 * 0x12 + 0xe);
  auVar222 = vpmovsxwd_avx(auVar29);
  auVar150._16_16_ = auVar222;
  auVar150._0_16_ = auVar194;
  auVar148 = vcvtdq2ps_avx(auVar150);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar104 * 0x16 + 6);
  auVar194 = vpmovsxwd_avx(auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar104 * 0x16 + 0xe);
  auVar222 = vpmovsxwd_avx(auVar31);
  auVar310._16_16_ = auVar222;
  auVar310._0_16_ = auVar194;
  auVar159 = vcvtdq2ps_avx(auVar310);
  auVar159 = vsubps_avx(auVar159,auVar148);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar104 * 0x14 + 6);
  auVar194 = vpmovsxwd_avx(auVar32);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar104 * 0x14 + 0xe);
  auVar222 = vpmovsxwd_avx(auVar33);
  auVar311._0_4_ = auVar159._0_4_ * fVar268 + auVar148._0_4_;
  auVar311._4_4_ = auVar159._4_4_ * fVar270 + auVar148._4_4_;
  auVar311._8_4_ = auVar159._8_4_ * fVar307 + auVar148._8_4_;
  auVar311._12_4_ = auVar159._12_4_ * fVar315 + auVar148._12_4_;
  auVar311._16_4_ = auVar159._16_4_ * fVar268 + auVar148._16_4_;
  auVar311._20_4_ = auVar159._20_4_ * fVar270 + auVar148._20_4_;
  auVar311._24_4_ = auVar159._24_4_ * fVar307 + auVar148._24_4_;
  auVar311._28_4_ = auVar159._28_4_ + auVar148._28_4_;
  auVar151._16_16_ = auVar222;
  auVar151._0_16_ = auVar194;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar104 * 0x18 + 6);
  auVar194 = vpmovsxwd_avx(auVar34);
  auVar148 = vcvtdq2ps_avx(auVar151);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar104 * 0x18 + 0xe);
  auVar222 = vpmovsxwd_avx(auVar35);
  auVar337._16_16_ = auVar222;
  auVar337._0_16_ = auVar194;
  auVar159 = vcvtdq2ps_avx(auVar337);
  auVar159 = vsubps_avx(auVar159,auVar148);
  auVar338._0_4_ = auVar159._0_4_ * fVar268 + auVar148._0_4_;
  auVar338._4_4_ = auVar159._4_4_ * fVar270 + auVar148._4_4_;
  auVar338._8_4_ = auVar159._8_4_ * fVar307 + auVar148._8_4_;
  auVar338._12_4_ = auVar159._12_4_ * fVar315 + auVar148._12_4_;
  auVar338._16_4_ = auVar159._16_4_ * fVar268 + auVar148._16_4_;
  auVar338._20_4_ = auVar159._20_4_ * fVar270 + auVar148._20_4_;
  auVar338._24_4_ = auVar159._24_4_ * fVar307 + auVar148._24_4_;
  auVar338._28_4_ = auVar159._28_4_ + auVar148._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar104 * 0x1d + 6);
  auVar194 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar104 * 0x1d + 0xe);
  auVar222 = vpmovsxwd_avx(auVar12);
  auVar152._16_16_ = auVar222;
  auVar152._0_16_ = auVar194;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar104 * 0x21 + 6);
  auVar194 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar104 * 0x21 + 0xe);
  auVar222 = vpmovsxwd_avx(auVar14);
  auVar359._16_16_ = auVar222;
  auVar359._0_16_ = auVar194;
  auVar148 = vcvtdq2ps_avx(auVar152);
  auVar159 = vcvtdq2ps_avx(auVar359);
  auVar159 = vsubps_avx(auVar159,auVar148);
  auVar153._0_4_ = auVar159._0_4_ * fVar268 + auVar148._0_4_;
  auVar153._4_4_ = auVar159._4_4_ * fVar270 + auVar148._4_4_;
  auVar153._8_4_ = auVar159._8_4_ * fVar307 + auVar148._8_4_;
  auVar153._12_4_ = auVar159._12_4_ * fVar315 + auVar148._12_4_;
  auVar153._16_4_ = auVar159._16_4_ * fVar268 + auVar148._16_4_;
  auVar153._20_4_ = auVar159._20_4_ * fVar270 + auVar148._20_4_;
  auVar153._24_4_ = auVar159._24_4_ * fVar307 + auVar148._24_4_;
  auVar153._28_4_ = auVar159._28_4_ + auVar148._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar104 * 0x1f + 6);
  auVar194 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar104 * 0x1f + 0xe);
  auVar222 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar104 * 0x23 + 6);
  auVar191 = vpmovsxwd_avx(auVar17);
  auVar360._16_16_ = auVar222;
  auVar360._0_16_ = auVar194;
  local_788 = prim;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar104 * 0x23 + 0xe);
  auVar194 = vpmovsxwd_avx(auVar18);
  auVar391._16_16_ = auVar194;
  auVar391._0_16_ = auVar191;
  auVar148 = vcvtdq2ps_avx(auVar360);
  auVar159 = vcvtdq2ps_avx(auVar391);
  auVar159 = vsubps_avx(auVar159,auVar148);
  auVar361._0_4_ = auVar148._0_4_ + auVar159._0_4_ * fVar268;
  auVar361._4_4_ = auVar148._4_4_ + auVar159._4_4_ * fVar270;
  auVar361._8_4_ = auVar148._8_4_ + auVar159._8_4_ * fVar307;
  auVar361._12_4_ = auVar148._12_4_ + auVar159._12_4_ * fVar315;
  auVar361._16_4_ = auVar148._16_4_ + auVar159._16_4_ * fVar268;
  auVar361._20_4_ = auVar148._20_4_ + auVar159._20_4_ * fVar270;
  auVar361._24_4_ = auVar148._24_4_ + auVar159._24_4_ * fVar307;
  auVar361._28_4_ = auVar148._28_4_ + fVar315;
  auVar148 = vsubps_avx(auVar292,auVar179);
  auVar273._0_4_ = fVar187 * auVar148._0_4_;
  auVar273._4_4_ = fVar212 * auVar148._4_4_;
  auVar273._8_4_ = fVar213 * auVar148._8_4_;
  auVar273._12_4_ = fVar214 * auVar148._12_4_;
  auVar341._16_4_ = fVar215 * auVar148._16_4_;
  auVar341._0_16_ = auVar273;
  auVar341._20_4_ = fVar216 * auVar148._20_4_;
  auVar341._24_4_ = fVar217 * auVar148._24_4_;
  auVar341._28_4_ = auVar148._28_4_;
  auVar148 = vsubps_avx(auVar298,auVar179);
  auVar188._0_4_ = fVar187 * auVar148._0_4_;
  auVar188._4_4_ = fVar212 * auVar148._4_4_;
  auVar188._8_4_ = fVar213 * auVar148._8_4_;
  auVar188._12_4_ = fVar214 * auVar148._12_4_;
  auVar36._16_4_ = fVar215 * auVar148._16_4_;
  auVar36._0_16_ = auVar188;
  auVar36._20_4_ = fVar216 * auVar148._20_4_;
  auVar36._24_4_ = fVar217 * auVar148._24_4_;
  auVar36._28_4_ = auVar342._28_4_ + auVar208._28_4_;
  auVar148 = vsubps_avx(auVar311,auVar374);
  auVar171._0_4_ = fVar219 * auVar148._0_4_;
  auVar171._4_4_ = fVar242 * auVar148._4_4_;
  auVar171._8_4_ = fVar243 * auVar148._8_4_;
  auVar171._12_4_ = fVar244 * auVar148._12_4_;
  auVar342._16_4_ = fVar245 * auVar148._16_4_;
  auVar342._0_16_ = auVar171;
  auVar342._20_4_ = fVar218 * auVar148._20_4_;
  auVar342._24_4_ = fVar246 * auVar148._24_4_;
  auVar342._28_4_ = auVar148._28_4_;
  auVar148 = vsubps_avx(auVar338,auVar374);
  auVar220._0_4_ = fVar219 * auVar148._0_4_;
  auVar220._4_4_ = fVar242 * auVar148._4_4_;
  auVar220._8_4_ = fVar243 * auVar148._8_4_;
  auVar220._12_4_ = fVar244 * auVar148._12_4_;
  auVar208._16_4_ = fVar245 * auVar148._16_4_;
  auVar208._0_16_ = auVar220;
  auVar208._20_4_ = fVar218 * auVar148._20_4_;
  auVar208._24_4_ = fVar246 * auVar148._24_4_;
  auVar208._28_4_ = auVar26._28_4_ + auVar25._28_4_;
  auVar148 = vsubps_avx(auVar153,auVar124);
  auVar136._0_4_ = fVar248 * auVar148._0_4_;
  auVar136._4_4_ = fVar263 * auVar148._4_4_;
  auVar136._8_4_ = fVar264 * auVar148._8_4_;
  auVar136._12_4_ = fVar265 * auVar148._12_4_;
  auVar25._16_4_ = fVar266 * auVar148._16_4_;
  auVar25._0_16_ = auVar136;
  auVar25._20_4_ = fVar267 * auVar148._20_4_;
  auVar25._24_4_ = fVar269 * auVar148._24_4_;
  auVar25._28_4_ = auVar148._28_4_;
  auVar148 = vsubps_avx(auVar361,auVar124);
  auVar115._0_4_ = fVar248 * auVar148._0_4_;
  auVar115._4_4_ = fVar263 * auVar148._4_4_;
  auVar115._8_4_ = fVar264 * auVar148._8_4_;
  auVar115._12_4_ = fVar265 * auVar148._12_4_;
  auVar37._16_4_ = fVar266 * auVar148._16_4_;
  auVar37._0_16_ = auVar115;
  auVar37._20_4_ = fVar267 * auVar148._20_4_;
  auVar37._24_4_ = fVar269 * auVar148._24_4_;
  auVar37._28_4_ = auVar148._28_4_;
  auVar194 = vpminsd_avx(auVar341._16_16_,auVar36._16_16_);
  auVar222 = vpminsd_avx(auVar273,auVar188);
  auVar299._16_16_ = auVar194;
  auVar299._0_16_ = auVar222;
  auVar194 = vpminsd_avx(auVar342._16_16_,auVar208._16_16_);
  auVar222 = vpminsd_avx(auVar171,auVar220);
  auVar312._16_16_ = auVar194;
  auVar312._0_16_ = auVar222;
  auVar148 = vmaxps_avx(auVar299,auVar312);
  auVar194 = vpminsd_avx(auVar25._16_16_,auVar37._16_16_);
  auVar222 = vpminsd_avx(auVar136,auVar115);
  auVar392._16_16_ = auVar194;
  auVar392._0_16_ = auVar222;
  uVar111 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar405._4_4_ = uVar111;
  auVar405._0_4_ = uVar111;
  auVar405._8_4_ = uVar111;
  auVar405._12_4_ = uVar111;
  auVar405._16_4_ = uVar111;
  auVar405._20_4_ = uVar111;
  auVar405._24_4_ = uVar111;
  auVar405._28_4_ = uVar111;
  auVar159 = vmaxps_avx(auVar392,auVar405);
  auVar148 = vmaxps_avx(auVar148,auVar159);
  local_340._4_4_ = auVar148._4_4_ * 0.99999964;
  local_340._0_4_ = auVar148._0_4_ * 0.99999964;
  local_340._8_4_ = auVar148._8_4_ * 0.99999964;
  local_340._12_4_ = auVar148._12_4_ * 0.99999964;
  local_340._16_4_ = auVar148._16_4_ * 0.99999964;
  local_340._20_4_ = auVar148._20_4_ * 0.99999964;
  local_340._24_4_ = auVar148._24_4_ * 0.99999964;
  local_340._28_4_ = auVar148._28_4_;
  auVar194 = vpmaxsd_avx(auVar341._16_16_,auVar36._16_16_);
  auVar222 = vpmaxsd_avx(auVar273,auVar188);
  auVar204._16_16_ = auVar194;
  auVar204._0_16_ = auVar222;
  auVar194 = vpmaxsd_avx(auVar342._16_16_,auVar208._16_16_);
  auVar222 = vpmaxsd_avx(auVar171,auVar220);
  auVar180._16_16_ = auVar194;
  auVar180._0_16_ = auVar222;
  auVar148 = vminps_avx(auVar204,auVar180);
  auVar194 = vpmaxsd_avx(auVar25._16_16_,auVar37._16_16_);
  auVar222 = vpmaxsd_avx(auVar136,auVar115);
  fVar187 = (ray->super_RayK<1>).tfar;
  auVar154._4_4_ = fVar187;
  auVar154._0_4_ = fVar187;
  auVar154._8_4_ = fVar187;
  auVar154._12_4_ = fVar187;
  auVar154._16_4_ = fVar187;
  auVar154._20_4_ = fVar187;
  auVar154._24_4_ = fVar187;
  auVar154._28_4_ = fVar187;
  auVar125._16_16_ = auVar194;
  auVar125._0_16_ = auVar222;
  auVar159 = vminps_avx(auVar125,auVar154);
  auVar148 = vminps_avx(auVar148,auVar159);
  auVar38._4_4_ = auVar148._4_4_ * 1.0000004;
  auVar38._0_4_ = auVar148._0_4_ * 1.0000004;
  auVar38._8_4_ = auVar148._8_4_ * 1.0000004;
  auVar38._12_4_ = auVar148._12_4_ * 1.0000004;
  auVar38._16_4_ = auVar148._16_4_ * 1.0000004;
  auVar38._20_4_ = auVar148._20_4_ * 1.0000004;
  auVar38._24_4_ = auVar148._24_4_ * 1.0000004;
  auVar38._28_4_ = auVar148._28_4_;
  auVar148 = vcmpps_avx(local_340,auVar38,2);
  auVar194 = vpshufd_avx(ZEXT116((byte)PVar19),0);
  auVar155._16_16_ = auVar194;
  auVar155._0_16_ = auVar194;
  auVar159 = vcvtdq2ps_avx(auVar155);
  auVar159 = vcmpps_avx(_DAT_01f7b060,auVar159,1);
  auVar148 = vandps_avx(auVar148,auVar159);
  auVar156._16_16_ = mm_lookupmask_ps._240_16_;
  auVar156._0_16_ = mm_lookupmask_ps._240_16_;
  uVar111 = vmovmskps_avx(auVar148);
  uVar104 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar111);
  local_4e0 = vblendps_avx(auVar156,ZEXT832(0) << 0x20,0x80);
LAB_00b2c507:
  if (uVar104 == 0) {
    return;
  }
  lVar112 = 0;
  if (uVar104 != 0) {
    for (; (uVar104 >> lVar112 & 1) == 0; lVar112 = lVar112 + 1) {
    }
  }
  uVar107 = *(uint *)(local_788 + 2);
  pGVar20 = (context->scene->geometries).items[uVar107].ptr;
  uVar105 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                            (ulong)*(uint *)(local_788 + lVar112 * 4 + 6) *
                            pGVar20[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar187 = (pGVar20->time_range).lower;
  fVar187 = pGVar20->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar187) /
            ((pGVar20->time_range).upper - fVar187));
  auVar194 = vroundss_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),9);
  auVar194 = vminss_avx(auVar194,ZEXT416((uint)(pGVar20->fnumTimeSegments + -1.0)));
  auVar194 = vmaxss_avx(ZEXT816(0) << 0x20,auVar194);
  fVar187 = fVar187 - auVar194._0_4_;
  _Var21 = pGVar20[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar110 = (long)(int)auVar194._0_4_ * 0x38;
  lVar22 = *(long *)(_Var21 + lVar110);
  lVar23 = *(long *)(_Var21 + 0x10 + lVar110);
  auVar194 = vshufps_avx(ZEXT416((uint)(1.0 - fVar187)),ZEXT416((uint)(1.0 - fVar187)),0);
  pfVar1 = (float *)(lVar22 + lVar23 * uVar105);
  fVar212 = auVar194._0_4_;
  fVar213 = auVar194._4_4_;
  fVar215 = auVar194._8_4_;
  fVar217 = auVar194._12_4_;
  pfVar2 = (float *)(lVar22 + lVar23 * (uVar105 + 1));
  pfVar3 = (float *)(lVar22 + lVar23 * (uVar105 + 2));
  pfVar4 = (float *)(lVar22 + lVar23 * (uVar105 + 3));
  lVar22 = *(long *)(_Var21 + 0x38 + lVar110);
  lVar23 = *(long *)(_Var21 + 0x48 + lVar110);
  auVar194 = vshufps_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),0);
  pfVar5 = (float *)(lVar22 + uVar105 * lVar23);
  fVar219 = auVar194._0_4_;
  fVar242 = auVar194._4_4_;
  fVar243 = auVar194._8_4_;
  fVar244 = auVar194._12_4_;
  pfVar6 = (float *)(lVar22 + (uVar105 + 1) * lVar23);
  pfVar7 = (float *)(lVar22 + (uVar105 + 2) * lVar23);
  auVar189._0_4_ = fVar219 * *pfVar5 + fVar212 * *pfVar1;
  auVar189._4_4_ = fVar242 * pfVar5[1] + fVar213 * pfVar1[1];
  auVar189._8_4_ = fVar243 * pfVar5[2] + fVar215 * pfVar1[2];
  auVar189._12_4_ = fVar244 * pfVar5[3] + fVar217 * pfVar1[3];
  auVar221._0_4_ = fVar212 * *pfVar2 + fVar219 * *pfVar6;
  auVar221._4_4_ = fVar213 * pfVar2[1] + fVar242 * pfVar6[1];
  auVar221._8_4_ = fVar215 * pfVar2[2] + fVar243 * pfVar6[2];
  auVar221._12_4_ = fVar217 * pfVar2[3] + fVar244 * pfVar6[3];
  auVar249._0_4_ = fVar212 * *pfVar3 + fVar219 * *pfVar7;
  auVar249._4_4_ = fVar213 * pfVar3[1] + fVar242 * pfVar7[1];
  auVar249._8_4_ = fVar215 * pfVar3[2] + fVar243 * pfVar7[2];
  auVar249._12_4_ = fVar217 * pfVar3[3] + fVar244 * pfVar7[3];
  auVar116._0_4_ = (auVar189._0_4_ + auVar221._0_4_) * 0.5;
  auVar116._4_4_ = (auVar189._4_4_ + auVar221._4_4_) * 0.5;
  auVar116._8_4_ = (auVar189._8_4_ + auVar221._8_4_) * 0.5;
  auVar116._12_4_ = (auVar189._12_4_ + auVar221._12_4_) * 0.5;
  aVar9 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar10 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar194 = vsubps_avx(auVar116,(undefined1  [16])aVar9);
  auVar194 = vdpps_avx(auVar194,(undefined1  [16])aVar10,0x7f);
  auVar222 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
  auVar191 = vrcpss_avx(auVar222,auVar222);
  auVar345 = ZEXT464(0x40000000);
  fVar187 = auVar191._0_4_ * (2.0 - auVar222._0_4_ * auVar191._0_4_) * auVar194._0_4_;
  local_7a0 = ZEXT416((uint)fVar187);
  auVar222 = vshufps_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),0);
  fVar187 = aVar10.x;
  fVar214 = aVar10.y;
  fVar216 = aVar10.z;
  aVar169 = aVar10.field_3;
  auVar289._0_4_ = fVar187 * auVar222._0_4_ + aVar9.x;
  auVar289._4_4_ = fVar214 * auVar222._4_4_ + aVar9.y;
  auVar289._8_4_ = fVar216 * auVar222._8_4_ + aVar9.z;
  auVar289._12_4_ = aVar169.w * auVar222._12_4_ + aVar9.field_3.w;
  auVar194 = vblendps_avx(auVar289,_DAT_01f45a50,8);
  auVar191 = vsubps_avx(auVar189,auVar194);
  auVar305 = ZEXT1664(auVar191);
  pfVar1 = (float *)(lVar22 + lVar23 * (uVar105 + 3));
  auVar138 = vsubps_avx(auVar249,auVar194);
  auVar172._0_4_ = fVar212 * *pfVar4 + fVar219 * *pfVar1;
  auVar172._4_4_ = fVar213 * pfVar4[1] + fVar242 * pfVar1[1];
  auVar172._8_4_ = fVar215 * pfVar4[2] + fVar243 * pfVar1[2];
  auVar172._12_4_ = fVar217 * pfVar4[3] + fVar244 * pfVar1[3];
  auVar119 = vsubps_avx(auVar221,auVar194);
  auVar139 = vsubps_avx(auVar172,auVar194);
  auVar194 = vshufps_avx(auVar191,auVar191,0);
  register0x000015d0 = auVar194;
  _local_a80 = auVar194;
  auVar424 = ZEXT3264(_local_a80);
  auVar194 = vshufps_avx(auVar191,auVar191,0x55);
  register0x00001290 = auVar194;
  _local_1e0 = auVar194;
  auVar194 = vshufps_avx(auVar191,auVar191,0xaa);
  register0x00001290 = auVar194;
  _local_200 = auVar194;
  _local_920 = auVar191;
  auVar194 = vshufps_avx(auVar191,auVar191,0xff);
  register0x00001290 = auVar194;
  _local_220 = auVar194;
  auVar194 = vshufps_avx(auVar119,auVar119,0);
  register0x00001290 = auVar194;
  _local_3e0 = auVar194;
  auVar194 = vshufps_avx(auVar119,auVar119,0x55);
  register0x00001290 = auVar194;
  _local_400 = auVar194;
  auVar194 = vshufps_avx(auVar119,auVar119,0xaa);
  register0x00001290 = auVar194;
  _local_420 = auVar194;
  auVar137._0_4_ = fVar187 * fVar187;
  auVar137._4_4_ = fVar214 * fVar214;
  auVar137._8_4_ = fVar216 * fVar216;
  auVar137._12_4_ = aVar169.w * aVar169.w;
  auVar194 = vshufps_avx(auVar137,auVar137,0xaa);
  auVar191 = vshufps_avx(auVar137,auVar137,0x55);
  _local_7e0 = auVar119;
  auVar119 = vshufps_avx(auVar119,auVar119,0xff);
  register0x000012d0 = auVar119;
  _local_240 = auVar119;
  auVar119 = vshufps_avx(auVar137,auVar137,0);
  local_260._0_4_ = auVar119._0_4_ + auVar191._0_4_ + auVar194._0_4_;
  local_260._4_4_ = auVar119._4_4_ + auVar191._4_4_ + auVar194._4_4_;
  local_260._8_4_ = auVar119._8_4_ + auVar191._8_4_ + auVar194._8_4_;
  local_260._12_4_ = auVar119._12_4_ + auVar191._12_4_ + auVar194._12_4_;
  local_260._16_4_ = auVar119._0_4_ + auVar191._0_4_ + auVar194._0_4_;
  local_260._20_4_ = auVar119._4_4_ + auVar191._4_4_ + auVar194._4_4_;
  local_260._24_4_ = auVar119._8_4_ + auVar191._8_4_ + auVar194._8_4_;
  local_260._28_4_ = auVar119._12_4_ + auVar191._12_4_ + auVar194._12_4_;
  auVar194 = vshufps_avx(auVar138,auVar138,0);
  register0x00001550 = auVar194;
  _local_940 = auVar194;
  auVar394 = ZEXT3264(_local_940);
  auVar194 = vshufps_avx(auVar138,auVar138,0x55);
  register0x00001250 = auVar194;
  _local_440 = auVar194;
  auVar194 = vshufps_avx(auVar138,auVar138,0xaa);
  register0x00001250 = auVar194;
  _local_460 = auVar194;
  _local_7c0 = auVar138;
  auVar194 = vshufps_avx(auVar138,auVar138,0xff);
  register0x00001250 = auVar194;
  _local_480 = auVar194;
  auVar194 = vshufps_avx(auVar139,auVar139,0);
  register0x00001510 = auVar194;
  _local_a00 = auVar194;
  auVar377 = ZEXT3264(_local_a00);
  auVar194 = vshufps_avx(auVar139,auVar139,0x55);
  register0x000014d0 = auVar194;
  _local_a20 = auVar194;
  auVar364 = ZEXT3264(_local_a20);
  auVar194 = vshufps_avx(auVar139,auVar139,0xaa);
  register0x00001250 = auVar194;
  _local_4a0 = auVar194;
  _local_800 = auVar139;
  auVar194 = vshufps_avx(auVar139,auVar139,0xff);
  register0x00001250 = auVar194;
  _local_280 = auVar194;
  register0x00001210 = auVar222;
  _local_860 = auVar222;
  uVar109 = 0;
  local_b8c = 1;
  local_4c0 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_4bc = local_4c0;
  fStack_4b8 = local_4c0;
  fStack_4b4 = local_4c0;
  fStack_4b0 = local_4c0;
  fStack_4ac = local_4c0;
  fStack_4a8 = local_4c0;
  fStack_4a4 = local_4c0;
  local_960 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_95c = local_960;
  fStack_958 = local_960;
  fStack_954 = local_960;
  fStack_950 = local_960;
  fStack_94c = local_960;
  fStack_948 = local_960;
  fStack_944 = local_960;
  local_700 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_6fc = local_700;
  fStack_6f8 = local_700;
  fStack_6f4 = local_700;
  fStack_6f0 = local_700;
  fStack_6ec = local_700;
  fStack_6e8 = local_700;
  fStack_6e4 = local_700;
  auVar126._8_4_ = 0x7fffffff;
  auVar126._0_8_ = 0x7fffffff7fffffff;
  auVar126._12_4_ = 0x7fffffff;
  auVar126._16_4_ = 0x7fffffff;
  auVar126._20_4_ = 0x7fffffff;
  auVar126._24_4_ = 0x7fffffff;
  auVar126._28_4_ = 0x7fffffff;
  local_500 = vandps_avx(local_260,auVar126);
  local_5d0 = ZEXT816(0x3f80000000000000);
  uVar105 = (ulong)*(uint *)(local_788 + lVar112 * 4 + 6);
  do {
    auVar234._8_4_ = 0x3f800000;
    auVar234._0_8_ = 0x3f8000003f800000;
    auVar234._12_4_ = 0x3f800000;
    auVar234._16_4_ = 0x3f800000;
    auVar234._20_4_ = 0x3f800000;
    auVar234._24_4_ = 0x3f800000;
    auVar234._28_4_ = 0x3f800000;
    auVar194 = vmovshdup_avx(local_5d0);
    auVar191 = vsubps_avx(auVar194,local_5d0);
    auVar194 = vshufps_avx(local_5d0,local_5d0,0);
    local_900._16_16_ = auVar194;
    local_900._0_16_ = auVar194;
    auVar222 = vshufps_avx(auVar191,auVar191,0);
    local_6c0._16_16_ = auVar222;
    local_6c0._0_16_ = auVar222;
    fVar135 = auVar222._0_4_;
    fVar167 = auVar222._4_4_;
    fVar168 = auVar222._8_4_;
    fVar170 = auVar222._12_4_;
    fVar408 = auVar194._0_4_;
    auVar205._0_4_ = fVar408 + fVar135 * 0.0;
    fVar413 = auVar194._4_4_;
    auVar205._4_4_ = fVar413 + fVar167 * 0.14285715;
    fVar418 = auVar194._8_4_;
    auVar205._8_4_ = fVar418 + fVar168 * 0.2857143;
    fStack_b44 = auVar194._12_4_;
    auVar205._12_4_ = fStack_b44 + fVar170 * 0.42857146;
    auVar205._16_4_ = fVar408 + fVar135 * 0.5714286;
    auVar205._20_4_ = fVar413 + fVar167 * 0.71428573;
    auVar205._24_4_ = fVar418 + fVar168 * 0.8571429;
    auVar205._28_4_ = fStack_b44 + fVar170;
    auVar148 = vsubps_avx(auVar234,auVar205);
    local_b60._4_4_ = auVar205._4_4_ * auVar205._4_4_;
    local_b60._0_4_ = auVar205._0_4_ * auVar205._0_4_;
    fStack_b58 = auVar205._8_4_ * auVar205._8_4_;
    fStack_b54 = auVar205._12_4_ * auVar205._12_4_;
    fStack_b50 = auVar205._16_4_ * auVar205._16_4_;
    fStack_b4c = auVar205._20_4_ * auVar205._20_4_;
    fStack_b48 = auVar205._24_4_ * auVar205._24_4_;
    fVar243 = auVar205._0_4_ * 3.0;
    fVar244 = auVar205._4_4_ * 3.0;
    fVar218 = auVar205._8_4_ * 3.0;
    fVar246 = auVar205._12_4_ * 3.0;
    fVar248 = auVar205._16_4_ * 3.0;
    fVar263 = auVar205._20_4_ * 3.0;
    fVar264 = auVar205._24_4_ * 3.0;
    fVar212 = auVar148._0_4_;
    auVar306._0_4_ = fVar212 * fVar212;
    fVar213 = auVar148._4_4_;
    auVar306._4_4_ = fVar213 * fVar213;
    fVar214 = auVar148._8_4_;
    auVar306._8_4_ = fVar214 * fVar214;
    fVar215 = auVar148._12_4_;
    auVar306._12_4_ = fVar215 * fVar215;
    fVar216 = auVar148._16_4_;
    auVar306._16_4_ = fVar216 * fVar216;
    fVar217 = auVar148._20_4_;
    auVar306._20_4_ = fVar217 * fVar217;
    fVar219 = auVar148._24_4_;
    auVar306._28_36_ = auVar305._28_36_;
    auVar306._24_4_ = fVar219 * fVar219;
    fVar242 = auVar148._28_4_;
    fVar245 = (auVar306._0_4_ * (fVar212 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar265 = (auVar306._4_4_ * (fVar213 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar266 = (auVar306._8_4_ * (fVar214 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar267 = (auVar306._12_4_ * (fVar215 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar269 = (auVar306._16_4_ * (fVar216 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar268 = (auVar306._20_4_ * (fVar217 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar270 = (auVar306._24_4_ * (fVar219 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar307 = -fVar212 * auVar205._0_4_ * auVar205._0_4_ * 0.5;
    fVar315 = -fVar213 * auVar205._4_4_ * auVar205._4_4_ * 0.5;
    fVar318 = -fVar214 * auVar205._8_4_ * auVar205._8_4_ * 0.5;
    fVar321 = -fVar215 * auVar205._12_4_ * auVar205._12_4_ * 0.5;
    fVar324 = -fVar216 * auVar205._16_4_ * auVar205._16_4_ * 0.5;
    fVar327 = -fVar217 * auVar205._20_4_ * auVar205._20_4_ * 0.5;
    fVar330 = -fVar219 * auVar205._24_4_ * auVar205._24_4_ * 0.5;
    fVar187 = auVar394._28_4_;
    fVar352 = auVar345._28_4_ + fVar187;
    fVar371 = auVar364._28_4_ + fVar187;
    fVar390 = (auVar205._0_4_ * auVar205._0_4_ * (fVar243 + -5.0) + 2.0) * 0.5;
    fVar395 = (auVar205._4_4_ * auVar205._4_4_ * (fVar244 + -5.0) + 2.0) * 0.5;
    fVar396 = (auVar205._8_4_ * auVar205._8_4_ * (fVar218 + -5.0) + 2.0) * 0.5;
    fVar397 = (auVar205._12_4_ * auVar205._12_4_ * (fVar246 + -5.0) + 2.0) * 0.5;
    fVar398 = (auVar205._16_4_ * auVar205._16_4_ * (fVar248 + -5.0) + 2.0) * 0.5;
    fVar399 = (auVar205._20_4_ * auVar205._20_4_ * (fVar263 + -5.0) + 2.0) * 0.5;
    fVar400 = (auVar205._24_4_ * auVar205._24_4_ * (fVar264 + -5.0) + 2.0) * 0.5;
    fVar372 = -auVar205._0_4_ * fVar212 * fVar212 * 0.5;
    fVar378 = -auVar205._4_4_ * fVar213 * fVar213 * 0.5;
    fVar380 = -auVar205._8_4_ * fVar214 * fVar214 * 0.5;
    fVar382 = -auVar205._12_4_ * fVar215 * fVar215 * 0.5;
    fVar384 = -auVar205._16_4_ * fVar216 * fVar216 * 0.5;
    fVar386 = -auVar205._20_4_ * fVar217 * fVar217 * 0.5;
    fVar388 = -auVar205._24_4_ * fVar219 * fVar219 * 0.5;
    fVar308 = auVar424._0_4_ * fVar372 +
              fVar390 * (float)local_3e0._0_4_ + auVar377._0_4_ * fVar307 + auVar394._0_4_ * fVar245
    ;
    fVar316 = auVar424._4_4_ * fVar378 +
              fVar395 * (float)local_3e0._4_4_ + auVar377._4_4_ * fVar315 + auVar394._4_4_ * fVar265
    ;
    fVar319 = auVar424._8_4_ * fVar380 +
              fVar396 * fStack_3d8 + auVar377._8_4_ * fVar318 + auVar394._8_4_ * fVar266;
    fVar322 = auVar424._12_4_ * fVar382 +
              fVar397 * fStack_3d4 + auVar377._12_4_ * fVar321 + auVar394._12_4_ * fVar267;
    fVar325 = auVar424._16_4_ * fVar384 +
              fVar398 * fStack_3d0 + auVar377._16_4_ * fVar324 + auVar394._16_4_ * fVar269;
    fVar328 = auVar424._20_4_ * fVar386 +
              fVar399 * fStack_3cc + auVar377._20_4_ * fVar327 + auVar394._20_4_ * fVar268;
    fVar331 = auVar424._24_4_ * fVar388 +
              fVar400 * fStack_3c8 + auVar377._24_4_ * fVar330 + auVar394._24_4_ * fVar270;
    fVar333 = fVar187 + 2.0 + -fVar242 + fVar352;
    fVar309 = (float)local_1e0._0_4_ * fVar372 +
              fVar390 * (float)local_400._0_4_ +
              auVar364._0_4_ * fVar307 + fVar245 * (float)local_440._0_4_;
    fVar317 = (float)local_1e0._4_4_ * fVar378 +
              fVar395 * (float)local_400._4_4_ +
              auVar364._4_4_ * fVar315 + fVar265 * (float)local_440._4_4_;
    fVar320 = fStack_1d8 * fVar380 +
              fVar396 * fStack_3f8 + auVar364._8_4_ * fVar318 + fVar266 * fStack_438;
    fVar323 = fStack_1d4 * fVar382 +
              fVar397 * fStack_3f4 + auVar364._12_4_ * fVar321 + fVar267 * fStack_434;
    fVar326 = fStack_1d0 * fVar384 +
              fVar398 * fStack_3f0 + auVar364._16_4_ * fVar324 + fVar269 * fStack_430;
    fVar329 = fStack_1cc * fVar386 +
              fVar399 * fStack_3ec + auVar364._20_4_ * fVar327 + fVar268 * fStack_42c;
    fVar332 = fStack_1c8 * fVar388 +
              fVar400 * fStack_3e8 + auVar364._24_4_ * fVar330 + fVar270 * fStack_428;
    fVar334 = fVar333 + fVar352 + fVar371;
    local_820 = (float)local_200._0_4_ * fVar372 +
                fVar390 * (float)local_420._0_4_ +
                fVar307 * (float)local_4a0._0_4_ + fVar245 * (float)local_460._0_4_;
    fStack_81c = (float)local_200._4_4_ * fVar378 +
                 fVar395 * (float)local_420._4_4_ +
                 fVar315 * (float)local_4a0._4_4_ + fVar265 * (float)local_460._4_4_;
    fStack_818 = fStack_1f8 * fVar380 +
                 fVar396 * fStack_418 + fVar318 * fStack_498 + fVar266 * fStack_458;
    aStack_814.w = fStack_1f4 * fVar382 +
                   fVar397 * fStack_414 + fVar321 * fStack_494 + fVar267 * fStack_454;
    fStack_810 = fStack_1f0 * fVar384 +
                 fVar398 * fStack_410 + fVar324 * fStack_490 + fVar269 * fStack_450;
    fStack_80c = fStack_1ec * fVar386 +
                 fVar399 * fStack_40c + fVar327 * fStack_48c + fVar268 * fStack_44c;
    fStack_808 = fStack_1e8 * fVar388 +
                 fVar400 * fStack_408 + fVar330 * fStack_488 + fVar270 * fStack_448;
    fStack_804 = fVar334 + fVar371 + auVar377._28_4_ + fVar187;
    local_6e0._0_4_ =
         (float)local_220._0_4_ * fVar372 +
         (float)local_240._0_4_ * fVar390 +
         fVar307 * (float)local_280._0_4_ + fVar245 * (float)local_480._0_4_;
    local_6e0._4_4_ =
         (float)local_220._4_4_ * fVar378 +
         (float)local_240._4_4_ * fVar395 +
         fVar315 * (float)local_280._4_4_ + fVar265 * (float)local_480._4_4_;
    local_6e0._8_4_ =
         fStack_218 * fVar380 + fStack_238 * fVar396 + fVar318 * fStack_278 + fVar266 * fStack_478;
    local_6e0._12_4_ =
         fStack_214 * fVar382 + fStack_234 * fVar397 + fVar321 * fStack_274 + fVar267 * fStack_474;
    local_6e0._16_4_ =
         fStack_210 * fVar384 + fStack_230 * fVar398 + fVar324 * fStack_270 + fVar269 * fStack_470;
    local_6e0._20_4_ =
         fStack_20c * fVar386 + fStack_22c * fVar399 + fVar327 * fStack_26c + fVar268 * fStack_46c;
    local_6e0._24_4_ =
         fStack_208 * fVar388 + fStack_228 * fVar400 + fVar330 * fStack_268 + fVar270 * fStack_468;
    local_6e0._28_4_ = fVar334 + fVar187 + 2.0 + -fVar242 + -3.0;
    fVar378 = fVar242 + fVar242;
    fVar380 = auVar205._28_4_ + auVar205._28_4_;
    auVar39._4_4_ = (fVar213 + fVar213) * auVar205._4_4_;
    auVar39._0_4_ = (fVar212 + fVar212) * auVar205._0_4_;
    auVar39._8_4_ = (fVar214 + fVar214) * auVar205._8_4_;
    auVar39._12_4_ = (fVar215 + fVar215) * auVar205._12_4_;
    auVar39._16_4_ = (fVar216 + fVar216) * auVar205._16_4_;
    auVar39._20_4_ = (fVar217 + fVar217) * auVar205._20_4_;
    auVar39._24_4_ = (fVar219 + fVar219) * auVar205._24_4_;
    auVar39._28_4_ = fVar380;
    auVar148 = vsubps_avx(auVar39,auVar306._0_32_);
    auVar40._4_4_ = (fVar213 + fVar213) * (fVar244 + 2.0);
    auVar40._0_4_ = (fVar212 + fVar212) * (fVar243 + 2.0);
    auVar40._8_4_ = (fVar214 + fVar214) * (fVar218 + 2.0);
    auVar40._12_4_ = (fVar215 + fVar215) * (fVar246 + 2.0);
    auVar40._16_4_ = (fVar216 + fVar216) * (fVar248 + 2.0);
    auVar40._20_4_ = (fVar217 + fVar217) * (fVar263 + 2.0);
    auVar40._24_4_ = (fVar219 + fVar219) * (fVar264 + 2.0);
    auVar40._28_4_ = 0x40400000;
    auVar41._4_4_ = fVar213 * fVar213 * 3.0;
    auVar41._0_4_ = fVar212 * fVar212 * 3.0;
    auVar41._8_4_ = fVar214 * fVar214 * 3.0;
    auVar41._12_4_ = fVar215 * fVar215 * 3.0;
    auVar41._16_4_ = fVar216 * fVar216 * 3.0;
    auVar41._20_4_ = fVar217 * fVar217 * 3.0;
    auVar41._24_4_ = fVar219 * fVar219 * 3.0;
    auVar41._28_4_ = fVar242;
    auVar159 = vsubps_avx(auVar40,auVar41);
    auVar25 = vsubps_avx(_local_b60,auVar39);
    fVar321 = auVar148._0_4_ * 0.5;
    fVar324 = auVar148._4_4_ * 0.5;
    fVar327 = auVar148._8_4_ * 0.5;
    fVar330 = auVar148._12_4_ * 0.5;
    fVar352 = auVar148._16_4_ * 0.5;
    fVar371 = auVar148._20_4_ * 0.5;
    fVar372 = auVar148._24_4_ * 0.5;
    fVar245 = (auVar205._0_4_ * fVar243 + (auVar205._0_4_ + auVar205._0_4_) * (fVar243 + -5.0)) *
              0.5;
    fVar266 = (auVar205._4_4_ * fVar244 + (auVar205._4_4_ + auVar205._4_4_) * (fVar244 + -5.0)) *
              0.5;
    fVar268 = (auVar205._8_4_ * fVar218 + (auVar205._8_4_ + auVar205._8_4_) * (fVar218 + -5.0)) *
              0.5;
    fVar270 = (auVar205._12_4_ * fVar246 + (auVar205._12_4_ + auVar205._12_4_) * (fVar246 + -5.0)) *
              0.5;
    fVar307 = (auVar205._16_4_ * fVar248 + (auVar205._16_4_ + auVar205._16_4_) * (fVar248 + -5.0)) *
              0.5;
    fVar315 = (auVar205._20_4_ * fVar263 + (auVar205._20_4_ + auVar205._20_4_) * (fVar263 + -5.0)) *
              0.5;
    fVar318 = (auVar205._24_4_ * fVar264 + (auVar205._24_4_ + auVar205._24_4_) * (fVar264 + -5.0)) *
              0.5;
    fVar187 = auVar159._0_4_ * 0.5;
    fVar212 = auVar159._4_4_ * 0.5;
    fVar213 = auVar159._8_4_ * 0.5;
    fVar214 = auVar159._12_4_ * 0.5;
    fVar215 = auVar159._16_4_ * 0.5;
    fVar216 = auVar159._20_4_ * 0.5;
    fVar217 = auVar159._24_4_ * 0.5;
    fVar219 = auVar25._0_4_ * 0.5;
    fVar242 = auVar25._4_4_ * 0.5;
    fVar243 = auVar25._8_4_ * 0.5;
    fVar244 = auVar25._12_4_ * 0.5;
    fVar246 = auVar25._16_4_ * 0.5;
    fVar248 = auVar25._20_4_ * 0.5;
    fVar265 = auVar25._24_4_ * 0.5;
    fVar269 = auVar205._28_4_ + -4.0 + auVar25._28_4_ + fVar378 + 0.5;
    auVar194 = vpermilps_avx(ZEXT416((uint)(auVar191._0_4_ * 0.04761905)),0);
    fVar263 = auVar194._0_4_;
    fVar353 = fVar263 * (fVar321 * (float)local_a80._0_4_ +
                        fVar245 * (float)local_3e0._0_4_ +
                        fVar187 * (float)local_940._0_4_ + fVar219 * (float)local_a00._0_4_);
    fVar264 = auVar194._4_4_;
    fVar365 = fVar264 * (fVar324 * (float)local_a80._4_4_ +
                        fVar266 * (float)local_3e0._4_4_ +
                        fVar212 * (float)local_940._4_4_ + fVar242 * (float)local_a00._4_4_);
    local_840._4_4_ = fVar365;
    local_840._0_4_ = fVar353;
    fVar267 = auVar194._8_4_;
    fVar366 = fVar267 * (fVar327 * fStack_a78 +
                        fVar268 * fStack_3d8 + fVar213 * fStack_938 + fVar243 * fStack_9f8);
    local_840._8_4_ = fVar366;
    fVar218 = auVar194._12_4_;
    fVar367 = fVar218 * (fVar330 * fStack_a74 +
                        fVar270 * fStack_3d4 + fVar214 * fStack_934 + fVar244 * fStack_9f4);
    local_840._12_4_ = fVar367;
    fVar368 = fVar263 * (fVar352 * fStack_a70 +
                        fVar307 * fStack_3d0 + fVar215 * fStack_930 + fVar246 * fStack_9f0);
    local_840._16_4_ = fVar368;
    fVar369 = fVar264 * (fVar371 * fStack_a6c +
                        fVar315 * fStack_3cc + fVar216 * fStack_92c + fVar248 * fStack_9ec);
    local_840._20_4_ = fVar369;
    fVar370 = fVar267 * (fVar372 * fStack_a68 +
                        fVar318 * fStack_3c8 + fVar217 * fStack_928 + fVar265 * fStack_9e8);
    local_840._24_4_ = fVar370;
    local_840._28_4_ = uStack_1e4;
    fVar335 = fVar263 * ((float)local_1e0._0_4_ * fVar321 +
                        fVar245 * (float)local_400._0_4_ +
                        fVar187 * (float)local_440._0_4_ + fVar219 * (float)local_a20._0_4_);
    fVar346 = fVar264 * ((float)local_1e0._4_4_ * fVar324 +
                        fVar266 * (float)local_400._4_4_ +
                        fVar212 * (float)local_440._4_4_ + fVar242 * (float)local_a20._4_4_);
    local_ac0._4_4_ = fVar346;
    local_ac0._0_4_ = fVar335;
    fVar347 = fVar267 * (fStack_1d8 * fVar327 +
                        fVar268 * fStack_3f8 + fVar213 * fStack_438 + fVar243 * fStack_a18);
    local_ac0._8_4_ = fVar347;
    fVar348 = fVar218 * (fStack_1d4 * fVar330 +
                        fVar270 * fStack_3f4 + fVar214 * fStack_434 + fVar244 * fStack_a14);
    local_ac0._12_4_ = fVar348;
    fVar349 = fVar263 * (fStack_1d0 * fVar352 +
                        fVar307 * fStack_3f0 + fVar215 * fStack_430 + fVar246 * fStack_a10);
    local_ac0._16_4_ = fVar349;
    fVar350 = fVar264 * (fStack_1cc * fVar371 +
                        fVar315 * fStack_3ec + fVar216 * fStack_42c + fVar248 * fStack_a0c);
    local_ac0._20_4_ = fVar350;
    fVar351 = fVar267 * (fStack_1c8 * fVar372 +
                        fVar318 * fStack_3e8 + fVar217 * fStack_428 + fVar265 * fStack_a08);
    local_ac0._24_4_ = fVar351;
    local_ac0._28_4_ = fVar380;
    auVar127._0_4_ =
         fVar263 * ((float)local_200._0_4_ * fVar321 +
                   fVar187 * (float)local_460._0_4_ + fVar219 * (float)local_4a0._0_4_ +
                   fVar245 * (float)local_420._0_4_);
    auVar127._4_4_ =
         fVar264 * ((float)local_200._4_4_ * fVar324 +
                   fVar212 * (float)local_460._4_4_ + fVar242 * (float)local_4a0._4_4_ +
                   fVar266 * (float)local_420._4_4_);
    auVar127._8_4_ =
         fVar267 * (fStack_1f8 * fVar327 +
                   fVar213 * fStack_458 + fVar243 * fStack_498 + fVar268 * fStack_418);
    auVar127._12_4_ =
         fVar218 * (fStack_1f4 * fVar330 +
                   fVar214 * fStack_454 + fVar244 * fStack_494 + fVar270 * fStack_414);
    auVar127._16_4_ =
         fVar263 * (fStack_1f0 * fVar352 +
                   fVar215 * fStack_450 + fVar246 * fStack_490 + fVar307 * fStack_410);
    auVar127._20_4_ =
         fVar264 * (fStack_1ec * fVar371 +
                   fVar216 * fStack_44c + fVar248 * fStack_48c + fVar315 * fStack_40c);
    auVar127._24_4_ =
         fVar267 * (fStack_1e8 * fVar372 +
                   fVar217 * fStack_448 + fVar265 * fStack_488 + fVar318 * fStack_408);
    auVar127._28_4_ = 0;
    fVar219 = fVar263 * ((float)local_220._0_4_ * fVar321 +
                        (float)local_240._0_4_ * fVar245 +
                        fVar187 * (float)local_480._0_4_ + (float)local_280._0_4_ * fVar219);
    fVar242 = fVar264 * ((float)local_220._4_4_ * fVar324 +
                        (float)local_240._4_4_ * fVar266 +
                        fVar212 * (float)local_480._4_4_ + (float)local_280._4_4_ * fVar242);
    auVar42._4_4_ = fVar242;
    auVar42._0_4_ = fVar219;
    fVar245 = fVar267 * (fStack_218 * fVar327 +
                        fStack_238 * fVar268 + fVar213 * fStack_478 + fStack_278 * fVar243);
    auVar42._8_4_ = fVar245;
    fVar218 = fVar218 * (fStack_214 * fVar330 +
                        fStack_234 * fVar270 + fVar214 * fStack_474 + fStack_274 * fVar244);
    auVar42._12_4_ = fVar218;
    fVar263 = fVar263 * (fStack_210 * fVar352 +
                        fStack_230 * fVar307 + fVar215 * fStack_470 + fStack_270 * fVar246);
    auVar42._16_4_ = fVar263;
    fVar264 = fVar264 * (fStack_20c * fVar371 +
                        fStack_22c * fVar315 + fVar216 * fStack_46c + fStack_26c * fVar248);
    auVar42._20_4_ = fVar264;
    fVar267 = fVar267 * (fStack_208 * fVar372 +
                        fStack_228 * fVar318 + fVar217 * fStack_468 + fStack_268 * fVar265);
    auVar42._24_4_ = fVar267;
    auVar42._28_4_ = fVar269;
    auVar94._4_4_ = fVar317;
    auVar94._0_4_ = fVar309;
    auVar94._8_4_ = fVar320;
    auVar94._12_4_ = fVar323;
    auVar94._16_4_ = fVar326;
    auVar94._20_4_ = fVar329;
    auVar94._24_4_ = fVar332;
    auVar94._28_4_ = fVar334;
    auVar148 = vperm2f128_avx(auVar94,auVar94,1);
    auVar148 = vshufps_avx(auVar148,auVar94,0x30);
    _local_9e0 = vshufps_avx(auVar94,auVar148,0x29);
    auVar100._4_4_ = fStack_81c;
    auVar100._0_4_ = local_820;
    auVar100._8_4_ = fStack_818;
    auVar100._12_4_ = aStack_814;
    auVar100._16_4_ = fStack_810;
    auVar100._20_4_ = fStack_80c;
    auVar100._24_4_ = fStack_808;
    auVar100._28_4_ = fStack_804;
    auVar148 = vperm2f128_avx(auVar100,auVar100,1);
    auVar148 = vshufps_avx(auVar148,auVar100,0x30);
    auVar25 = vshufps_avx(auVar100,auVar148,0x29);
    auVar159 = vsubps_avx(local_6e0,auVar42);
    auVar148 = vperm2f128_avx(auVar159,auVar159,1);
    auVar148 = vshufps_avx(auVar148,auVar159,0x30);
    _local_720 = vshufps_avx(auVar159,auVar148,0x29);
    local_680 = vsubps_avx(_local_9e0,auVar94);
    local_660 = vsubps_avx(auVar25,auVar100);
    fVar212 = local_680._0_4_;
    fVar216 = local_680._4_4_;
    auVar43._4_4_ = auVar127._4_4_ * fVar216;
    auVar43._0_4_ = auVar127._0_4_ * fVar212;
    fVar243 = local_680._8_4_;
    auVar43._8_4_ = auVar127._8_4_ * fVar243;
    fVar246 = local_680._12_4_;
    auVar43._12_4_ = auVar127._12_4_ * fVar246;
    fVar265 = local_680._16_4_;
    auVar43._16_4_ = auVar127._16_4_ * fVar265;
    fVar268 = local_680._20_4_;
    auVar43._20_4_ = auVar127._20_4_ * fVar268;
    fVar318 = local_680._24_4_;
    auVar43._24_4_ = auVar127._24_4_ * fVar318;
    auVar43._28_4_ = auVar159._28_4_;
    fVar213 = local_660._0_4_;
    fVar217 = local_660._4_4_;
    auVar44._4_4_ = fVar346 * fVar217;
    auVar44._0_4_ = fVar335 * fVar213;
    fVar244 = local_660._8_4_;
    auVar44._8_4_ = fVar347 * fVar244;
    fVar248 = local_660._12_4_;
    auVar44._12_4_ = fVar348 * fVar248;
    fVar266 = local_660._16_4_;
    auVar44._16_4_ = fVar349 * fVar266;
    fVar270 = local_660._20_4_;
    auVar44._20_4_ = fVar350 * fVar270;
    fVar321 = local_660._24_4_;
    auVar44._24_4_ = fVar351 * fVar321;
    auVar44._28_4_ = auVar148._28_4_;
    auVar342 = vsubps_avx(auVar44,auVar43);
    auVar96._4_4_ = fVar316;
    auVar96._0_4_ = fVar308;
    auVar96._8_4_ = fVar319;
    auVar96._12_4_ = fVar322;
    auVar96._16_4_ = fVar325;
    auVar96._20_4_ = fVar328;
    auVar96._24_4_ = fVar331;
    auVar96._28_4_ = fVar333;
    auVar148 = vperm2f128_avx(auVar96,auVar96,1);
    auVar148 = vshufps_avx(auVar148,auVar96,0x30);
    local_9c0 = vshufps_avx(auVar96,auVar148,0x29);
    local_2a0 = vsubps_avx(local_9c0,auVar96);
    auVar45._4_4_ = fVar365 * fVar217;
    auVar45._0_4_ = fVar353 * fVar213;
    auVar45._8_4_ = fVar366 * fVar244;
    auVar45._12_4_ = fVar367 * fVar248;
    auVar45._16_4_ = fVar368 * fVar266;
    auVar45._20_4_ = fVar369 * fVar270;
    auVar45._24_4_ = fVar370 * fVar321;
    auVar45._28_4_ = local_9c0._28_4_;
    fVar421 = local_2a0._0_4_;
    fVar425 = local_2a0._4_4_;
    auVar46._4_4_ = fVar425 * auVar127._4_4_;
    auVar46._0_4_ = fVar421 * auVar127._0_4_;
    fVar426 = local_2a0._8_4_;
    auVar46._8_4_ = fVar426 * auVar127._8_4_;
    fVar427 = local_2a0._12_4_;
    auVar46._12_4_ = fVar427 * auVar127._12_4_;
    fVar428 = local_2a0._16_4_;
    auVar46._16_4_ = fVar428 * auVar127._16_4_;
    fVar429 = local_2a0._20_4_;
    auVar46._20_4_ = fVar429 * auVar127._20_4_;
    fVar430 = local_2a0._24_4_;
    auVar46._24_4_ = fVar430 * auVar127._24_4_;
    auVar46._28_4_ = fVar333;
    auVar26 = vsubps_avx(auVar46,auVar45);
    auVar47._4_4_ = fVar346 * fVar425;
    auVar47._0_4_ = fVar335 * fVar421;
    auVar47._8_4_ = fVar347 * fVar426;
    auVar47._12_4_ = fVar348 * fVar427;
    auVar47._16_4_ = fVar349 * fVar428;
    auVar47._20_4_ = fVar350 * fVar429;
    auVar47._24_4_ = fVar351 * fVar430;
    auVar47._28_4_ = fVar333;
    auVar48._4_4_ = fVar365 * fVar216;
    auVar48._0_4_ = fVar353 * fVar212;
    auVar48._8_4_ = fVar366 * fVar243;
    auVar48._12_4_ = fVar367 * fVar246;
    auVar48._16_4_ = fVar368 * fVar265;
    auVar48._20_4_ = fVar369 * fVar268;
    auVar48._24_4_ = fVar370 * fVar318;
    auVar48._28_4_ = fVar378;
    auVar208 = vsubps_avx(auVar48,auVar47);
    fVar187 = auVar208._28_4_;
    fVar352 = auVar26._28_4_ + fVar187;
    auVar235._0_4_ = fVar421 * fVar421 + fVar212 * fVar212 + fVar213 * fVar213;
    auVar235._4_4_ = fVar425 * fVar425 + fVar216 * fVar216 + fVar217 * fVar217;
    auVar235._8_4_ = fVar426 * fVar426 + fVar243 * fVar243 + fVar244 * fVar244;
    auVar235._12_4_ = fVar427 * fVar427 + fVar246 * fVar246 + fVar248 * fVar248;
    auVar235._16_4_ = fVar428 * fVar428 + fVar265 * fVar265 + fVar266 * fVar266;
    auVar235._20_4_ = fVar429 * fVar429 + fVar268 * fVar268 + fVar270 * fVar270;
    auVar235._24_4_ = fVar430 * fVar430 + fVar318 * fVar318 + fVar321 * fVar321;
    auVar235._28_4_ = fVar187 + fVar187 + fVar352;
    auVar148 = vrcpps_avx(auVar235);
    fVar214 = auVar148._0_4_;
    fVar215 = auVar148._4_4_;
    auVar49._4_4_ = fVar215 * auVar235._4_4_;
    auVar49._0_4_ = fVar214 * auVar235._0_4_;
    fVar307 = auVar148._8_4_;
    auVar49._8_4_ = fVar307 * auVar235._8_4_;
    fVar315 = auVar148._12_4_;
    auVar49._12_4_ = fVar315 * auVar235._12_4_;
    fVar324 = auVar148._16_4_;
    auVar49._16_4_ = fVar324 * auVar235._16_4_;
    fVar327 = auVar148._20_4_;
    auVar49._20_4_ = fVar327 * auVar235._20_4_;
    fVar330 = auVar148._24_4_;
    auVar49._24_4_ = fVar330 * auVar235._24_4_;
    auVar49._28_4_ = fVar378;
    auVar375._8_4_ = 0x3f800000;
    auVar375._0_8_ = 0x3f8000003f800000;
    auVar375._12_4_ = 0x3f800000;
    auVar375._16_4_ = 0x3f800000;
    auVar375._20_4_ = 0x3f800000;
    auVar375._24_4_ = 0x3f800000;
    auVar375._28_4_ = 0x3f800000;
    auVar27 = vsubps_avx(auVar375,auVar49);
    fVar214 = auVar27._0_4_ * fVar214 + fVar214;
    fVar215 = auVar27._4_4_ * fVar215 + fVar215;
    fVar307 = auVar27._8_4_ * fVar307 + fVar307;
    fVar315 = auVar27._12_4_ * fVar315 + fVar315;
    fVar324 = auVar27._16_4_ * fVar324 + fVar324;
    fVar327 = auVar27._20_4_ * fVar327 + fVar327;
    fVar330 = auVar27._24_4_ * fVar330 + fVar330;
    auVar159 = vperm2f128_avx(local_ac0,local_ac0,1);
    auVar159 = vshufps_avx(auVar159,local_ac0,0x30);
    local_a40 = vshufps_avx(local_ac0,auVar159,0x29);
    auVar159 = vperm2f128_avx(auVar127,auVar127,1);
    auVar159 = vshufps_avx(auVar159,auVar127,0x30);
    local_a60 = vshufps_avx(auVar127,auVar159,0x29);
    fVar401 = local_a60._0_4_;
    fVar406 = local_a60._4_4_;
    auVar50._4_4_ = fVar406 * fVar216;
    auVar50._0_4_ = fVar401 * fVar212;
    fVar409 = local_a60._8_4_;
    auVar50._8_4_ = fVar409 * fVar243;
    fVar411 = local_a60._12_4_;
    auVar50._12_4_ = fVar411 * fVar246;
    fVar414 = local_a60._16_4_;
    auVar50._16_4_ = fVar414 * fVar265;
    fVar416 = local_a60._20_4_;
    auVar50._20_4_ = fVar416 * fVar268;
    fVar419 = local_a60._24_4_;
    auVar50._24_4_ = fVar419 * fVar318;
    auVar50._28_4_ = auVar159._28_4_;
    fVar373 = local_a40._0_4_;
    fVar379 = local_a40._4_4_;
    auVar51._4_4_ = fVar379 * fVar217;
    auVar51._0_4_ = fVar373 * fVar213;
    fVar381 = local_a40._8_4_;
    auVar51._8_4_ = fVar381 * fVar244;
    fVar383 = local_a40._12_4_;
    auVar51._12_4_ = fVar383 * fVar248;
    fVar385 = local_a40._16_4_;
    auVar51._16_4_ = fVar385 * fVar266;
    fVar387 = local_a40._20_4_;
    auVar51._20_4_ = fVar387 * fVar270;
    fVar389 = local_a40._24_4_;
    auVar51._24_4_ = fVar389 * fVar321;
    auVar51._28_4_ = fVar380;
    auVar341 = vsubps_avx(auVar51,auVar50);
    auVar159 = vperm2f128_avx(local_840,local_840,1);
    auVar159 = vshufps_avx(auVar159,local_840,0x30);
    local_8a0 = vshufps_avx(local_840,auVar159,0x29);
    fVar372 = local_8a0._0_4_;
    fVar378 = local_8a0._4_4_;
    auVar52._4_4_ = fVar378 * fVar217;
    auVar52._0_4_ = fVar372 * fVar213;
    fVar380 = local_8a0._8_4_;
    auVar52._8_4_ = fVar380 * fVar244;
    fVar382 = local_8a0._12_4_;
    auVar52._12_4_ = fVar382 * fVar248;
    fVar384 = local_8a0._16_4_;
    auVar52._16_4_ = fVar384 * fVar266;
    fVar386 = local_8a0._20_4_;
    auVar52._20_4_ = fVar386 * fVar270;
    fVar388 = local_8a0._24_4_;
    auVar52._24_4_ = fVar388 * fVar321;
    auVar52._28_4_ = auVar159._28_4_;
    auVar37 = local_a60;
    auVar53._4_4_ = fVar406 * fVar425;
    auVar53._0_4_ = fVar401 * fVar421;
    auVar53._8_4_ = fVar409 * fVar426;
    auVar53._12_4_ = fVar411 * fVar427;
    auVar53._16_4_ = fVar414 * fVar428;
    auVar53._20_4_ = fVar416 * fVar429;
    auVar53._24_4_ = fVar419 * fVar430;
    auVar53._28_4_ = uStack_1e4;
    auVar159 = vsubps_avx(auVar53,auVar52);
    auVar54._4_4_ = fVar379 * fVar425;
    auVar54._0_4_ = fVar373 * fVar421;
    auVar54._8_4_ = fVar381 * fVar426;
    auVar54._12_4_ = fVar383 * fVar427;
    auVar54._16_4_ = fVar385 * fVar428;
    auVar54._20_4_ = fVar387 * fVar429;
    auVar54._24_4_ = fVar389 * fVar430;
    auVar54._28_4_ = uStack_1e4;
    auVar55._4_4_ = fVar378 * fVar216;
    auVar55._0_4_ = fVar372 * fVar212;
    auVar55._8_4_ = fVar380 * fVar243;
    auVar55._12_4_ = fVar382 * fVar246;
    auVar55._16_4_ = fVar384 * fVar265;
    auVar55._20_4_ = fVar386 * fVar268;
    auVar55._24_4_ = fVar388 * fVar318;
    auVar55._28_4_ = local_a40._28_4_;
    auVar36 = vsubps_avx(auVar55,auVar54);
    fVar187 = auVar36._28_4_;
    fVar371 = auVar159._28_4_ + fVar187;
    auVar56._4_4_ =
         (auVar342._4_4_ * auVar342._4_4_ +
         auVar26._4_4_ * auVar26._4_4_ + auVar208._4_4_ * auVar208._4_4_) * fVar215;
    auVar56._0_4_ =
         (auVar342._0_4_ * auVar342._0_4_ +
         auVar26._0_4_ * auVar26._0_4_ + auVar208._0_4_ * auVar208._0_4_) * fVar214;
    auVar56._8_4_ =
         (auVar342._8_4_ * auVar342._8_4_ +
         auVar26._8_4_ * auVar26._8_4_ + auVar208._8_4_ * auVar208._8_4_) * fVar307;
    auVar56._12_4_ =
         (auVar342._12_4_ * auVar342._12_4_ +
         auVar26._12_4_ * auVar26._12_4_ + auVar208._12_4_ * auVar208._12_4_) * fVar315;
    auVar56._16_4_ =
         (auVar342._16_4_ * auVar342._16_4_ +
         auVar26._16_4_ * auVar26._16_4_ + auVar208._16_4_ * auVar208._16_4_) * fVar324;
    auVar56._20_4_ =
         (auVar342._20_4_ * auVar342._20_4_ +
         auVar26._20_4_ * auVar26._20_4_ + auVar208._20_4_ * auVar208._20_4_) * fVar327;
    auVar56._24_4_ =
         (auVar342._24_4_ * auVar342._24_4_ +
         auVar26._24_4_ * auVar26._24_4_ + auVar208._24_4_ * auVar208._24_4_) * fVar330;
    auVar56._28_4_ = auVar342._28_4_ + fVar352;
    auVar57._4_4_ =
         (auVar341._4_4_ * auVar341._4_4_ +
         auVar159._4_4_ * auVar159._4_4_ + auVar36._4_4_ * auVar36._4_4_) * fVar215;
    auVar57._0_4_ =
         (auVar341._0_4_ * auVar341._0_4_ +
         auVar159._0_4_ * auVar159._0_4_ + auVar36._0_4_ * auVar36._0_4_) * fVar214;
    auVar57._8_4_ =
         (auVar341._8_4_ * auVar341._8_4_ +
         auVar159._8_4_ * auVar159._8_4_ + auVar36._8_4_ * auVar36._8_4_) * fVar307;
    auVar57._12_4_ =
         (auVar341._12_4_ * auVar341._12_4_ +
         auVar159._12_4_ * auVar159._12_4_ + auVar36._12_4_ * auVar36._12_4_) * fVar315;
    auVar57._16_4_ =
         (auVar341._16_4_ * auVar341._16_4_ +
         auVar159._16_4_ * auVar159._16_4_ + auVar36._16_4_ * auVar36._16_4_) * fVar324;
    auVar57._20_4_ =
         (auVar341._20_4_ * auVar341._20_4_ +
         auVar159._20_4_ * auVar159._20_4_ + auVar36._20_4_ * auVar36._20_4_) * fVar327;
    auVar57._24_4_ =
         (auVar341._24_4_ * auVar341._24_4_ +
         auVar159._24_4_ * auVar159._24_4_ + auVar36._24_4_ * auVar36._24_4_) * fVar330;
    auVar57._28_4_ = auVar27._28_4_ + auVar148._28_4_;
    local_aa0 = vmaxps_avx(auVar56,auVar57);
    auVar148 = vperm2f128_avx(local_6e0,local_6e0,1);
    auVar148 = vshufps_avx(auVar148,local_6e0,0x30);
    _local_740 = vshufps_avx(local_6e0,auVar148,0x29);
    local_880._0_4_ = (float)local_6e0._0_4_ + fVar219;
    local_880._4_4_ = local_6e0._4_4_ + fVar242;
    local_880._8_4_ = local_6e0._8_4_ + fVar245;
    local_880._12_4_ = local_6e0._12_4_ + fVar218;
    local_880._16_4_ = local_6e0._16_4_ + fVar263;
    local_880._20_4_ = local_6e0._20_4_ + fVar264;
    local_880._24_4_ = local_6e0._24_4_ + fVar267;
    local_880._28_4_ = local_6e0._28_4_ + fVar269;
    auVar148 = vmaxps_avx(local_6e0,local_880);
    auVar159 = vmaxps_avx(_local_720,_local_740);
    auVar148 = vmaxps_avx(auVar148,auVar159);
    auVar159 = vrsqrtps_avx(auVar235);
    fVar214 = auVar159._0_4_;
    fVar215 = auVar159._4_4_;
    fVar219 = auVar159._8_4_;
    fVar242 = auVar159._12_4_;
    fVar245 = auVar159._16_4_;
    fVar218 = auVar159._20_4_;
    fVar263 = auVar159._24_4_;
    auVar58._4_4_ = fVar215 * fVar215 * fVar215 * auVar235._4_4_ * 0.5;
    auVar58._0_4_ = fVar214 * fVar214 * fVar214 * auVar235._0_4_ * 0.5;
    auVar58._8_4_ = fVar219 * fVar219 * fVar219 * auVar235._8_4_ * 0.5;
    auVar58._12_4_ = fVar242 * fVar242 * fVar242 * auVar235._12_4_ * 0.5;
    auVar58._16_4_ = fVar245 * fVar245 * fVar245 * auVar235._16_4_ * 0.5;
    auVar58._20_4_ = fVar218 * fVar218 * fVar218 * auVar235._20_4_ * 0.5;
    auVar58._24_4_ = fVar263 * fVar263 * fVar263 * auVar235._24_4_ * 0.5;
    auVar58._28_4_ = auVar235._28_4_;
    auVar59._4_4_ = fVar215 * 1.5;
    auVar59._0_4_ = fVar214 * 1.5;
    auVar59._8_4_ = fVar219 * 1.5;
    auVar59._12_4_ = fVar242 * 1.5;
    auVar59._16_4_ = fVar245 * 1.5;
    auVar59._20_4_ = fVar218 * 1.5;
    auVar59._24_4_ = fVar263 * 1.5;
    auVar59._28_4_ = auVar159._28_4_;
    local_3a0 = vsubps_avx(auVar59,auVar58);
    auVar95._4_4_ = fVar317;
    auVar95._0_4_ = fVar309;
    auVar95._8_4_ = fVar320;
    auVar95._12_4_ = fVar323;
    auVar95._16_4_ = fVar326;
    auVar95._20_4_ = fVar329;
    auVar95._24_4_ = fVar332;
    auVar95._28_4_ = fVar334;
    local_8c0 = vsubps_avx(ZEXT832(0) << 0x20,auVar95);
    local_8e0 = vsubps_avx(ZEXT832(0) << 0x20,auVar100);
    fVar402 = local_8e0._0_4_;
    fVar407 = local_8e0._4_4_;
    fVar410 = local_8e0._8_4_;
    fVar412 = local_8e0._12_4_;
    fVar415 = local_8e0._16_4_;
    fVar417 = local_8e0._20_4_;
    fVar330 = local_3a0._28_4_;
    fVar420 = local_8e0._24_4_;
    fVar214 = local_8c0._0_4_;
    fVar219 = local_8c0._4_4_;
    fVar245 = local_8c0._8_4_;
    fVar263 = local_8c0._12_4_;
    fVar267 = local_8c0._16_4_;
    fVar307 = local_8c0._20_4_;
    fVar324 = local_8c0._24_4_;
    auVar97._4_4_ = fVar316;
    auVar97._0_4_ = fVar308;
    auVar97._8_4_ = fVar319;
    auVar97._12_4_ = fVar322;
    auVar97._16_4_ = fVar325;
    auVar97._20_4_ = fVar328;
    auVar97._24_4_ = fVar331;
    auVar97._28_4_ = fVar333;
    auVar208 = ZEXT832(0) << 0x20;
    auVar159 = vsubps_avx(auVar208,auVar97);
    fVar215 = auVar159._0_4_;
    fVar242 = auVar159._4_4_;
    fVar218 = auVar159._8_4_;
    fVar264 = auVar159._12_4_;
    fVar269 = auVar159._16_4_;
    fVar315 = auVar159._20_4_;
    fVar327 = auVar159._24_4_;
    auVar313._0_4_ = local_4c0 * fVar215 + local_960 * fVar214 + fVar402 * local_700;
    auVar313._4_4_ = fStack_4bc * fVar242 + fStack_95c * fVar219 + fVar407 * fStack_6fc;
    auVar313._8_4_ = fStack_4b8 * fVar218 + fStack_958 * fVar245 + fVar410 * fStack_6f8;
    auVar313._12_4_ = fStack_4b4 * fVar264 + fStack_954 * fVar263 + fVar412 * fStack_6f4;
    auVar313._16_4_ = fStack_4b0 * fVar269 + fStack_950 * fVar267 + fVar415 * fStack_6f0;
    auVar313._20_4_ = fStack_4ac * fVar315 + fStack_94c * fVar307 + fVar417 * fStack_6ec;
    auVar313._24_4_ = fStack_4a8 * fVar327 + fStack_948 * fVar324 + fVar420 * fStack_6e8;
    auVar313._28_4_ = fVar371 + auVar341._28_4_ + fVar371 + fVar330;
    auVar339._0_4_ = fVar215 * fVar215 + fVar214 * fVar214 + fVar402 * fVar402;
    auVar339._4_4_ = fVar242 * fVar242 + fVar219 * fVar219 + fVar407 * fVar407;
    auVar339._8_4_ = fVar218 * fVar218 + fVar245 * fVar245 + fVar410 * fVar410;
    auVar339._12_4_ = fVar264 * fVar264 + fVar263 * fVar263 + fVar412 * fVar412;
    auVar339._16_4_ = fVar269 * fVar269 + fVar267 * fVar267 + fVar415 * fVar415;
    auVar339._20_4_ = fVar315 * fVar315 + fVar307 * fVar307 + fVar417 * fVar417;
    auVar339._24_4_ = fVar327 * fVar327 + fVar324 * fVar324 + fVar420 * fVar420;
    auVar339._28_4_ = fVar187 + fVar187 + fVar371;
    fVar400 = local_3a0._0_4_;
    fVar278 = local_3a0._4_4_;
    fVar280 = local_3a0._8_4_;
    fVar282 = local_3a0._12_4_;
    fVar284 = local_3a0._16_4_;
    fVar286 = local_3a0._20_4_;
    fVar288 = local_3a0._24_4_;
    fVar352 = local_660._28_4_;
    fVar371 = local_680._28_4_;
    local_520 = local_4c0 * fVar421 * fVar400 +
                fVar400 * fVar212 * local_960 + fVar400 * fVar213 * local_700;
    fStack_51c = fStack_4bc * fVar425 * fVar278 +
                 fVar278 * fVar216 * fStack_95c + fVar278 * fVar217 * fStack_6fc;
    fStack_518 = fStack_4b8 * fVar426 * fVar280 +
                 fVar280 * fVar243 * fStack_958 + fVar280 * fVar244 * fStack_6f8;
    fStack_514 = fStack_4b4 * fVar427 * fVar282 +
                 fVar282 * fVar246 * fStack_954 + fVar282 * fVar248 * fStack_6f4;
    fStack_510 = fStack_4b0 * fVar428 * fVar284 +
                 fVar284 * fVar265 * fStack_950 + fVar284 * fVar266 * fStack_6f0;
    fStack_50c = fStack_4ac * fVar429 * fVar286 +
                 fVar286 * fVar268 * fStack_94c + fVar286 * fVar270 * fStack_6ec;
    fStack_508 = fStack_4a8 * fVar430 * fVar288 +
                 fVar288 * fVar318 * fStack_948 + fVar288 * fVar321 * fStack_6e8;
    fVar187 = fVar371 + fVar352 + fStack_6e4;
    local_540 = fVar215 * fVar421 * fVar400 +
                fVar400 * fVar212 * fVar214 + fVar402 * fVar400 * fVar213;
    fStack_53c = fVar242 * fVar425 * fVar278 +
                 fVar278 * fVar216 * fVar219 + fVar407 * fVar278 * fVar217;
    fStack_538 = fVar218 * fVar426 * fVar280 +
                 fVar280 * fVar243 * fVar245 + fVar410 * fVar280 * fVar244;
    fStack_534 = fVar264 * fVar427 * fVar282 +
                 fVar282 * fVar246 * fVar263 + fVar412 * fVar282 * fVar248;
    fStack_530 = fVar269 * fVar428 * fVar284 +
                 fVar284 * fVar265 * fVar267 + fVar415 * fVar284 * fVar266;
    fStack_52c = fVar315 * fVar429 * fVar286 +
                 fVar286 * fVar268 * fVar307 + fVar417 * fVar286 * fVar270;
    fStack_528 = fVar327 * fVar430 * fVar288 +
                 fVar288 * fVar318 * fVar324 + fVar420 * fVar288 * fVar321;
    fStack_524 = fVar352 + fVar187;
    auVar60._4_4_ = fStack_51c * fStack_53c;
    auVar60._0_4_ = local_520 * local_540;
    auVar60._8_4_ = fStack_518 * fStack_538;
    auVar60._12_4_ = fStack_514 * fStack_534;
    auVar60._16_4_ = fStack_510 * fStack_530;
    auVar60._20_4_ = fStack_50c * fStack_52c;
    auVar60._24_4_ = fStack_508 * fStack_528;
    auVar60._28_4_ = fVar187;
    auVar342 = vsubps_avx(auVar313,auVar60);
    auVar61._4_4_ = fStack_53c * fStack_53c;
    auVar61._0_4_ = local_540 * local_540;
    auVar61._8_4_ = fStack_538 * fStack_538;
    auVar61._12_4_ = fStack_534 * fStack_534;
    auVar61._16_4_ = fStack_530 * fStack_530;
    auVar61._20_4_ = fStack_52c * fStack_52c;
    auVar61._24_4_ = fStack_528 * fStack_528;
    auVar61._28_4_ = fVar352;
    local_600 = vsubps_avx(auVar339,auVar61);
    local_640 = vsqrtps_avx(local_aa0);
    fVar187 = (local_640._0_4_ + auVar148._0_4_) * 1.0000002;
    fVar390 = (local_640._4_4_ + auVar148._4_4_) * 1.0000002;
    fVar395 = (local_640._8_4_ + auVar148._8_4_) * 1.0000002;
    fVar396 = (local_640._12_4_ + auVar148._12_4_) * 1.0000002;
    fVar397 = (local_640._16_4_ + auVar148._16_4_) * 1.0000002;
    fVar398 = (local_640._20_4_ + auVar148._20_4_) * 1.0000002;
    fVar399 = (local_640._24_4_ + auVar148._24_4_) * 1.0000002;
    auVar62._4_4_ = fVar390 * fVar390;
    auVar62._0_4_ = fVar187 * fVar187;
    auVar62._8_4_ = fVar395 * fVar395;
    auVar62._12_4_ = fVar396 * fVar396;
    auVar62._16_4_ = fVar397 * fVar397;
    auVar62._20_4_ = fVar398 * fVar398;
    auVar62._24_4_ = fVar399 * fVar399;
    auVar62._28_4_ = local_640._28_4_ + auVar148._28_4_;
    local_2e0._0_4_ = auVar342._0_4_ + auVar342._0_4_;
    local_2e0._4_4_ = auVar342._4_4_ + auVar342._4_4_;
    local_2e0._8_4_ = auVar342._8_4_ + auVar342._8_4_;
    local_2e0._12_4_ = auVar342._12_4_ + auVar342._12_4_;
    local_2e0._16_4_ = auVar342._16_4_ + auVar342._16_4_;
    local_2e0._20_4_ = auVar342._20_4_ + auVar342._20_4_;
    local_2e0._24_4_ = auVar342._24_4_ + auVar342._24_4_;
    fVar187 = auVar342._28_4_;
    local_2e0._28_4_ = fVar187 + fVar187;
    auVar148 = vsubps_avx(local_600,auVar62);
    auVar63._4_4_ = fStack_51c * fStack_51c;
    auVar63._0_4_ = local_520 * local_520;
    auVar63._8_4_ = fStack_518 * fStack_518;
    auVar63._12_4_ = fStack_514 * fStack_514;
    auVar63._16_4_ = fStack_510 * fStack_510;
    auVar63._20_4_ = fStack_50c * fStack_50c;
    auVar63._24_4_ = fStack_508 * fStack_508;
    auVar63._28_4_ = fVar187;
    auVar342 = vsubps_avx(local_260,auVar63);
    local_620._4_4_ = local_2e0._4_4_ * local_2e0._4_4_;
    local_620._0_4_ = local_2e0._0_4_ * local_2e0._0_4_;
    local_620._8_4_ = local_2e0._8_4_ * local_2e0._8_4_;
    local_620._12_4_ = local_2e0._12_4_ * local_2e0._12_4_;
    local_620._16_4_ = local_2e0._16_4_ * local_2e0._16_4_;
    local_620._20_4_ = local_2e0._20_4_ * local_2e0._20_4_;
    local_620._24_4_ = local_2e0._24_4_ * local_2e0._24_4_;
    local_620._28_4_ = auVar313._28_4_;
    fVar187 = auVar342._0_4_;
    local_760._0_4_ = fVar187 * 4.0;
    fVar390 = auVar342._4_4_;
    local_760._4_4_ = fVar390 * 4.0;
    fVar395 = auVar342._8_4_;
    fStack_758 = fVar395 * 4.0;
    fVar396 = auVar342._12_4_;
    fStack_754 = fVar396 * 4.0;
    fVar397 = auVar342._16_4_;
    fStack_750 = fVar397 * 4.0;
    fVar398 = auVar342._20_4_;
    fStack_74c = fVar398 * 4.0;
    fVar399 = auVar342._24_4_;
    fStack_748 = fVar399 * 4.0;
    uStack_744 = 0x40800000;
    auVar64._4_4_ = auVar148._4_4_ * (float)local_760._4_4_;
    auVar64._0_4_ = auVar148._0_4_ * (float)local_760._0_4_;
    auVar64._8_4_ = auVar148._8_4_ * fStack_758;
    auVar64._12_4_ = auVar148._12_4_ * fStack_754;
    auVar64._16_4_ = auVar148._16_4_ * fStack_750;
    auVar64._20_4_ = auVar148._20_4_ * fStack_74c;
    auVar64._24_4_ = auVar148._24_4_ * fStack_748;
    auVar64._28_4_ = 0x40800000;
    auVar26 = vsubps_avx(local_620,auVar64);
    local_780 = vcmpps_avx(auVar26,auVar208,5);
    auVar314._8_4_ = 0x7fffffff;
    auVar314._0_8_ = 0x7fffffff7fffffff;
    auVar314._12_4_ = 0x7fffffff;
    auVar314._16_4_ = 0x7fffffff;
    auVar314._20_4_ = 0x7fffffff;
    auVar314._24_4_ = 0x7fffffff;
    auVar314._28_4_ = 0x7fffffff;
    local_aa0 = vandps_avx(auVar314,auVar63);
    local_320._0_4_ = fVar187 + fVar187;
    local_320._4_4_ = fVar390 + fVar390;
    local_320._8_4_ = fVar395 + fVar395;
    local_320._12_4_ = fVar396 + fVar396;
    local_320._16_4_ = fVar397 + fVar397;
    local_320._20_4_ = fVar398 + fVar398;
    local_320._24_4_ = fVar399 + fVar399;
    local_320._28_4_ = auVar342._28_4_ + auVar342._28_4_;
    local_2c0 = vandps_avx(auVar314,auVar342);
    uVar93 = CONCAT44(local_2e0._4_4_,local_2e0._0_4_);
    local_300._0_8_ = uVar93 ^ 0x8000000080000000;
    local_300._8_4_ = -local_2e0._8_4_;
    local_300._12_4_ = -local_2e0._12_4_;
    local_300._16_4_ = -local_2e0._16_4_;
    local_300._20_4_ = -local_2e0._20_4_;
    local_300._24_4_ = -local_2e0._24_4_;
    local_300._28_4_ = -local_2e0._28_4_;
    if ((((((((local_780 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (local_780 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_780 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(local_780 >> 0x7f,0) == '\0') &&
          (local_780 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(local_780 >> 0xbf,0) == '\0') &&
        (local_780 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
        -1 < local_780[0x1f]) {
      auVar236._8_4_ = 0x7f800000;
      auVar236._0_8_ = 0x7f8000007f800000;
      auVar236._12_4_ = 0x7f800000;
      auVar236._16_4_ = 0x7f800000;
      auVar236._20_4_ = 0x7f800000;
      auVar236._24_4_ = 0x7f800000;
      auVar236._28_4_ = 0x7f800000;
      auVar157._8_4_ = 0xff800000;
      auVar157._0_8_ = 0xff800000ff800000;
      auVar157._12_4_ = 0xff800000;
      auVar157._16_4_ = 0xff800000;
      auVar157._20_4_ = 0xff800000;
      auVar157._24_4_ = 0xff800000;
      auVar157._28_4_ = 0xff800000;
    }
    else {
      auVar341 = vsqrtps_avx(auVar26);
      auVar27 = vrcpps_avx(local_320);
      auVar342 = vcmpps_avx(auVar26,auVar208,5);
      fVar187 = auVar27._0_4_;
      fVar390 = auVar27._4_4_;
      auVar65._4_4_ = local_320._4_4_ * fVar390;
      auVar65._0_4_ = local_320._0_4_ * fVar187;
      fVar395 = auVar27._8_4_;
      auVar65._8_4_ = local_320._8_4_ * fVar395;
      fVar396 = auVar27._12_4_;
      auVar65._12_4_ = local_320._12_4_ * fVar396;
      fVar397 = auVar27._16_4_;
      auVar65._16_4_ = local_320._16_4_ * fVar397;
      fVar398 = auVar27._20_4_;
      auVar65._20_4_ = local_320._20_4_ * fVar398;
      fVar399 = auVar27._24_4_;
      auVar65._24_4_ = local_320._24_4_ * fVar399;
      auVar65._28_4_ = auVar26._28_4_;
      auVar300._8_4_ = 0x3f800000;
      auVar300._0_8_ = 0x3f8000003f800000;
      auVar300._12_4_ = 0x3f800000;
      auVar300._16_4_ = 0x3f800000;
      auVar300._20_4_ = 0x3f800000;
      auVar300._24_4_ = 0x3f800000;
      auVar300._28_4_ = 0x3f800000;
      auVar26 = vsubps_avx(auVar300,auVar65);
      fVar187 = fVar187 + fVar187 * auVar26._0_4_;
      fVar390 = fVar390 + fVar390 * auVar26._4_4_;
      fVar395 = fVar395 + fVar395 * auVar26._8_4_;
      fVar396 = fVar396 + fVar396 * auVar26._12_4_;
      fVar397 = fVar397 + fVar397 * auVar26._16_4_;
      fVar398 = fVar398 + fVar398 * auVar26._20_4_;
      fVar399 = fVar399 + fVar399 * auVar26._24_4_;
      auVar208 = vsubps_avx(local_300,auVar341);
      fVar271 = auVar208._0_4_ * fVar187;
      fVar277 = auVar208._4_4_ * fVar390;
      auVar66._4_4_ = fVar277;
      auVar66._0_4_ = fVar271;
      fVar279 = auVar208._8_4_ * fVar395;
      auVar66._8_4_ = fVar279;
      fVar281 = auVar208._12_4_ * fVar396;
      auVar66._12_4_ = fVar281;
      fVar283 = auVar208._16_4_ * fVar397;
      auVar66._16_4_ = fVar283;
      fVar285 = auVar208._20_4_ * fVar398;
      auVar66._20_4_ = fVar285;
      fVar287 = auVar208._24_4_ * fVar399;
      auVar66._24_4_ = fVar287;
      auVar66._28_4_ = auVar208._28_4_;
      auVar208 = vsubps_avx(auVar341,local_2e0);
      fVar187 = auVar208._0_4_ * fVar187;
      fVar390 = auVar208._4_4_ * fVar390;
      auVar67._4_4_ = fVar390;
      auVar67._0_4_ = fVar187;
      fVar395 = auVar208._8_4_ * fVar395;
      auVar67._8_4_ = fVar395;
      fVar396 = auVar208._12_4_ * fVar396;
      auVar67._12_4_ = fVar396;
      fVar397 = auVar208._16_4_ * fVar397;
      auVar67._16_4_ = fVar397;
      fVar398 = auVar208._20_4_ * fVar398;
      auVar67._20_4_ = fVar398;
      fVar399 = auVar208._24_4_ * fVar399;
      auVar67._24_4_ = fVar399;
      auVar67._28_4_ = auVar27._28_4_ + auVar26._28_4_;
      local_360 = fVar400 * (local_540 + local_520 * fVar271);
      fStack_35c = fVar278 * (fStack_53c + fStack_51c * fVar277);
      fStack_358 = fVar280 * (fStack_538 + fStack_518 * fVar279);
      fStack_354 = fVar282 * (fStack_534 + fStack_514 * fVar281);
      fStack_350 = fVar284 * (fStack_530 + fStack_510 * fVar283);
      fStack_34c = fVar286 * (fStack_52c + fStack_50c * fVar285);
      fStack_348 = fVar288 * (fStack_528 + fStack_508 * fVar287);
      fStack_344 = local_2e0._28_4_;
      local_380 = fVar400 * (local_540 + local_520 * fVar187);
      fStack_37c = fVar278 * (fStack_53c + fStack_51c * fVar390);
      fStack_378 = fVar280 * (fStack_538 + fStack_518 * fVar395);
      fStack_374 = fVar282 * (fStack_534 + fStack_514 * fVar396);
      fStack_370 = fVar284 * (fStack_530 + fStack_510 * fVar397);
      fStack_36c = fVar286 * (fStack_52c + fStack_50c * fVar398);
      fStack_368 = fVar288 * (fStack_528 + fStack_508 * fVar399);
      fStack_364 = local_2e0._28_4_;
      auVar255._8_4_ = 0x7f800000;
      auVar255._0_8_ = 0x7f8000007f800000;
      auVar255._12_4_ = 0x7f800000;
      auVar255._16_4_ = 0x7f800000;
      auVar255._20_4_ = 0x7f800000;
      auVar255._24_4_ = 0x7f800000;
      auVar255._28_4_ = 0x7f800000;
      auVar236 = vblendvps_avx(auVar255,auVar66,auVar342);
      auVar256._8_4_ = 0xff800000;
      auVar256._0_8_ = 0xff800000ff800000;
      auVar256._12_4_ = 0xff800000;
      auVar256._16_4_ = 0xff800000;
      auVar256._20_4_ = 0xff800000;
      auVar256._24_4_ = 0xff800000;
      auVar256._28_4_ = 0xff800000;
      auVar157 = vblendvps_avx(auVar256,auVar67,auVar342);
      auVar26 = vmaxps_avx(local_500,local_aa0);
      auVar68._4_4_ = auVar26._4_4_ * 1.9073486e-06;
      auVar68._0_4_ = auVar26._0_4_ * 1.9073486e-06;
      auVar68._8_4_ = auVar26._8_4_ * 1.9073486e-06;
      auVar68._12_4_ = auVar26._12_4_ * 1.9073486e-06;
      auVar68._16_4_ = auVar26._16_4_ * 1.9073486e-06;
      auVar68._20_4_ = auVar26._20_4_ * 1.9073486e-06;
      auVar68._24_4_ = auVar26._24_4_ * 1.9073486e-06;
      auVar68._28_4_ = auVar26._28_4_;
      auVar26 = vcmpps_avx(local_2c0,auVar68,1);
      auVar208 = auVar342 & auVar26;
      if ((((((((auVar208 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar208 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar208 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar208 >> 0x7f,0) != '\0') ||
            (auVar208 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar208 >> 0xbf,0) != '\0') ||
          (auVar208 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar208[0x1f] < '\0') {
        auVar26 = vandps_avx(auVar26,auVar342);
        auVar194 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
        auVar208 = vcmpps_avx(auVar148,_DAT_01f7b000,2);
        auVar304._8_4_ = 0xff800000;
        auVar304._0_8_ = 0xff800000ff800000;
        auVar304._12_4_ = 0xff800000;
        auVar304._16_4_ = 0xff800000;
        auVar304._20_4_ = 0xff800000;
        auVar304._24_4_ = 0xff800000;
        auVar304._28_4_ = 0xff800000;
        auVar363._8_4_ = 0x7f800000;
        auVar363._0_8_ = 0x7f8000007f800000;
        auVar363._12_4_ = 0x7f800000;
        auVar363._16_4_ = 0x7f800000;
        auVar363._20_4_ = 0x7f800000;
        auVar363._24_4_ = 0x7f800000;
        auVar363._28_4_ = 0x7f800000;
        auVar148 = vblendvps_avx(auVar363,auVar304,auVar208);
        auVar222 = vpmovsxwd_avx(auVar194);
        auVar194 = vpunpckhwd_avx(auVar194,auVar194);
        auVar262._16_16_ = auVar194;
        auVar262._0_16_ = auVar222;
        auVar236 = vblendvps_avx(auVar236,auVar148,auVar262);
        auVar148 = vblendvps_avx(auVar304,auVar363,auVar208);
        auVar157 = vblendvps_avx(auVar157,auVar148,auVar262);
        auVar211._0_8_ = auVar26._0_8_ ^ 0xffffffffffffffff;
        auVar211._8_4_ = auVar26._8_4_ ^ 0xffffffff;
        auVar211._12_4_ = auVar26._12_4_ ^ 0xffffffff;
        auVar211._16_4_ = auVar26._16_4_ ^ 0xffffffff;
        auVar211._20_4_ = auVar26._20_4_ ^ 0xffffffff;
        auVar211._24_4_ = auVar26._24_4_ ^ 0xffffffff;
        auVar211._28_4_ = auVar26._28_4_ ^ 0xffffffff;
        auVar148 = vorps_avx(auVar208,auVar211);
        local_780 = vandps_avx(auVar342,auVar148);
      }
    }
    auVar377 = ZEXT3264(_local_a00);
    auVar364 = ZEXT3264(_local_a20);
    auVar345 = ZEXT3264(local_aa0);
    auVar305 = ZEXT3264(CONCAT428(fStack_6e4,
                                  CONCAT424(fStack_6e8,
                                            CONCAT420(fStack_6ec,
                                                      CONCAT416(fStack_6f0,
                                                                CONCAT412(fStack_6f4,
                                                                          CONCAT48(fStack_6f8,
                                                                                   CONCAT44(
                                                  fStack_6fc,local_700))))))));
    auVar148 = local_4e0 & local_780;
    local_880._0_8_ = uVar105;
    fVar187 = (float)local_860._0_4_;
    fVar390 = (float)local_860._4_4_;
    fVar395 = fStack_858;
    fVar396 = fStack_854;
    fVar397 = fStack_850;
    fVar398 = fStack_84c;
    fVar399 = fStack_848;
    fVar271 = fStack_844;
    if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar148 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar148 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar148 >> 0x7f,0) == '\0') &&
          (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar148 >> 0xbf,0) == '\0') &&
        (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar148[0x1f])
    {
      auVar424 = ZEXT3264(_local_a80);
      auVar394 = ZEXT3264(_local_940);
    }
    else {
      fStack_504 = fVar371 + fVar352 + fStack_6e4;
      auVar194 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7a0._0_4_));
      auVar194 = vshufps_avx(auVar194,auVar194,0);
      auVar257._16_16_ = auVar194;
      auVar257._0_16_ = auVar194;
      auVar342 = vmaxps_avx(auVar257,auVar236);
      auVar194 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_7a0._0_4_));
      auVar194 = vshufps_avx(auVar194,auVar194,0);
      auVar258._16_16_ = auVar194;
      auVar258._0_16_ = auVar194;
      auVar26 = vminps_avx(auVar258,auVar157);
      fVar247 = auVar236._28_4_ + auVar194._12_4_;
      auVar128._0_4_ = local_4c0 * fVar353 + local_960 * fVar335 + local_700 * auVar127._0_4_;
      auVar128._4_4_ = fStack_4bc * fVar365 + fStack_95c * fVar346 + fStack_6fc * auVar127._4_4_;
      auVar128._8_4_ = fStack_4b8 * fVar366 + fStack_958 * fVar347 + fStack_6f8 * auVar127._8_4_;
      auVar128._12_4_ = fStack_4b4 * fVar367 + fStack_954 * fVar348 + fStack_6f4 * auVar127._12_4_;
      auVar128._16_4_ = fStack_4b0 * fVar368 + fStack_950 * fVar349 + fStack_6f0 * auVar127._16_4_;
      auVar128._20_4_ = fStack_4ac * fVar369 + fStack_94c * fVar350 + fStack_6ec * auVar127._20_4_;
      auVar128._24_4_ = fStack_4a8 * fVar370 + fStack_948 * fVar351 + fStack_6e8 * auVar127._24_4_;
      auVar128._28_4_ = fVar247 + fVar247 + 0.0;
      auVar148 = vrcpps_avx(auVar128);
      fVar352 = auVar148._0_4_;
      fVar277 = auVar148._4_4_;
      auVar69._4_4_ = auVar128._4_4_ * fVar277;
      auVar69._0_4_ = auVar128._0_4_ * fVar352;
      fVar279 = auVar148._8_4_;
      auVar69._8_4_ = auVar128._8_4_ * fVar279;
      fVar281 = auVar148._12_4_;
      auVar69._12_4_ = auVar128._12_4_ * fVar281;
      fVar283 = auVar148._16_4_;
      auVar69._16_4_ = auVar128._16_4_ * fVar283;
      fVar285 = auVar148._20_4_;
      auVar69._20_4_ = auVar128._20_4_ * fVar285;
      fVar287 = auVar148._24_4_;
      auVar69._24_4_ = auVar128._24_4_ * fVar287;
      auVar69._28_4_ = uStack_1e4;
      auVar206._8_4_ = 0x3f800000;
      auVar206._0_8_ = 0x3f8000003f800000;
      auVar206._12_4_ = 0x3f800000;
      auVar206._16_4_ = 0x3f800000;
      auVar206._20_4_ = 0x3f800000;
      auVar206._24_4_ = 0x3f800000;
      auVar206._28_4_ = 0x3f800000;
      auVar208 = vsubps_avx(auVar206,auVar69);
      auVar293._8_4_ = 0x7fffffff;
      auVar293._0_8_ = 0x7fffffff7fffffff;
      auVar293._12_4_ = 0x7fffffff;
      auVar293._16_4_ = 0x7fffffff;
      auVar293._20_4_ = 0x7fffffff;
      auVar293._24_4_ = 0x7fffffff;
      auVar293._28_4_ = 0x7fffffff;
      auVar148 = vandps_avx(auVar128,auVar293);
      auVar340._8_4_ = 0x219392ef;
      auVar340._0_8_ = 0x219392ef219392ef;
      auVar340._12_4_ = 0x219392ef;
      auVar340._16_4_ = 0x219392ef;
      auVar340._20_4_ = 0x219392ef;
      auVar340._24_4_ = 0x219392ef;
      auVar340._28_4_ = 0x219392ef;
      auVar148 = vcmpps_avx(auVar148,auVar340,1);
      auVar305 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar70._4_4_ =
           (fVar277 + fVar277 * auVar208._4_4_) *
           -(fVar365 * fVar242 + fVar346 * fVar219 + auVar127._4_4_ * fVar407);
      auVar70._0_4_ =
           (fVar352 + fVar352 * auVar208._0_4_) *
           -(fVar353 * fVar215 + fVar335 * fVar214 + auVar127._0_4_ * fVar402);
      auVar70._8_4_ =
           (fVar279 + fVar279 * auVar208._8_4_) *
           -(fVar366 * fVar218 + fVar347 * fVar245 + auVar127._8_4_ * fVar410);
      auVar70._12_4_ =
           (fVar281 + fVar281 * auVar208._12_4_) *
           -(fVar367 * fVar264 + fVar348 * fVar263 + auVar127._12_4_ * fVar412);
      auVar70._16_4_ =
           (fVar283 + fVar283 * auVar208._16_4_) *
           -(fVar368 * fVar269 + fVar349 * fVar267 + auVar127._16_4_ * fVar415);
      auVar70._20_4_ =
           (fVar285 + fVar285 * auVar208._20_4_) *
           -(fVar369 * fVar315 + fVar350 * fVar307 + auVar127._20_4_ * fVar417);
      auVar70._24_4_ =
           (fVar287 + fVar287 * auVar208._24_4_) *
           -(fVar370 * fVar327 + fVar351 * fVar324 + auVar127._24_4_ * fVar420);
      auVar70._28_4_ = -(auVar159._28_4_ + fVar247);
      auVar92 = ZEXT812(0);
      auVar345 = ZEXT1264(auVar92) << 0x20;
      auVar159 = vcmpps_avx(auVar128,ZEXT1232(auVar92) << 0x20,1);
      auVar208 = vorps_avx(auVar148,auVar159);
      auVar159 = vcmpps_avx(auVar128,ZEXT1232(auVar92) << 0x20,6);
      auVar159 = vorps_avx(auVar148,auVar159);
      auVar362._8_4_ = 0xff800000;
      auVar362._0_8_ = 0xff800000ff800000;
      auVar362._12_4_ = 0xff800000;
      auVar362._16_4_ = 0xff800000;
      auVar362._20_4_ = 0xff800000;
      auVar362._24_4_ = 0xff800000;
      auVar362._28_4_ = 0xff800000;
      auVar148 = vblendvps_avx(auVar70,auVar362,auVar208);
      auVar376._8_4_ = 0x7f800000;
      auVar376._0_8_ = 0x7f8000007f800000;
      auVar376._12_4_ = 0x7f800000;
      auVar376._16_4_ = 0x7f800000;
      auVar376._20_4_ = 0x7f800000;
      auVar376._24_4_ = 0x7f800000;
      auVar376._28_4_ = 0x7f800000;
      auVar159 = vblendvps_avx(auVar70,auVar376,auVar159);
      auVar342 = vmaxps_avx(auVar342,auVar148);
      auVar26 = vminps_avx(auVar26,auVar159);
      auVar341 = ZEXT1232(auVar92) << 0x20;
      auVar148 = vsubps_avx(auVar341,_local_9e0);
      auVar159 = vsubps_avx(auVar341,auVar25);
      auVar71._4_4_ = auVar159._4_4_ * -fVar406;
      auVar71._0_4_ = auVar159._0_4_ * -fVar401;
      auVar71._8_4_ = auVar159._8_4_ * -fVar409;
      auVar71._12_4_ = auVar159._12_4_ * -fVar411;
      auVar71._16_4_ = auVar159._16_4_ * -fVar414;
      auVar71._20_4_ = auVar159._20_4_ * -fVar416;
      auVar71._24_4_ = auVar159._24_4_ * -fVar419;
      auVar71._28_4_ = auVar159._28_4_;
      auVar72._4_4_ = fVar379 * auVar148._4_4_;
      auVar72._0_4_ = fVar373 * auVar148._0_4_;
      auVar72._8_4_ = fVar381 * auVar148._8_4_;
      auVar72._12_4_ = fVar383 * auVar148._12_4_;
      auVar72._16_4_ = fVar385 * auVar148._16_4_;
      auVar72._20_4_ = fVar387 * auVar148._20_4_;
      auVar72._24_4_ = fVar389 * auVar148._24_4_;
      auVar72._28_4_ = auVar148._28_4_;
      auVar148 = vsubps_avx(auVar71,auVar72);
      auVar159 = vsubps_avx(auVar341,local_9c0);
      auVar73._4_4_ = fVar378 * auVar159._4_4_;
      auVar73._0_4_ = fVar372 * auVar159._0_4_;
      auVar73._8_4_ = fVar380 * auVar159._8_4_;
      auVar73._12_4_ = fVar382 * auVar159._12_4_;
      auVar73._16_4_ = fVar384 * auVar159._16_4_;
      auVar73._20_4_ = fVar386 * auVar159._20_4_;
      uVar111 = auVar159._28_4_;
      auVar73._24_4_ = fVar388 * auVar159._24_4_;
      auVar73._28_4_ = uVar111;
      auVar25 = vsubps_avx(auVar148,auVar73);
      auVar74._4_4_ = fStack_6fc * -fVar406;
      auVar74._0_4_ = local_700 * -fVar401;
      auVar74._8_4_ = fStack_6f8 * -fVar409;
      auVar74._12_4_ = fStack_6f4 * -fVar411;
      auVar74._16_4_ = fStack_6f0 * -fVar414;
      auVar74._20_4_ = fStack_6ec * -fVar416;
      auVar74._24_4_ = fStack_6e8 * -fVar419;
      auVar74._28_4_ = local_a60._28_4_ ^ 0x80000000;
      auVar75._4_4_ = fStack_95c * fVar379;
      auVar75._0_4_ = local_960 * fVar373;
      auVar75._8_4_ = fStack_958 * fVar381;
      auVar75._12_4_ = fStack_954 * fVar383;
      auVar75._16_4_ = fStack_950 * fVar385;
      auVar75._20_4_ = fStack_94c * fVar387;
      auVar75._24_4_ = fStack_948 * fVar389;
      auVar75._28_4_ = uVar111;
      auVar148 = vsubps_avx(auVar74,auVar75);
      auVar76._4_4_ = fStack_4bc * fVar378;
      auVar76._0_4_ = local_4c0 * fVar372;
      auVar76._8_4_ = fStack_4b8 * fVar380;
      auVar76._12_4_ = fStack_4b4 * fVar382;
      auVar76._16_4_ = fStack_4b0 * fVar384;
      auVar76._20_4_ = fStack_4ac * fVar386;
      auVar76._24_4_ = fStack_4a8 * fVar388;
      auVar76._28_4_ = uVar111;
      auVar208 = vsubps_avx(auVar148,auVar76);
      auVar148 = vrcpps_avx(auVar208);
      fVar214 = auVar148._0_4_;
      fVar215 = auVar148._4_4_;
      auVar77._4_4_ = auVar208._4_4_ * fVar215;
      auVar77._0_4_ = auVar208._0_4_ * fVar214;
      fVar219 = auVar148._8_4_;
      auVar77._8_4_ = auVar208._8_4_ * fVar219;
      fVar242 = auVar148._12_4_;
      auVar77._12_4_ = auVar208._12_4_ * fVar242;
      fVar245 = auVar148._16_4_;
      auVar77._16_4_ = auVar208._16_4_ * fVar245;
      fVar218 = auVar148._20_4_;
      auVar77._20_4_ = auVar208._20_4_ * fVar218;
      fVar263 = auVar148._24_4_;
      auVar77._24_4_ = auVar208._24_4_ * fVar263;
      auVar77._28_4_ = local_a40._28_4_;
      auVar27 = vsubps_avx(auVar206,auVar77);
      auVar148 = vandps_avx(auVar208,auVar293);
      auVar207._8_4_ = 0x219392ef;
      auVar207._0_8_ = 0x219392ef219392ef;
      auVar207._12_4_ = 0x219392ef;
      auVar207._16_4_ = 0x219392ef;
      auVar207._20_4_ = 0x219392ef;
      auVar207._24_4_ = 0x219392ef;
      auVar207._28_4_ = 0x219392ef;
      auVar159 = vcmpps_avx(auVar148,auVar207,1);
      auVar78._4_4_ = (fVar215 + fVar215 * auVar27._4_4_) * -auVar25._4_4_;
      auVar78._0_4_ = (fVar214 + fVar214 * auVar27._0_4_) * -auVar25._0_4_;
      auVar78._8_4_ = (fVar219 + fVar219 * auVar27._8_4_) * -auVar25._8_4_;
      auVar78._12_4_ = (fVar242 + fVar242 * auVar27._12_4_) * -auVar25._12_4_;
      auVar78._16_4_ = (fVar245 + fVar245 * auVar27._16_4_) * -auVar25._16_4_;
      auVar78._20_4_ = (fVar218 + fVar218 * auVar27._20_4_) * -auVar25._20_4_;
      auVar78._24_4_ = (fVar263 + fVar263 * auVar27._24_4_) * -auVar25._24_4_;
      auVar78._28_4_ = auVar25._28_4_ ^ 0x80000000;
      auVar148 = vcmpps_avx(auVar208,auVar341,1);
      auVar148 = vorps_avx(auVar159,auVar148);
      auVar148 = vblendvps_avx(auVar78,auVar362,auVar148);
      local_580 = vmaxps_avx(auVar342,auVar148);
      auVar342 = ZEXT1232(auVar92) << 0x20;
      auVar148 = vcmpps_avx(auVar208,auVar342,6);
      auVar148 = vorps_avx(auVar159,auVar148);
      auVar159 = vblendvps_avx(auVar78,auVar376,auVar148);
      auVar148 = vandps_avx(local_4e0,local_780);
      local_5a0 = vminps_avx(auVar26,auVar159);
      auVar159 = vcmpps_avx(local_580,local_5a0,2);
      auVar25 = auVar148 & auVar159;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0x7f,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0xbf,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar25[0x1f] < '\0') {
        local_780 = local_580;
        auVar25 = vminps_avx(local_6e0,local_880);
        auVar26 = vminps_avx(_local_720,_local_740);
        auVar25 = vminps_avx(auVar25,auVar26);
        auVar25 = vsubps_avx(auVar25,local_640);
        auVar148 = vandps_avx(auVar159,auVar148);
        auVar102._4_4_ = fStack_35c;
        auVar102._0_4_ = local_360;
        auVar102._8_4_ = fStack_358;
        auVar102._12_4_ = fStack_354;
        auVar102._16_4_ = fStack_350;
        auVar102._20_4_ = fStack_34c;
        auVar102._24_4_ = fStack_348;
        auVar102._28_4_ = fStack_344;
        auVar159 = vminps_avx(auVar102,auVar206);
        auVar208 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar159 = vmaxps_avx(auVar159,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar408 + fVar135 * (auVar159._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar413 + fVar167 * (auVar159._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar418 + fVar168 * (auVar159._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fStack_b44 + fVar170 * (auVar159._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar408 + fVar135 * (auVar159._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar413 + fVar167 * (auVar159._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar418 + fVar168 * (auVar159._24_4_ + 6.0) * 0.125;
        fStack_184 = fStack_b44 + auVar159._28_4_ + 7.0;
        auVar101._4_4_ = fStack_37c;
        auVar101._0_4_ = local_380;
        auVar101._8_4_ = fStack_378;
        auVar101._12_4_ = fStack_374;
        auVar101._16_4_ = fStack_370;
        auVar101._20_4_ = fStack_36c;
        auVar101._24_4_ = fStack_368;
        auVar101._28_4_ = fStack_364;
        auVar159 = vminps_avx(auVar101,auVar206);
        auVar159 = vmaxps_avx(auVar159,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar408 + fVar135 * (auVar159._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar413 + fVar167 * (auVar159._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar418 + fVar168 * (auVar159._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fStack_b44 + fVar170 * (auVar159._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar408 + fVar135 * (auVar159._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar413 + fVar167 * (auVar159._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar418 + fVar168 * (auVar159._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fStack_b44 + auVar159._28_4_ + 7.0;
        auVar79._4_4_ = auVar25._4_4_ * 0.99999976;
        auVar79._0_4_ = auVar25._0_4_ * 0.99999976;
        auVar79._8_4_ = auVar25._8_4_ * 0.99999976;
        auVar79._12_4_ = auVar25._12_4_ * 0.99999976;
        auVar79._16_4_ = auVar25._16_4_ * 0.99999976;
        auVar79._20_4_ = auVar25._20_4_ * 0.99999976;
        auVar79._24_4_ = auVar25._24_4_ * 0.99999976;
        auVar79._28_4_ = 0x3f7ffffc;
        auVar159 = vmaxps_avx(auVar342,auVar79);
        auVar80._4_4_ = auVar159._4_4_ * auVar159._4_4_;
        auVar80._0_4_ = auVar159._0_4_ * auVar159._0_4_;
        auVar80._8_4_ = auVar159._8_4_ * auVar159._8_4_;
        auVar80._12_4_ = auVar159._12_4_ * auVar159._12_4_;
        auVar80._16_4_ = auVar159._16_4_ * auVar159._16_4_;
        auVar80._20_4_ = auVar159._20_4_ * auVar159._20_4_;
        auVar80._24_4_ = auVar159._24_4_ * auVar159._24_4_;
        auVar80._28_4_ = auVar159._28_4_;
        auVar25 = vsubps_avx(local_600,auVar80);
        auVar81._4_4_ = auVar25._4_4_ * (float)local_760._4_4_;
        auVar81._0_4_ = auVar25._0_4_ * (float)local_760._0_4_;
        auVar81._8_4_ = auVar25._8_4_ * fStack_758;
        auVar81._12_4_ = auVar25._12_4_ * fStack_754;
        auVar81._16_4_ = auVar25._16_4_ * fStack_750;
        auVar81._20_4_ = auVar25._20_4_ * fStack_74c;
        auVar81._24_4_ = auVar25._24_4_ * fStack_748;
        auVar81._28_4_ = auVar159._28_4_;
        auVar26 = vsubps_avx(local_620,auVar81);
        auVar159 = vcmpps_avx(auVar26,ZEXT832(0) << 0x20,5);
        if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar159 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar159 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar159 >> 0x7f,0) == '\0') &&
              (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar159 >> 0xbf,0) == '\0') &&
            (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar159[0x1f]) {
          auVar290 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar275 = ZEXT828(0) << 0x20;
          auVar231 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar253 = ZEXT1628(ZEXT816(0) << 0x40);
          _local_9e0 = ZEXT832(0) << 0x20;
          auVar301._8_4_ = 0x7f800000;
          auVar301._0_8_ = 0x7f8000007f800000;
          auVar301._12_4_ = 0x7f800000;
          auVar301._16_4_ = 0x7f800000;
          auVar301._20_4_ = 0x7f800000;
          auVar301._24_4_ = 0x7f800000;
          auVar301._28_4_ = 0x7f800000;
          auVar343._8_4_ = 0xff800000;
          auVar343._0_8_ = 0xff800000ff800000;
          auVar343._12_4_ = 0xff800000;
          auVar343._16_4_ = 0xff800000;
          auVar343._20_4_ = 0xff800000;
          auVar343._24_4_ = 0xff800000;
          auVar343._28_4_ = 0xff800000;
        }
        else {
          local_9c0 = auVar25;
          auVar208 = vrcpps_avx(local_320);
          fVar214 = auVar208._0_4_;
          fVar215 = auVar208._4_4_;
          auVar82._4_4_ = local_320._4_4_ * fVar215;
          auVar82._0_4_ = local_320._0_4_ * fVar214;
          fVar219 = auVar208._8_4_;
          auVar82._8_4_ = local_320._8_4_ * fVar219;
          fVar242 = auVar208._12_4_;
          auVar82._12_4_ = local_320._12_4_ * fVar242;
          fVar245 = auVar208._16_4_;
          auVar82._16_4_ = local_320._16_4_ * fVar245;
          fVar218 = auVar208._20_4_;
          auVar82._20_4_ = local_320._20_4_ * fVar218;
          fVar263 = auVar208._24_4_;
          auVar82._24_4_ = local_320._24_4_ * fVar263;
          auVar82._28_4_ = auVar25._28_4_;
          auVar341 = vsubps_avx(auVar206,auVar82);
          auVar27 = vsqrtps_avx(auVar26);
          fVar214 = fVar214 + fVar214 * auVar341._0_4_;
          fVar215 = fVar215 + fVar215 * auVar341._4_4_;
          fVar219 = fVar219 + fVar219 * auVar341._8_4_;
          fVar242 = fVar242 + fVar242 * auVar341._12_4_;
          fVar245 = fVar245 + fVar245 * auVar341._16_4_;
          fVar218 = fVar218 + fVar218 * auVar341._20_4_;
          fVar263 = fVar263 + fVar263 * auVar341._24_4_;
          auVar36 = vsubps_avx(local_300,auVar27);
          fVar352 = auVar36._0_4_ * fVar214;
          fVar408 = auVar36._4_4_ * fVar215;
          auVar83._4_4_ = fVar408;
          auVar83._0_4_ = fVar352;
          fVar372 = auVar36._8_4_ * fVar219;
          auVar83._8_4_ = fVar372;
          fVar413 = auVar36._12_4_ * fVar242;
          auVar83._12_4_ = fVar413;
          fVar378 = auVar36._16_4_ * fVar245;
          auVar83._16_4_ = fVar378;
          fVar418 = auVar36._20_4_ * fVar218;
          auVar83._20_4_ = fVar418;
          fVar380 = auVar36._24_4_ * fVar263;
          auVar83._24_4_ = fVar380;
          auVar83._28_4_ = fStack_944;
          auVar36 = vsubps_avx(auVar27,local_2e0);
          fVar214 = auVar36._0_4_ * fVar214;
          fVar215 = auVar36._4_4_ * fVar215;
          auVar84._4_4_ = fVar215;
          auVar84._0_4_ = fVar214;
          fVar219 = auVar36._8_4_ * fVar219;
          auVar84._8_4_ = fVar219;
          fVar242 = auVar36._12_4_ * fVar242;
          auVar84._12_4_ = fVar242;
          fVar245 = auVar36._16_4_ * fVar245;
          auVar84._16_4_ = fVar245;
          fVar218 = auVar36._20_4_ * fVar218;
          auVar84._20_4_ = fVar218;
          fVar263 = auVar36._24_4_ * fVar263;
          auVar84._24_4_ = fVar263;
          auVar84._28_4_ = 0x3f800000;
          fVar264 = fVar400 * (fVar352 * local_520 + local_540);
          fVar267 = fVar278 * (fVar408 * fStack_51c + fStack_53c);
          fVar269 = fVar280 * (fVar372 * fStack_518 + fStack_538);
          fVar307 = fVar282 * (fVar413 * fStack_514 + fStack_534);
          fVar315 = fVar284 * (fVar378 * fStack_510 + fStack_530);
          fVar324 = fVar286 * (fVar418 * fStack_50c + fStack_52c);
          fVar327 = fVar288 * (fVar380 * fStack_508 + fStack_528);
          auVar237._0_4_ = fVar308 + fVar421 * fVar264;
          auVar237._4_4_ = fVar316 + fVar425 * fVar267;
          auVar237._8_4_ = fVar319 + fVar426 * fVar269;
          auVar237._12_4_ = fVar322 + fVar427 * fVar307;
          auVar237._16_4_ = fVar325 + fVar428 * fVar315;
          auVar237._20_4_ = fVar328 + fVar429 * fVar324;
          auVar237._24_4_ = fVar331 + fVar430 * fVar327;
          auVar237._28_4_ = fVar333 + auVar36._28_4_;
          auVar85._4_4_ = fStack_4bc * fVar408;
          auVar85._0_4_ = local_4c0 * fVar352;
          auVar85._8_4_ = fStack_4b8 * fVar372;
          auVar85._12_4_ = fStack_4b4 * fVar413;
          auVar85._16_4_ = fStack_4b0 * fVar378;
          auVar85._20_4_ = fStack_4ac * fVar418;
          auVar85._24_4_ = fStack_4a8 * fVar380;
          auVar85._28_4_ = auVar27._28_4_;
          local_840 = vsubps_avx(auVar85,auVar237);
          auVar259._0_4_ = fVar309 + fVar212 * fVar264;
          auVar259._4_4_ = fVar317 + fVar216 * fVar267;
          auVar259._8_4_ = fVar320 + fVar243 * fVar269;
          auVar259._12_4_ = fVar323 + fVar246 * fVar307;
          auVar259._16_4_ = fVar326 + fVar265 * fVar315;
          auVar259._20_4_ = fVar329 + fVar268 * fVar324;
          auVar259._24_4_ = fVar332 + fVar318 * fVar327;
          auVar259._28_4_ = fVar334 + auVar27._28_4_;
          auVar86._4_4_ = fVar408 * fStack_95c;
          auVar86._0_4_ = fVar352 * local_960;
          auVar86._8_4_ = fVar372 * fStack_958;
          auVar86._12_4_ = fVar413 * fStack_954;
          auVar86._16_4_ = fVar378 * fStack_950;
          auVar86._20_4_ = fVar418 * fStack_94c;
          auVar86._24_4_ = fVar380 * fStack_948;
          auVar86._28_4_ = fStack_944;
          local_ac0 = vsubps_avx(auVar86,auVar259);
          auVar209._0_4_ = local_820 + fVar213 * fVar264;
          auVar209._4_4_ = fStack_81c + fVar217 * fVar267;
          auVar209._8_4_ = fStack_818 + fVar244 * fVar269;
          auVar209._12_4_ = aStack_814.w + fVar248 * fVar307;
          auVar209._16_4_ = fStack_810 + fVar266 * fVar315;
          auVar209._20_4_ = fStack_80c + fVar270 * fVar324;
          auVar209._24_4_ = fStack_808 + fVar321 * fVar327;
          auVar209._28_4_ = fStack_804 + auVar208._28_4_ + auVar341._28_4_ + fStack_524;
          auVar87._4_4_ = fStack_6fc * fVar408;
          auVar87._0_4_ = local_700 * fVar352;
          auVar87._8_4_ = fStack_6f8 * fVar372;
          auVar87._12_4_ = fStack_6f4 * fVar413;
          auVar87._16_4_ = fStack_6f0 * fVar378;
          auVar87._20_4_ = fStack_6ec * fVar418;
          auVar87._24_4_ = fStack_6e8 * fVar380;
          auVar87._28_4_ = fStack_944;
          _local_9e0 = vsubps_avx(auVar87,auVar209);
          fVar400 = fVar400 * (fVar214 * local_520 + local_540);
          fVar278 = fVar278 * (fVar215 * fStack_51c + fStack_53c);
          fVar280 = fVar280 * (fVar219 * fStack_518 + fStack_538);
          fVar282 = fVar282 * (fVar242 * fStack_514 + fStack_534);
          fVar284 = fVar284 * (fVar245 * fStack_510 + fStack_530);
          fVar286 = fVar286 * (fVar218 * fStack_50c + fStack_52c);
          fVar288 = fVar288 * (fVar263 * fStack_508 + fStack_528);
          auVar210._0_4_ = fVar308 + fVar421 * fVar400;
          auVar210._4_4_ = fVar316 + fVar425 * fVar278;
          auVar210._8_4_ = fVar319 + fVar426 * fVar280;
          auVar210._12_4_ = fVar322 + fVar427 * fVar282;
          auVar210._16_4_ = fVar325 + fVar428 * fVar284;
          auVar210._20_4_ = fVar328 + fVar429 * fVar286;
          auVar210._24_4_ = fVar331 + fVar430 * fVar288;
          auVar210._28_4_ = fVar333 + local_9e0._28_4_ + fStack_524;
          auVar88._4_4_ = fStack_4bc * fVar215;
          auVar88._0_4_ = local_4c0 * fVar214;
          auVar88._8_4_ = fStack_4b8 * fVar219;
          auVar88._12_4_ = fStack_4b4 * fVar242;
          auVar88._16_4_ = fStack_4b0 * fVar245;
          auVar88._20_4_ = fStack_4ac * fVar218;
          auVar88._24_4_ = fStack_4a8 * fVar263;
          auVar88._28_4_ = fVar330;
          auVar208 = vsubps_avx(auVar88,auVar210);
          auVar294._0_4_ = fVar309 + fVar212 * fVar400;
          auVar294._4_4_ = fVar317 + fVar216 * fVar278;
          auVar294._8_4_ = fVar320 + fVar243 * fVar280;
          auVar294._12_4_ = fVar323 + fVar246 * fVar282;
          auVar294._16_4_ = fVar326 + fVar265 * fVar284;
          auVar294._20_4_ = fVar329 + fVar268 * fVar286;
          auVar294._24_4_ = fVar332 + fVar318 * fVar288;
          auVar294._28_4_ = fVar334 + fVar330;
          auVar89._4_4_ = fVar215 * fStack_95c;
          auVar89._0_4_ = fVar214 * local_960;
          auVar89._8_4_ = fVar219 * fStack_958;
          auVar89._12_4_ = fVar242 * fStack_954;
          auVar89._16_4_ = fVar245 * fStack_950;
          auVar89._20_4_ = fVar218 * fStack_94c;
          auVar89._24_4_ = fVar263 * fStack_948;
          auVar89._28_4_ = fVar371;
          auVar27 = vsubps_avx(auVar89,auVar294);
          auVar290 = auVar27._0_28_;
          auVar276._0_4_ = local_820 + fVar213 * fVar400;
          auVar276._4_4_ = fStack_81c + fVar217 * fVar278;
          auVar276._8_4_ = fStack_818 + fVar244 * fVar280;
          auVar276._12_4_ = aStack_814.w + fVar248 * fVar282;
          auVar276._16_4_ = fStack_810 + fVar266 * fVar284;
          auVar276._20_4_ = fStack_80c + fVar270 * fVar286;
          auVar276._24_4_ = fStack_808 + fVar321 * fVar288;
          auVar276._28_4_ = fStack_804 + fStack_944;
          auVar90._4_4_ = fStack_6fc * fVar215;
          auVar90._0_4_ = local_700 * fVar214;
          auVar90._8_4_ = fStack_6f8 * fVar219;
          auVar90._12_4_ = fStack_6f4 * fVar242;
          auVar90._16_4_ = fStack_6f0 * fVar245;
          auVar90._20_4_ = fStack_6ec * fVar218;
          auVar90._24_4_ = fStack_6e8 * fVar263;
          auVar90._28_4_ = fVar371;
          auVar27 = vsubps_avx(auVar90,auVar276);
          auVar275 = auVar27._0_28_;
          auVar342 = vcmpps_avx(auVar26,auVar342,5);
          auVar302._8_4_ = 0x7f800000;
          auVar302._0_8_ = 0x7f8000007f800000;
          auVar302._12_4_ = 0x7f800000;
          auVar302._16_4_ = 0x7f800000;
          auVar302._20_4_ = 0x7f800000;
          auVar302._24_4_ = 0x7f800000;
          auVar302._28_4_ = 0x7f800000;
          auVar301 = vblendvps_avx(auVar302,auVar83,auVar342);
          auVar26 = vmaxps_avx(local_500,local_aa0);
          auVar91._4_4_ = auVar26._4_4_ * 1.9073486e-06;
          auVar91._0_4_ = auVar26._0_4_ * 1.9073486e-06;
          auVar91._8_4_ = auVar26._8_4_ * 1.9073486e-06;
          auVar91._12_4_ = auVar26._12_4_ * 1.9073486e-06;
          auVar91._16_4_ = auVar26._16_4_ * 1.9073486e-06;
          auVar91._20_4_ = auVar26._20_4_ * 1.9073486e-06;
          auVar91._24_4_ = auVar26._24_4_ * 1.9073486e-06;
          auVar91._28_4_ = auVar26._28_4_;
          auVar26 = vcmpps_avx(local_2c0,auVar91,1);
          auVar344._8_4_ = 0xff800000;
          auVar344._0_8_ = 0xff800000ff800000;
          auVar344._12_4_ = 0xff800000;
          auVar344._16_4_ = 0xff800000;
          auVar344._20_4_ = 0xff800000;
          auVar344._24_4_ = 0xff800000;
          auVar344._28_4_ = 0xff800000;
          auVar343 = vblendvps_avx(auVar344,auVar84,auVar342);
          auVar27 = auVar342 & auVar26;
          if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0x7f,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar27 >> 0xbf,0) != '\0') ||
              (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar27[0x1f] < '\0') {
            auVar159 = vandps_avx(auVar26,auVar342);
            auVar194 = vpackssdw_avx(auVar159._0_16_,auVar159._16_16_);
            auVar26 = vcmpps_avx(auVar25,_DAT_01f7b000,2);
            auVar166._8_4_ = 0xff800000;
            auVar166._0_8_ = 0xff800000ff800000;
            auVar166._12_4_ = 0xff800000;
            auVar166._16_4_ = 0xff800000;
            auVar166._20_4_ = 0xff800000;
            auVar166._24_4_ = 0xff800000;
            auVar166._28_4_ = 0xff800000;
            auVar241._8_4_ = 0x7f800000;
            auVar241._0_8_ = 0x7f8000007f800000;
            auVar241._12_4_ = 0x7f800000;
            auVar241._16_4_ = 0x7f800000;
            auVar241._20_4_ = 0x7f800000;
            auVar241._24_4_ = 0x7f800000;
            auVar241._28_4_ = 0x7f800000;
            auVar25 = vblendvps_avx(auVar241,auVar166,auVar26);
            auVar222 = vpmovsxwd_avx(auVar194);
            auVar194 = vpunpckhwd_avx(auVar194,auVar194);
            auVar393._16_16_ = auVar194;
            auVar393._0_16_ = auVar222;
            auVar301 = vblendvps_avx(auVar301,auVar25,auVar393);
            auVar25 = vblendvps_avx(auVar166,auVar241,auVar26);
            auVar343 = vblendvps_avx(auVar343,auVar25,auVar393);
            auVar186._0_8_ = auVar159._0_8_ ^ 0xffffffffffffffff;
            auVar186._8_4_ = auVar159._8_4_ ^ 0xffffffff;
            auVar186._12_4_ = auVar159._12_4_ ^ 0xffffffff;
            auVar186._16_4_ = auVar159._16_4_ ^ 0xffffffff;
            auVar186._20_4_ = auVar159._20_4_ ^ 0xffffffff;
            auVar186._24_4_ = auVar159._24_4_ ^ 0xffffffff;
            auVar186._28_4_ = auVar159._28_4_ ^ 0xffffffff;
            auVar159 = vorps_avx(auVar26,auVar186);
            auVar159 = vandps_avx(auVar342,auVar159);
          }
          auVar231 = local_840._0_28_;
          auVar253 = local_ac0._0_28_;
        }
        auVar303._4_4_ = fStack_95c;
        auVar303._0_4_ = local_960;
        auVar303._8_4_ = fStack_958;
        auVar303._12_4_ = fStack_954;
        auVar303._16_4_ = fStack_950;
        auVar303._20_4_ = fStack_94c;
        auVar303._24_4_ = fStack_948;
        auVar303._28_4_ = fStack_944;
        fVar212 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar213 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar214 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_560 = vminps_avx(local_5a0,auVar301);
        _local_5c0 = vmaxps_avx(local_580,auVar343);
        auVar345 = ZEXT3264(_local_5c0);
        auVar25 = vcmpps_avx(local_580,local_560,2);
        local_600 = vandps_avx(auVar25,auVar148);
        auVar305 = ZEXT3264(local_600);
        auVar25 = vcmpps_avx(_local_5c0,local_5a0,2);
        _local_760 = vandps_avx(auVar148,auVar25);
        auVar148 = vorps_avx(local_600,_local_760);
        if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar148 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar148 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar148 >> 0x7f,0) != '\0') ||
              (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar148 >> 0xbf,0) != '\0') ||
            (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar148[0x1f] < '\0') {
          _local_720 = _local_5c0;
          fVar187 = local_760._28_4_;
          auVar131._0_4_ =
               fVar212 * auVar208._0_4_ + fVar213 * auVar290._0_4_ + fVar214 * auVar275._0_4_;
          auVar131._4_4_ =
               fVar212 * auVar208._4_4_ + fVar213 * auVar290._4_4_ + fVar214 * auVar275._4_4_;
          auVar131._8_4_ =
               fVar212 * auVar208._8_4_ + fVar213 * auVar290._8_4_ + fVar214 * auVar275._8_4_;
          auVar131._12_4_ =
               fVar212 * auVar208._12_4_ + fVar213 * auVar290._12_4_ + fVar214 * auVar275._12_4_;
          auVar131._16_4_ =
               fVar212 * auVar208._16_4_ + fVar213 * auVar290._16_4_ + fVar214 * auVar275._16_4_;
          auVar131._20_4_ =
               fVar212 * auVar208._20_4_ + fVar213 * auVar290._20_4_ + fVar214 * auVar275._20_4_;
          auVar131._24_4_ =
               fVar212 * auVar208._24_4_ + fVar213 * auVar290._24_4_ + fVar214 * auVar275._24_4_;
          auVar131._28_4_ = fVar187 + fVar187 + auVar148._28_4_;
          auVar181._0_8_ = auVar159._0_8_ ^ 0xffffffffffffffff;
          auVar181._8_4_ = auVar159._8_4_ ^ 0xffffffff;
          auVar181._12_4_ = auVar159._12_4_ ^ 0xffffffff;
          auVar181._16_4_ = auVar159._16_4_ ^ 0xffffffff;
          auVar181._20_4_ = auVar159._20_4_ ^ 0xffffffff;
          auVar181._24_4_ = auVar159._24_4_ ^ 0xffffffff;
          auVar181._28_4_ = auVar159._28_4_ ^ 0xffffffff;
          auVar238._8_4_ = 0x7fffffff;
          auVar238._0_8_ = 0x7fffffff7fffffff;
          auVar238._12_4_ = 0x7fffffff;
          auVar238._16_4_ = 0x7fffffff;
          auVar238._20_4_ = 0x7fffffff;
          auVar238._24_4_ = 0x7fffffff;
          auVar238._28_4_ = 0x7fffffff;
          auVar148 = vandps_avx(auVar131,auVar238);
          auVar260._8_4_ = 0x3e99999a;
          auVar260._0_8_ = 0x3e99999a3e99999a;
          auVar260._12_4_ = 0x3e99999a;
          auVar260._16_4_ = 0x3e99999a;
          auVar260._20_4_ = 0x3e99999a;
          auVar260._24_4_ = 0x3e99999a;
          auVar260._28_4_ = 0x3e99999a;
          auVar148 = vcmpps_avx(auVar148,auVar260,1);
          local_640 = vorps_avx(auVar148,auVar181);
          auVar132._0_4_ =
               fVar212 * auVar231._0_4_ +
               fVar213 * auVar253._0_4_ + fVar214 * (float)local_9e0._0_4_;
          auVar132._4_4_ =
               fVar212 * auVar231._4_4_ +
               fVar213 * auVar253._4_4_ + fVar214 * (float)local_9e0._4_4_;
          auVar132._8_4_ =
               fVar212 * auVar231._8_4_ + fVar213 * auVar253._8_4_ + fVar214 * fStack_9d8;
          auVar132._12_4_ =
               fVar212 * auVar231._12_4_ + fVar213 * auVar253._12_4_ + fVar214 * fStack_9d4;
          auVar132._16_4_ =
               fVar212 * auVar231._16_4_ + fVar213 * auVar253._16_4_ + fVar214 * fStack_9d0;
          auVar132._20_4_ =
               fVar212 * auVar231._20_4_ + fVar213 * auVar253._20_4_ + fVar214 * fStack_9cc;
          auVar132._24_4_ =
               fVar212 * auVar231._24_4_ + fVar213 * auVar253._24_4_ + fVar214 * fStack_9c8;
          auVar132._28_4_ = fVar187 + auVar208._28_4_ + local_640._28_4_;
          auVar148 = vandps_avx(auVar132,auVar238);
          auVar148 = vcmpps_avx(auVar148,auVar260,1);
          auVar148 = vorps_avx(auVar148,auVar181);
          auVar160._8_4_ = 3;
          auVar160._0_8_ = 0x300000003;
          auVar160._12_4_ = 3;
          auVar160._16_4_ = 3;
          auVar160._20_4_ = 3;
          auVar160._24_4_ = 3;
          auVar160._28_4_ = 3;
          auVar182._8_4_ = 2;
          auVar182._0_8_ = 0x200000002;
          auVar182._12_4_ = 2;
          auVar182._16_4_ = 2;
          auVar182._20_4_ = 2;
          auVar182._24_4_ = 2;
          auVar182._28_4_ = 2;
          auVar148 = vblendvps_avx(auVar182,auVar160,auVar148);
          local_660 = ZEXT432(local_b8c);
          auVar222 = vpshufd_avx(ZEXT416(local_b8c),0);
          auVar194 = vpcmpgtd_avx(auVar148._16_16_,auVar222);
          local_680._0_16_ = auVar222;
          auVar222 = vpcmpgtd_avx(auVar148._0_16_,auVar222);
          auVar161._16_16_ = auVar194;
          auVar161._0_16_ = auVar222;
          local_620 = vblendps_avx(ZEXT1632(auVar222),auVar161,0xf0);
          auVar148 = vandnps_avx(local_620,local_600);
          local_740._4_4_ = local_580._4_4_ + (float)local_860._4_4_;
          local_740._0_4_ = local_580._0_4_ + (float)local_860._0_4_;
          fStack_738 = local_580._8_4_ + fStack_858;
          fStack_734 = local_580._12_4_ + fStack_854;
          fStack_730 = local_580._16_4_ + fStack_850;
          fStack_72c = local_580._20_4_ + fStack_84c;
          fStack_728 = local_580._24_4_ + fStack_848;
          fStack_724 = local_580._28_4_ + fStack_844;
          local_a60 = auVar37;
          auVar159 = _local_a80;
          while( true ) {
            local_3c0 = auVar148;
            if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar148 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar148 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar148 >> 0x7f,0) == '\0') &&
                  (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar148 >> 0xbf,0) == '\0') &&
                (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar148[0x1f]) break;
            auVar162._8_4_ = 0x7f800000;
            auVar162._0_8_ = 0x7f8000007f800000;
            auVar162._12_4_ = 0x7f800000;
            auVar162._16_4_ = 0x7f800000;
            auVar162._20_4_ = 0x7f800000;
            auVar162._24_4_ = 0x7f800000;
            auVar162._28_4_ = 0x7f800000;
            auVar25 = vblendvps_avx(auVar162,local_780,auVar148);
            auVar342 = vshufps_avx(auVar25,auVar25,0xb1);
            auVar342 = vminps_avx(auVar25,auVar342);
            auVar26 = vshufpd_avx(auVar342,auVar342,5);
            auVar342 = vminps_avx(auVar342,auVar26);
            auVar26 = vperm2f128_avx(auVar342,auVar342,1);
            auVar342 = vminps_avx(auVar342,auVar26);
            auVar25 = vcmpps_avx(auVar25,auVar342,0);
            auVar342 = auVar148 & auVar25;
            if ((((((((auVar342 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar342 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar342 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar342 >> 0x7f,0) != '\0') ||
                  (auVar342 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar342 >> 0xbf,0) != '\0') ||
                (auVar342 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar342[0x1f] < '\0') {
              auVar148 = vandps_avx(auVar25,auVar148);
            }
            uVar103 = vmovmskps_avx(auVar148);
            uVar108 = 0;
            if (uVar103 != 0) {
              for (; (uVar103 >> uVar108 & 1) == 0; uVar108 = uVar108 + 1) {
              }
            }
            uVar105 = (ulong)uVar108;
            *(undefined4 *)(local_3c0 + uVar105 * 4) = 0;
            aVar9 = (ray->super_RayK<1>).dir.field_0.field_1;
            local_820 = aVar9.x;
            fStack_81c = aVar9.y;
            fStack_818 = aVar9.z;
            aStack_814 = aVar9.field_3;
            auVar194 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
            fVar187 = local_1a0[uVar105];
            uVar108 = *(uint *)(local_580 + uVar105 * 4);
            if (auVar194._0_4_ < 0.0) {
              fVar212 = sqrtf(auVar194._0_4_);
              auVar303._4_4_ = fStack_95c;
              auVar303._0_4_ = local_960;
              auVar303._8_4_ = fStack_958;
              auVar303._12_4_ = fStack_954;
              auVar303._16_4_ = fStack_950;
              auVar303._20_4_ = fStack_94c;
              auVar303._24_4_ = fStack_948;
              auVar303._28_4_ = fStack_944;
              auVar159 = _local_a80;
            }
            else {
              auVar194 = vsqrtss_avx(auVar194,auVar194);
              fVar212 = auVar194._0_4_;
            }
            auVar364 = ZEXT3264(auVar159);
            auVar305 = ZEXT3264(auVar303);
            auVar222 = vminps_avx(_local_920,_local_7e0);
            auVar194 = vmaxps_avx(_local_920,_local_7e0);
            auVar191 = vminps_avx(_local_7c0,_local_800);
            auVar119 = vminps_avx(auVar222,auVar191);
            auVar222 = vmaxps_avx(_local_7c0,_local_800);
            auVar191 = vmaxps_avx(auVar194,auVar222);
            auVar190._8_4_ = 0x7fffffff;
            auVar190._0_8_ = 0x7fffffff7fffffff;
            auVar190._12_4_ = 0x7fffffff;
            auVar194 = vandps_avx(auVar119,auVar190);
            auVar222 = vandps_avx(auVar191,auVar190);
            auVar194 = vmaxps_avx(auVar194,auVar222);
            auVar222 = vmovshdup_avx(auVar194);
            auVar222 = vmaxss_avx(auVar222,auVar194);
            auVar194 = vshufpd_avx(auVar194,auVar194,1);
            auVar194 = vmaxss_avx(auVar194,auVar222);
            local_aa0._0_4_ = auVar194._0_4_ * 1.9073486e-06;
            local_9c0._0_4_ = fVar212 * 1.9073486e-06;
            local_6e0._0_16_ = vshufps_avx(auVar191,auVar191,0xff);
            auVar194 = vinsertps_avx(ZEXT416(uVar108),ZEXT416((uint)fVar187),0x10);
            auVar345 = ZEXT1664(auVar194);
            lVar112 = 5;
            do {
              do {
                auVar194 = auVar345._0_16_;
                bVar113 = lVar112 == 0;
                lVar112 = lVar112 + -1;
                auVar159 = auVar364._0_32_;
                if (bVar113) goto LAB_00b2e1aa;
                auVar222 = vshufps_avx(auVar194,auVar194,0);
                auVar118._0_4_ = auVar222._0_4_ * local_820 + 0.0;
                auVar118._4_4_ = auVar222._4_4_ * fStack_81c + 0.0;
                auVar118._8_4_ = auVar222._8_4_ * fStack_818 + 0.0;
                auVar118._12_4_ = auVar222._12_4_ * aStack_814.w + 0.0;
                auVar222 = vmovshdup_avx(auVar194);
                fVar217 = auVar222._0_4_;
                fVar215 = 1.0 - fVar217;
                fVar212 = fVar217 * fVar217;
                fVar213 = fVar217 * 3.0;
                fVar187 = fVar213 + -5.0;
                fVar214 = fVar215 * fVar215;
                auVar222 = ZEXT416((uint)(fVar217 * fVar217 * -fVar215 * 0.5));
                auVar222 = vshufps_avx(auVar222,auVar222,0);
                auVar191 = ZEXT416((uint)((fVar214 * (fVar215 * 3.0 + -5.0) + 2.0) * 0.5));
                auVar191 = vshufps_avx(auVar191,auVar191,0);
                auVar119 = ZEXT416((uint)((fVar212 * fVar187 + 2.0) * 0.5));
                auVar119 = vshufps_avx(auVar119,auVar119,0);
                auVar138 = ZEXT416((uint)(fVar215 * fVar215 * -fVar217 * 0.5));
                auVar138 = vshufps_avx(auVar138,auVar138,0);
                auVar173._0_4_ =
                     auVar138._0_4_ * (float)local_920._0_4_ +
                     auVar119._0_4_ * (float)local_7e0._0_4_ +
                     auVar191._0_4_ * (float)local_7c0._0_4_ +
                     auVar222._0_4_ * (float)local_800._0_4_;
                auVar173._4_4_ =
                     auVar138._4_4_ * (float)local_920._4_4_ +
                     auVar119._4_4_ * (float)local_7e0._4_4_ +
                     auVar191._4_4_ * (float)local_7c0._4_4_ +
                     auVar222._4_4_ * (float)local_800._4_4_;
                auVar173._8_4_ =
                     auVar138._8_4_ * fStack_918 +
                     auVar119._8_4_ * fStack_7d8 +
                     auVar191._8_4_ * fStack_7b8 + auVar222._8_4_ * fStack_7f8;
                auVar173._12_4_ =
                     auVar138._12_4_ * fStack_914 +
                     auVar119._12_4_ * fStack_7d4 +
                     auVar191._12_4_ * fStack_7b4 + auVar222._12_4_ * fStack_7f4;
                local_840._0_16_ = auVar173;
                auVar222 = vsubps_avx(auVar118,auVar173);
                _local_9e0 = auVar222;
                auVar222 = vdpps_avx(auVar222,auVar222,0x7f);
                local_ac0._0_16_ = ZEXT416((uint)(fVar217 * -9.0 + 4.0));
                fVar216 = auVar222._0_4_;
                if (fVar216 < 0.0) {
                  local_a40._0_4_ = fVar212;
                  local_8a0._0_16_ = ZEXT416((uint)fVar215);
                  local_a60._0_4_ = fVar213;
                  local_8c0._0_4_ = fVar217 * 9.0;
                  local_8e0._0_4_ = fVar187;
                  local_900._0_4_ = fVar214;
                  local_6c0._0_4_ = fVar215 * -2.0;
                  fVar219 = sqrtf(fVar216);
                  fVar244 = (float)local_8c0._0_4_;
                  fVar242 = (float)local_6c0._0_4_;
                  fVar212 = (float)local_a40._0_4_;
                  fVar243 = (float)local_a60._0_4_;
                  fVar187 = (float)local_8e0._0_4_;
                  fVar214 = (float)local_900._0_4_;
                  fVar215 = (float)local_8a0._0_4_;
                }
                else {
                  auVar191 = vsqrtss_avx(auVar222,auVar222);
                  fVar219 = auVar191._0_4_;
                  fVar244 = fVar217 * 9.0;
                  fVar242 = fVar215 * -2.0;
                  fVar243 = fVar213;
                }
                auVar191 = ZEXT416((uint)((fVar212 + fVar217 * fVar242) * 0.5));
                auVar191 = vshufps_avx(auVar191,auVar191,0);
                auVar119 = ZEXT416((uint)(((fVar215 + fVar215) * (fVar243 + 2.0) +
                                          fVar215 * fVar215 * -3.0) * 0.5));
                auVar119 = vshufps_avx(auVar119,auVar119,0);
                auVar138 = ZEXT416((uint)((fVar187 * (fVar217 + fVar217) + fVar217 * fVar243) * 0.5)
                                  );
                auVar138 = vshufps_avx(auVar138,auVar138,0);
                auVar139 = ZEXT416((uint)((fVar217 * (fVar215 + fVar215) - fVar214) * 0.5));
                auVar139 = vshufps_avx(auVar139,auVar139,0);
                auVar355._0_4_ =
                     (float)local_920._0_4_ * auVar139._0_4_ +
                     (float)local_7e0._0_4_ * auVar138._0_4_ +
                     (float)local_800._0_4_ * auVar191._0_4_ +
                     (float)local_7c0._0_4_ * auVar119._0_4_;
                auVar355._4_4_ =
                     (float)local_920._4_4_ * auVar139._4_4_ +
                     (float)local_7e0._4_4_ * auVar138._4_4_ +
                     (float)local_800._4_4_ * auVar191._4_4_ +
                     (float)local_7c0._4_4_ * auVar119._4_4_;
                auVar355._8_4_ =
                     fStack_918 * auVar139._8_4_ +
                     fStack_7d8 * auVar138._8_4_ +
                     fStack_7f8 * auVar191._8_4_ + fStack_7b8 * auVar119._8_4_;
                auVar355._12_4_ =
                     fStack_914 * auVar139._12_4_ +
                     fStack_7d4 * auVar138._12_4_ +
                     fStack_7f4 * auVar191._12_4_ + fStack_7b4 * auVar119._12_4_;
                auVar139 = vpermilps_avx(ZEXT416((uint)(fVar213 + -1.0)),0);
                auVar114 = vpermilps_avx(local_ac0._0_16_,0);
                auVar191 = vshufps_avx(ZEXT416((uint)(fVar244 + -5.0)),
                                       ZEXT416((uint)(fVar244 + -5.0)),0);
                auVar119 = ZEXT416((uint)(fVar217 * -3.0 + 2.0));
                auVar138 = vshufps_avx(auVar119,auVar119,0);
                auVar119 = vdpps_avx(auVar355,auVar355,0x7f);
                auVar140._0_4_ =
                     (float)local_920._0_4_ * auVar138._0_4_ +
                     (float)local_7e0._0_4_ * auVar191._0_4_ +
                     (float)local_7c0._0_4_ * auVar114._0_4_ +
                     (float)local_800._0_4_ * auVar139._0_4_;
                auVar140._4_4_ =
                     (float)local_920._4_4_ * auVar138._4_4_ +
                     (float)local_7e0._4_4_ * auVar191._4_4_ +
                     (float)local_7c0._4_4_ * auVar114._4_4_ +
                     (float)local_800._4_4_ * auVar139._4_4_;
                auVar140._8_4_ =
                     fStack_918 * auVar138._8_4_ +
                     fStack_7d8 * auVar191._8_4_ +
                     fStack_7b8 * auVar114._8_4_ + fStack_7f8 * auVar139._8_4_;
                auVar140._12_4_ =
                     fStack_914 * auVar138._12_4_ +
                     fStack_7d4 * auVar191._12_4_ +
                     fStack_7b4 * auVar114._12_4_ + fStack_7f4 * auVar139._12_4_;
                auVar191 = vblendps_avx(auVar119,_DAT_01f45a50,0xe);
                auVar138 = vrsqrtss_avx(auVar191,auVar191);
                fVar212 = auVar138._0_4_;
                fVar187 = auVar119._0_4_;
                auVar138 = vdpps_avx(auVar355,auVar140,0x7f);
                auVar139 = vshufps_avx(auVar119,auVar119,0);
                auVar141._0_4_ = auVar140._0_4_ * auVar139._0_4_;
                auVar141._4_4_ = auVar140._4_4_ * auVar139._4_4_;
                auVar141._8_4_ = auVar140._8_4_ * auVar139._8_4_;
                auVar141._12_4_ = auVar140._12_4_ * auVar139._12_4_;
                auVar138 = vshufps_avx(auVar138,auVar138,0);
                auVar223._0_4_ = auVar355._0_4_ * auVar138._0_4_;
                auVar223._4_4_ = auVar355._4_4_ * auVar138._4_4_;
                auVar223._8_4_ = auVar355._8_4_ * auVar138._8_4_;
                auVar223._12_4_ = auVar355._12_4_ * auVar138._12_4_;
                auVar114 = vsubps_avx(auVar141,auVar223);
                auVar138 = vrcpss_avx(auVar191,auVar191);
                auVar191 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                      ZEXT416((uint)(auVar345._0_4_ * (float)local_9c0._0_4_)));
                auVar138 = ZEXT416((uint)(auVar138._0_4_ * (2.0 - fVar187 * auVar138._0_4_)));
                auVar138 = vshufps_avx(auVar138,auVar138,0);
                uVar105 = CONCAT44(auVar355._4_4_,auVar355._0_4_);
                auVar250._0_8_ = uVar105 ^ 0x8000000080000000;
                auVar250._8_4_ = -auVar355._8_4_;
                auVar250._12_4_ = -auVar355._12_4_;
                auVar139 = ZEXT416((uint)(fVar212 * 1.5 +
                                         fVar187 * -0.5 * fVar212 * fVar212 * fVar212));
                auVar139 = vshufps_avx(auVar139,auVar139,0);
                auVar192._0_4_ = auVar139._0_4_ * auVar114._0_4_ * auVar138._0_4_;
                auVar192._4_4_ = auVar139._4_4_ * auVar114._4_4_ * auVar138._4_4_;
                auVar192._8_4_ = auVar139._8_4_ * auVar114._8_4_ * auVar138._8_4_;
                auVar192._12_4_ = auVar139._12_4_ * auVar114._12_4_ * auVar138._12_4_;
                auVar274._0_4_ = auVar355._0_4_ * auVar139._0_4_;
                auVar274._4_4_ = auVar355._4_4_ * auVar139._4_4_;
                auVar274._8_4_ = auVar355._8_4_ * auVar139._8_4_;
                auVar274._12_4_ = auVar355._12_4_ * auVar139._12_4_;
                local_ac0._0_4_ = auVar191._0_4_;
                if (fVar187 < 0.0) {
                  local_a40._0_16_ = auVar250;
                  local_8a0._0_16_ = auVar274;
                  local_a60._0_16_ = auVar192;
                  fVar212 = sqrtf(fVar187);
                  auVar192 = local_a60._0_16_;
                  auVar250 = local_a40._0_16_;
                  auVar274 = local_8a0._0_16_;
                  fVar187 = (float)local_ac0._0_4_;
                }
                else {
                  auVar119 = vsqrtss_avx(auVar119,auVar119);
                  fVar212 = auVar119._0_4_;
                  fVar187 = auVar191._0_4_;
                }
                auVar191 = vdpps_avx(_local_9e0,auVar274,0x7f);
                fVar212 = ((float)local_aa0._0_4_ / fVar212) * (fVar219 + 1.0) +
                          fVar187 + fVar219 * (float)local_aa0._0_4_;
                auVar119 = vdpps_avx(auVar250,auVar274,0x7f);
                auVar138 = vdpps_avx(_local_9e0,auVar192,0x7f);
                auVar98._4_4_ = fStack_81c;
                auVar98._0_4_ = local_820;
                auVar98._8_4_ = fStack_818;
                auVar98._12_4_ = aStack_814.a;
                auVar139 = vdpps_avx(auVar98,auVar274,0x7f);
                auVar114 = vdpps_avx(_local_9e0,auVar250,0x7f);
                fVar213 = auVar119._0_4_ + auVar138._0_4_;
                fVar214 = auVar191._0_4_;
                auVar120._0_4_ = fVar214 * fVar214;
                auVar120._4_4_ = auVar191._4_4_ * auVar191._4_4_;
                auVar120._8_4_ = auVar191._8_4_ * auVar191._8_4_;
                auVar120._12_4_ = auVar191._12_4_ * auVar191._12_4_;
                auVar138 = vsubps_avx(auVar222,auVar120);
                auVar119 = vdpps_avx(_local_9e0,auVar98,0x7f);
                fVar215 = auVar114._0_4_ - fVar214 * fVar213;
                fVar217 = auVar119._0_4_ - fVar214 * auVar139._0_4_;
                auVar119 = vrsqrtss_avx(auVar138,auVar138);
                fVar219 = auVar138._0_4_;
                fVar214 = auVar119._0_4_;
                fVar214 = fVar214 * 1.5 + fVar219 * -0.5 * fVar214 * fVar214 * fVar214;
                if (fVar219 < 0.0) {
                  local_a40._0_16_ = auVar191;
                  local_8a0._0_4_ = fVar212;
                  local_a60._0_16_ = auVar139;
                  local_8c0._0_4_ = fVar215;
                  local_8e0._0_4_ = fVar217;
                  local_900._0_4_ = fVar214;
                  fVar219 = sqrtf(fVar219);
                  fVar212 = (float)local_8a0._0_4_;
                  fVar214 = (float)local_900._0_4_;
                  fVar215 = (float)local_8c0._0_4_;
                  fVar217 = (float)local_8e0._0_4_;
                  auVar139 = local_a60._0_16_;
                  auVar191 = local_a40._0_16_;
                  fVar187 = (float)local_ac0._0_4_;
                }
                else {
                  auVar119 = vsqrtss_avx(auVar138,auVar138);
                  fVar219 = auVar119._0_4_;
                }
                auVar364 = ZEXT3264(_local_a80);
                auVar305 = ZEXT3264(CONCAT428(fStack_944,
                                              CONCAT424(fStack_948,
                                                        CONCAT420(fStack_94c,
                                                                  CONCAT416(fStack_950,
                                                                            CONCAT412(fStack_954,
                                                                                      CONCAT48(
                                                  fStack_958,CONCAT44(fStack_95c,local_960))))))));
                auVar114 = vpermilps_avx(local_840._0_16_,0xff);
                auVar28 = vshufps_avx(auVar355,auVar355,0xff);
                fVar215 = fVar215 * fVar214 - auVar28._0_4_;
                auVar224._0_8_ = auVar139._0_8_ ^ 0x8000000080000000;
                auVar224._8_4_ = auVar139._8_4_ ^ 0x80000000;
                auVar224._12_4_ = auVar139._12_4_ ^ 0x80000000;
                auVar251._0_4_ = -fVar215;
                auVar251._4_4_ = 0x80000000;
                auVar251._8_4_ = 0x80000000;
                auVar251._12_4_ = 0x80000000;
                auVar119 = vinsertps_avx(auVar251,ZEXT416((uint)(fVar217 * fVar214)),0x1c);
                auVar139 = vmovsldup_avx(ZEXT416((uint)(fVar213 * fVar217 * fVar214 -
                                                       auVar139._0_4_ * fVar215)));
                auVar119 = vdivps_avx(auVar119,auVar139);
                auVar138 = vinsertps_avx(ZEXT416((uint)fVar213),auVar224,0x10);
                auVar138 = vdivps_avx(auVar138,auVar139);
                auVar139 = vmovsldup_avx(auVar191);
                auVar121 = ZEXT416((uint)(fVar219 - auVar114._0_4_));
                auVar114 = vmovsldup_avx(auVar121);
                auVar174._0_4_ = auVar139._0_4_ * auVar119._0_4_ + auVar114._0_4_ * auVar138._0_4_;
                auVar174._4_4_ = auVar139._4_4_ * auVar119._4_4_ + auVar114._4_4_ * auVar138._4_4_;
                auVar174._8_4_ = auVar139._8_4_ * auVar119._8_4_ + auVar114._8_4_ * auVar138._8_4_;
                auVar174._12_4_ =
                     auVar139._12_4_ * auVar119._12_4_ + auVar114._12_4_ * auVar138._12_4_;
                auVar119 = vsubps_avx(auVar194,auVar174);
                auVar345 = ZEXT1664(auVar119);
                auVar175._8_4_ = 0x7fffffff;
                auVar175._0_8_ = 0x7fffffff7fffffff;
                auVar175._12_4_ = 0x7fffffff;
                auVar194 = vandps_avx(auVar191,auVar175);
              } while (fVar212 <= auVar194._0_4_);
              auVar193._8_4_ = 0x7fffffff;
              auVar193._0_8_ = 0x7fffffff7fffffff;
              auVar193._12_4_ = 0x7fffffff;
              auVar194 = vandps_avx(auVar121,auVar193);
            } while ((float)local_6e0._0_4_ * 1.9073486e-06 + fVar187 + fVar212 <= auVar194._0_4_);
            fVar187 = auVar119._0_4_ + (float)local_7a0._0_4_;
            auVar159 = _local_a80;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar187) &&
               (fVar212 = (ray->super_RayK<1>).tfar, fVar187 <= fVar212)) {
              auVar194 = vmovshdup_avx(auVar119);
              fVar213 = auVar194._0_4_;
              if ((0.0 <= fVar213) && (fVar213 <= 1.0)) {
                auVar194 = vrsqrtss_avx(auVar222,auVar222);
                fVar214 = auVar194._0_4_;
                pGVar20 = (context->scene->geometries).items[uVar107].ptr;
                if ((pGVar20->mask & (ray->super_RayK<1>).mask) != 0) {
                  auVar194 = ZEXT416((uint)(fVar214 * 1.5 +
                                           fVar216 * -0.5 * fVar214 * fVar214 * fVar214));
                  auVar194 = vshufps_avx(auVar194,auVar194,0);
                  auVar195._0_4_ = auVar194._0_4_ * (float)local_9e0._0_4_;
                  auVar195._4_4_ = auVar194._4_4_ * (float)local_9e0._4_4_;
                  auVar195._8_4_ = auVar194._8_4_ * fStack_9d8;
                  auVar195._12_4_ = auVar194._12_4_ * fStack_9d4;
                  auVar142._0_4_ = auVar355._0_4_ + auVar28._0_4_ * auVar195._0_4_;
                  auVar142._4_4_ = auVar355._4_4_ + auVar28._4_4_ * auVar195._4_4_;
                  auVar142._8_4_ = auVar355._8_4_ + auVar28._8_4_ * auVar195._8_4_;
                  auVar142._12_4_ = auVar355._12_4_ + auVar28._12_4_ * auVar195._12_4_;
                  auVar194 = vshufps_avx(auVar195,auVar195,0xc9);
                  auVar222 = vshufps_avx(auVar355,auVar355,0xc9);
                  auVar196._0_4_ = auVar222._0_4_ * auVar195._0_4_;
                  auVar196._4_4_ = auVar222._4_4_ * auVar195._4_4_;
                  auVar196._8_4_ = auVar222._8_4_ * auVar195._8_4_;
                  auVar196._12_4_ = auVar222._12_4_ * auVar195._12_4_;
                  auVar225._0_4_ = auVar355._0_4_ * auVar194._0_4_;
                  auVar225._4_4_ = auVar355._4_4_ * auVar194._4_4_;
                  auVar225._8_4_ = auVar355._8_4_ * auVar194._8_4_;
                  auVar225._12_4_ = auVar355._12_4_ * auVar194._12_4_;
                  auVar191 = vsubps_avx(auVar225,auVar196);
                  auVar194 = vshufps_avx(auVar191,auVar191,0xc9);
                  auVar222 = vshufps_avx(auVar142,auVar142,0xc9);
                  auVar226._0_4_ = auVar222._0_4_ * auVar194._0_4_;
                  auVar226._4_4_ = auVar222._4_4_ * auVar194._4_4_;
                  auVar226._8_4_ = auVar222._8_4_ * auVar194._8_4_;
                  auVar226._12_4_ = auVar222._12_4_ * auVar194._12_4_;
                  auVar194 = vshufps_avx(auVar191,auVar191,0xd2);
                  auVar143._0_4_ = auVar142._0_4_ * auVar194._0_4_;
                  auVar143._4_4_ = auVar142._4_4_ * auVar194._4_4_;
                  auVar143._8_4_ = auVar142._8_4_ * auVar194._8_4_;
                  auVar143._12_4_ = auVar142._12_4_ * auVar194._12_4_;
                  auVar222 = vsubps_avx(auVar226,auVar143);
                  auVar194 = vshufps_avx(auVar222,auVar222,0xe9);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    (ray->super_RayK<1>).tfar = fVar187;
                    uVar8 = vmovlps_avx(auVar194);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar8;
                    (ray->Ng).field_0.field_0.z = auVar222._0_4_;
                    ray->u = fVar213;
                    ray->v = 0.0;
                    ray->primID = local_880._0_4_;
                    ray->geomID = uVar107;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_990 = vmovlps_avx(auVar194);
                    local_988 = auVar222._0_4_;
                    local_984 = fVar213;
                    local_980 = 0;
                    local_97c = local_880._0_4_;
                    local_978 = uVar107;
                    local_974 = context->user->instID[0];
                    local_970 = context->user->instPrimID[0];
                    (ray->super_RayK<1>).tfar = fVar187;
                    local_6a0._0_4_ = 0xffffffff;
                    local_af8.valid = (int *)local_6a0;
                    local_af8.geometryUserPtr = pGVar20->userPtr;
                    local_af8.context = context->user;
                    local_af8.hit = (RTCHitN *)&local_990;
                    local_af8.N = 1;
                    local_af8.ray = (RTCRayN *)ray;
                    if (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b2e2d3:
                      p_Var24 = context->args->filter;
                      if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar345 = ZEXT1664(auVar345._0_16_);
                        (*p_Var24)(&local_af8);
                        auVar305 = ZEXT3264(CONCAT428(fStack_944,
                                                      CONCAT424(fStack_948,
                                                                CONCAT420(fStack_94c,
                                                                          CONCAT416(fStack_950,
                                                                                    CONCAT412(
                                                  fStack_954,
                                                  CONCAT48(fStack_958,CONCAT44(fStack_95c,local_960)
                                                          )))))));
                        if (*local_af8.valid == 0) goto LAB_00b2e37c;
                      }
                      (((Vec3f *)((long)local_af8.ray + 0x30))->field_0).components[0] =
                           *(float *)local_af8.hit;
                      (((Vec3f *)((long)local_af8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_af8.hit + 4);
                      (((Vec3f *)((long)local_af8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_af8.hit + 8);
                      *(float *)((long)local_af8.ray + 0x3c) = *(float *)(local_af8.hit + 0xc);
                      *(float *)((long)local_af8.ray + 0x40) = *(float *)(local_af8.hit + 0x10);
                      *(float *)((long)local_af8.ray + 0x44) = *(float *)(local_af8.hit + 0x14);
                      *(float *)((long)local_af8.ray + 0x48) = *(float *)(local_af8.hit + 0x18);
                      *(float *)((long)local_af8.ray + 0x4c) = *(float *)(local_af8.hit + 0x1c);
                      *(float *)((long)local_af8.ray + 0x50) = *(float *)(local_af8.hit + 0x20);
                      auVar159 = _local_a80;
                    }
                    else {
                      auVar345 = ZEXT1664(auVar119);
                      (*pGVar20->intersectionFilterN)(&local_af8);
                      auVar305 = ZEXT3264(CONCAT428(fStack_944,
                                                    CONCAT424(fStack_948,
                                                              CONCAT420(fStack_94c,
                                                                        CONCAT416(fStack_950,
                                                                                  CONCAT412(
                                                  fStack_954,
                                                  CONCAT48(fStack_958,CONCAT44(fStack_95c,local_960)
                                                          )))))));
                      if (*local_af8.valid != 0) goto LAB_00b2e2d3;
LAB_00b2e37c:
                      (ray->super_RayK<1>).tfar = fVar212;
                      auVar159 = _local_a80;
                    }
                  }
                }
              }
            }
LAB_00b2e1aa:
            fVar187 = (ray->super_RayK<1>).tfar;
            auVar133._4_4_ = fVar187;
            auVar133._0_4_ = fVar187;
            auVar133._8_4_ = fVar187;
            auVar133._12_4_ = fVar187;
            auVar133._16_4_ = fVar187;
            auVar133._20_4_ = fVar187;
            auVar133._24_4_ = fVar187;
            auVar133._28_4_ = fVar187;
            auVar148 = vcmpps_avx(_local_740,auVar133,2);
            auVar148 = vandps_avx(auVar148,local_3c0);
            auVar303 = auVar305._0_32_;
          }
          auVar424 = ZEXT3264(auVar159);
          auVar163._0_4_ = (float)local_860._0_4_ + (float)local_720._0_4_;
          auVar163._4_4_ = (float)local_860._4_4_ + (float)local_720._4_4_;
          auVar163._8_4_ = fStack_858 + fStack_718;
          auVar163._12_4_ = fStack_854 + fStack_714;
          auVar163._16_4_ = fStack_850 + fStack_710;
          auVar163._20_4_ = fStack_84c + fStack_70c;
          auVar163._24_4_ = fStack_848 + fStack_708;
          auVar163._28_4_ = fStack_844 + fStack_704;
          auVar148 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
          fVar187 = (ray->super_RayK<1>).tfar;
          auVar183._4_4_ = fVar187;
          auVar183._0_4_ = fVar187;
          auVar183._8_4_ = fVar187;
          auVar183._12_4_ = fVar187;
          auVar183._16_4_ = fVar187;
          auVar183._20_4_ = fVar187;
          auVar183._24_4_ = fVar187;
          auVar183._28_4_ = fVar187;
          auVar159 = vcmpps_avx(auVar163,auVar183,2);
          _local_740 = vandps_avx(auVar159,_local_760);
          auVar164._8_4_ = 3;
          auVar164._0_8_ = 0x300000003;
          auVar164._12_4_ = 3;
          auVar164._16_4_ = 3;
          auVar164._20_4_ = 3;
          auVar164._24_4_ = 3;
          auVar164._28_4_ = 3;
          auVar184._8_4_ = 2;
          auVar184._0_8_ = 0x200000002;
          auVar184._12_4_ = 2;
          auVar184._16_4_ = 2;
          auVar184._20_4_ = 2;
          auVar184._24_4_ = 2;
          auVar184._28_4_ = 2;
          auVar159 = vblendvps_avx(auVar184,auVar164,local_640);
          auVar194 = vpcmpgtd_avx(auVar159._16_16_,local_680._0_16_);
          auVar222 = vpshufd_avx(local_660._0_16_,0);
          auVar222 = vpcmpgtd_avx(auVar159._0_16_,auVar222);
          auVar185._16_16_ = auVar194;
          auVar185._0_16_ = auVar148._0_16_;
          _local_760 = vblendps_avx(ZEXT1632(auVar222),auVar185,0xf0);
          auVar159 = vandnps_avx(_local_760,_local_740);
          local_780 = _local_5c0;
          local_720._4_4_ = (float)local_860._4_4_ + (float)local_5c0._4_4_;
          local_720._0_4_ = (float)local_860._0_4_ + (float)local_5c0._0_4_;
          fStack_718 = fStack_858 + fStack_5b8;
          fStack_714 = fStack_854 + fStack_5b4;
          fStack_710 = fStack_850 + fStack_5b0;
          fStack_70c = fStack_84c + fStack_5ac;
          fStack_708 = fStack_848 + fStack_5a8;
          fStack_704 = fStack_844 + fStack_5a4;
          auVar394 = ZEXT3264(_local_940);
          auVar377 = ZEXT3264(_local_a00);
          auVar364 = ZEXT3264(_local_a20);
          fVar187 = (float)local_860._0_4_;
          fVar390 = (float)local_860._4_4_;
          fVar395 = fStack_858;
          fVar396 = fStack_854;
          fVar397 = fStack_850;
          fVar398 = fStack_84c;
          fVar399 = fStack_848;
          fVar271 = fStack_844;
          while( true ) {
            local_6a0 = auVar159;
            if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar159 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar159 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar159 >> 0x7f,0) == '\0') &&
                  (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar159 >> 0xbf,0) == '\0') &&
                (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar159[0x1f]) break;
            auVar134._8_4_ = 0x7f800000;
            auVar134._0_8_ = 0x7f8000007f800000;
            auVar134._12_4_ = 0x7f800000;
            auVar134._16_4_ = 0x7f800000;
            auVar134._20_4_ = 0x7f800000;
            auVar134._24_4_ = 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar148 = vblendvps_avx(auVar134,local_780,auVar159);
            auVar25 = vshufps_avx(auVar148,auVar148,0xb1);
            auVar25 = vminps_avx(auVar148,auVar25);
            auVar342 = vshufpd_avx(auVar25,auVar25,5);
            auVar25 = vminps_avx(auVar25,auVar342);
            auVar342 = vperm2f128_avx(auVar25,auVar25,1);
            auVar25 = vminps_avx(auVar25,auVar342);
            auVar148 = vcmpps_avx(auVar148,auVar25,0);
            auVar25 = auVar159 & auVar148;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar159 = vandps_avx(auVar148,auVar159);
            }
            uVar103 = vmovmskps_avx(auVar159);
            uVar108 = 0;
            if (uVar103 != 0) {
              for (; (uVar103 >> uVar108 & 1) == 0; uVar108 = uVar108 + 1) {
              }
            }
            uVar105 = (ulong)uVar108;
            *(undefined4 *)(local_6a0 + uVar105 * 4) = 0;
            aVar9 = (ray->super_RayK<1>).dir.field_0.field_1;
            local_820 = aVar9.x;
            fStack_81c = aVar9.y;
            fStack_818 = aVar9.z;
            aStack_814 = aVar9.field_3;
            auVar194 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
            fVar187 = local_1c0[uVar105];
            uVar108 = *(uint *)(local_5a0 + uVar105 * 4);
            if (auVar194._0_4_ < 0.0) {
              auVar305 = ZEXT1664(auVar305._0_16_);
              fVar212 = sqrtf(auVar194._0_4_);
              auVar364 = ZEXT3264(_local_a20);
              auVar377 = ZEXT3264(_local_a00);
              auVar394 = ZEXT3264(_local_940);
              auVar424 = ZEXT3264(_local_a80);
            }
            else {
              auVar194 = vsqrtss_avx(auVar194,auVar194);
              fVar212 = auVar194._0_4_;
            }
            auVar222 = vminps_avx(_local_920,_local_7e0);
            auVar194 = vmaxps_avx(_local_920,_local_7e0);
            auVar191 = vminps_avx(_local_7c0,_local_800);
            auVar119 = vminps_avx(auVar222,auVar191);
            auVar222 = vmaxps_avx(_local_7c0,_local_800);
            auVar191 = vmaxps_avx(auVar194,auVar222);
            auVar197._8_4_ = 0x7fffffff;
            auVar197._0_8_ = 0x7fffffff7fffffff;
            auVar197._12_4_ = 0x7fffffff;
            auVar194 = vandps_avx(auVar119,auVar197);
            auVar222 = vandps_avx(auVar191,auVar197);
            auVar194 = vmaxps_avx(auVar194,auVar222);
            auVar222 = vmovshdup_avx(auVar194);
            auVar222 = vmaxss_avx(auVar222,auVar194);
            auVar194 = vshufpd_avx(auVar194,auVar194,1);
            auVar194 = vmaxss_avx(auVar194,auVar222);
            local_aa0._0_4_ = auVar194._0_4_ * 1.9073486e-06;
            local_8a0._0_4_ = fVar212 * 1.9073486e-06;
            local_6e0._0_16_ = vshufps_avx(auVar191,auVar191,0xff);
            auVar194 = vinsertps_avx(ZEXT416(uVar108),ZEXT416((uint)fVar187),0x10);
            auVar345 = ZEXT1664(auVar194);
            lVar112 = 5;
            do {
              do {
                auVar194 = auVar345._0_16_;
                bVar113 = lVar112 == 0;
                lVar112 = lVar112 + -1;
                if (bVar113) goto LAB_00b2ed5a;
                auVar222 = vshufps_avx(auVar194,auVar194,0);
                auVar122._0_4_ = auVar222._0_4_ * local_820 + 0.0;
                auVar122._4_4_ = auVar222._4_4_ * fStack_81c + 0.0;
                auVar122._8_4_ = auVar222._8_4_ * fStack_818 + 0.0;
                auVar122._12_4_ = auVar222._12_4_ * aStack_814.w + 0.0;
                auVar222 = vmovshdup_avx(auVar194);
                fVar217 = auVar222._0_4_;
                local_a40._0_4_ = 1.0 - fVar217;
                fVar212 = fVar217 * fVar217;
                fVar213 = fVar217 * 3.0;
                fVar187 = fVar213 + -5.0;
                fVar214 = (float)local_a40._0_4_ * (float)local_a40._0_4_;
                auVar222 = ZEXT416((uint)(fVar217 * fVar217 * -(float)local_a40._0_4_ * 0.5));
                auVar222 = vshufps_avx(auVar222,auVar222,0);
                auVar191 = ZEXT416((uint)((fVar214 * ((float)local_a40._0_4_ * 3.0 + -5.0) + 2.0) *
                                         0.5));
                auVar191 = vshufps_avx(auVar191,auVar191,0);
                auVar119 = ZEXT416((uint)((fVar212 * fVar187 + 2.0) * 0.5));
                auVar119 = vshufps_avx(auVar119,auVar119,0);
                auVar138 = ZEXT416((uint)((float)local_a40._0_4_ * (float)local_a40._0_4_ * -fVar217
                                         * 0.5));
                auVar138 = vshufps_avx(auVar138,auVar138,0);
                auVar176._0_4_ =
                     auVar138._0_4_ * (float)local_920._0_4_ +
                     auVar119._0_4_ * (float)local_7e0._0_4_ +
                     auVar191._0_4_ * (float)local_7c0._0_4_ +
                     auVar222._0_4_ * (float)local_800._0_4_;
                auVar176._4_4_ =
                     auVar138._4_4_ * (float)local_920._4_4_ +
                     auVar119._4_4_ * (float)local_7e0._4_4_ +
                     auVar191._4_4_ * (float)local_7c0._4_4_ +
                     auVar222._4_4_ * (float)local_800._4_4_;
                auVar176._8_4_ =
                     auVar138._8_4_ * fStack_918 +
                     auVar119._8_4_ * fStack_7d8 +
                     auVar191._8_4_ * fStack_7b8 + auVar222._8_4_ * fStack_7f8;
                auVar176._12_4_ =
                     auVar138._12_4_ * fStack_914 +
                     auVar119._12_4_ * fStack_7d4 +
                     auVar191._12_4_ * fStack_7b4 + auVar222._12_4_ * fStack_7f4;
                fVar215 = (float)local_a40._0_4_ * -2.0;
                local_840._0_16_ = auVar176;
                auVar222 = vsubps_avx(auVar122,auVar176);
                _local_9e0 = auVar222;
                auVar222 = vdpps_avx(auVar222,auVar222,0x7f);
                local_ac0._0_16_ = ZEXT416((uint)(fVar213 + -1.0));
                fVar216 = auVar222._0_4_;
                if (fVar216 < 0.0) {
                  local_9c0._0_4_ = fVar212;
                  local_a40._0_16_ = ZEXT416((uint)local_a40._0_4_);
                  local_a60._0_4_ = fVar213;
                  local_8c0._0_4_ = fVar217 * 9.0;
                  local_8e0._0_4_ = fVar187;
                  local_900._0_4_ = fVar214;
                  local_6c0._0_4_ = fVar215;
                  fVar219 = sqrtf(fVar216);
                  fVar242 = (float)local_8c0._0_4_;
                  fVar215 = (float)local_6c0._0_4_;
                  fVar212 = (float)local_9c0._0_4_;
                  fVar213 = (float)local_a60._0_4_;
                  fVar187 = (float)local_8e0._0_4_;
                  fVar214 = (float)local_900._0_4_;
                }
                else {
                  auVar191 = vsqrtss_avx(auVar222,auVar222);
                  fVar219 = auVar191._0_4_;
                  fVar242 = fVar217 * 9.0;
                }
                auVar191 = ZEXT416((uint)((fVar212 + fVar217 * fVar215) * 0.5));
                auVar191 = vshufps_avx(auVar191,auVar191,0);
                auVar119 = ZEXT416((uint)((((float)local_a40._0_4_ + (float)local_a40._0_4_) *
                                           (fVar213 + 2.0) +
                                          (float)local_a40._0_4_ * (float)local_a40._0_4_ * -3.0) *
                                         0.5));
                auVar119 = vshufps_avx(auVar119,auVar119,0);
                auVar138 = ZEXT416((uint)((fVar187 * (fVar217 + fVar217) + fVar217 * fVar213) * 0.5)
                                  );
                auVar138 = vshufps_avx(auVar138,auVar138,0);
                auVar139 = ZEXT416((uint)((fVar217 * ((float)local_a40._0_4_ +
                                                     (float)local_a40._0_4_) - fVar214) * 0.5));
                auVar139 = vshufps_avx(auVar139,auVar139,0);
                auVar356._0_4_ =
                     (float)local_920._0_4_ * auVar139._0_4_ +
                     (float)local_7e0._0_4_ * auVar138._0_4_ +
                     (float)local_800._0_4_ * auVar191._0_4_ +
                     (float)local_7c0._0_4_ * auVar119._0_4_;
                auVar356._4_4_ =
                     (float)local_920._4_4_ * auVar139._4_4_ +
                     (float)local_7e0._4_4_ * auVar138._4_4_ +
                     (float)local_800._4_4_ * auVar191._4_4_ +
                     (float)local_7c0._4_4_ * auVar119._4_4_;
                auVar356._8_4_ =
                     fStack_918 * auVar139._8_4_ +
                     fStack_7d8 * auVar138._8_4_ +
                     fStack_7f8 * auVar191._8_4_ + fStack_7b8 * auVar119._8_4_;
                auVar356._12_4_ =
                     fStack_914 * auVar139._12_4_ +
                     fStack_7d4 * auVar138._12_4_ +
                     fStack_7f4 * auVar191._12_4_ + fStack_7b4 * auVar119._12_4_;
                auVar139 = vpermilps_avx(local_ac0._0_16_,0);
                auVar114 = vpermilps_avx(ZEXT416((uint)(fVar217 * -9.0 + 4.0)),0);
                auVar191 = vshufps_avx(ZEXT416((uint)(fVar242 + -5.0)),
                                       ZEXT416((uint)(fVar242 + -5.0)),0);
                auVar119 = ZEXT416((uint)(fVar217 * -3.0 + 2.0));
                auVar138 = vshufps_avx(auVar119,auVar119,0);
                auVar119 = vdpps_avx(auVar356,auVar356,0x7f);
                auVar144._0_4_ =
                     (float)local_920._0_4_ * auVar138._0_4_ +
                     (float)local_7e0._0_4_ * auVar191._0_4_ +
                     (float)local_7c0._0_4_ * auVar114._0_4_ +
                     (float)local_800._0_4_ * auVar139._0_4_;
                auVar144._4_4_ =
                     (float)local_920._4_4_ * auVar138._4_4_ +
                     (float)local_7e0._4_4_ * auVar191._4_4_ +
                     (float)local_7c0._4_4_ * auVar114._4_4_ +
                     (float)local_800._4_4_ * auVar139._4_4_;
                auVar144._8_4_ =
                     fStack_918 * auVar138._8_4_ +
                     fStack_7d8 * auVar191._8_4_ +
                     fStack_7b8 * auVar114._8_4_ + fStack_7f8 * auVar139._8_4_;
                auVar144._12_4_ =
                     fStack_914 * auVar138._12_4_ +
                     fStack_7d4 * auVar191._12_4_ +
                     fStack_7b4 * auVar114._12_4_ + fStack_7f4 * auVar139._12_4_;
                auVar191 = vblendps_avx(auVar119,_DAT_01f45a50,0xe);
                auVar138 = vrsqrtss_avx(auVar191,auVar191);
                fVar212 = auVar138._0_4_;
                fVar187 = auVar119._0_4_;
                auVar138 = vdpps_avx(auVar356,auVar144,0x7f);
                auVar139 = vshufps_avx(auVar119,auVar119,0);
                auVar145._0_4_ = auVar144._0_4_ * auVar139._0_4_;
                auVar145._4_4_ = auVar144._4_4_ * auVar139._4_4_;
                auVar145._8_4_ = auVar144._8_4_ * auVar139._8_4_;
                auVar145._12_4_ = auVar144._12_4_ * auVar139._12_4_;
                auVar138 = vshufps_avx(auVar138,auVar138,0);
                auVar227._0_4_ = auVar356._0_4_ * auVar138._0_4_;
                auVar227._4_4_ = auVar356._4_4_ * auVar138._4_4_;
                auVar227._8_4_ = auVar356._8_4_ * auVar138._8_4_;
                auVar227._12_4_ = auVar356._12_4_ * auVar138._12_4_;
                auVar114 = vsubps_avx(auVar145,auVar227);
                auVar138 = vrcpss_avx(auVar191,auVar191);
                auVar191 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                      ZEXT416((uint)(auVar345._0_4_ * (float)local_8a0._0_4_)));
                auVar138 = ZEXT416((uint)(auVar138._0_4_ * (2.0 - fVar187 * auVar138._0_4_)));
                auVar138 = vshufps_avx(auVar138,auVar138,0);
                uVar105 = CONCAT44(auVar356._4_4_,auVar356._0_4_);
                auVar295._0_8_ = uVar105 ^ 0x8000000080000000;
                auVar295._8_4_ = -auVar356._8_4_;
                auVar295._12_4_ = -auVar356._12_4_;
                auVar139 = ZEXT416((uint)(fVar212 * 1.5 +
                                         fVar187 * -0.5 * fVar212 * fVar212 * fVar212));
                auVar139 = vshufps_avx(auVar139,auVar139,0);
                auVar198._0_4_ = auVar139._0_4_ * auVar114._0_4_ * auVar138._0_4_;
                auVar198._4_4_ = auVar139._4_4_ * auVar114._4_4_ * auVar138._4_4_;
                auVar198._8_4_ = auVar139._8_4_ * auVar114._8_4_ * auVar138._8_4_;
                auVar198._12_4_ = auVar139._12_4_ * auVar114._12_4_ * auVar138._12_4_;
                local_a40._0_4_ = auVar356._0_4_ * auVar139._0_4_;
                local_a40._4_4_ = auVar356._4_4_ * auVar139._4_4_;
                local_a40._8_4_ = auVar356._8_4_ * auVar139._8_4_;
                local_a40._12_4_ = auVar356._12_4_ * auVar139._12_4_;
                local_ac0._0_4_ = auVar191._0_4_;
                if (fVar187 < 0.0) {
                  local_9c0._0_16_ = auVar295;
                  local_a60._0_16_ = auVar198;
                  fVar212 = sqrtf(fVar187);
                  auVar198 = local_a60._0_16_;
                  auVar295 = local_9c0._0_16_;
                  fVar187 = (float)local_ac0._0_4_;
                }
                else {
                  auVar119 = vsqrtss_avx(auVar119,auVar119);
                  fVar212 = auVar119._0_4_;
                  fVar187 = auVar191._0_4_;
                }
                auVar305 = ZEXT1664(auVar295);
                auVar191 = vdpps_avx(_local_9e0,local_a40._0_16_,0x7f);
                local_9c0._0_4_ =
                     ((float)local_aa0._0_4_ / fVar212) * (fVar219 + 1.0) +
                     fVar219 * (float)local_aa0._0_4_ + fVar187;
                auVar119 = vdpps_avx(auVar295,local_a40._0_16_,0x7f);
                auVar138 = vdpps_avx(_local_9e0,auVar198,0x7f);
                auVar99._4_4_ = fStack_81c;
                auVar99._0_4_ = local_820;
                auVar99._8_4_ = fStack_818;
                auVar99._12_4_ = aStack_814.a;
                auVar139 = vdpps_avx(auVar99,local_a40._0_16_,0x7f);
                auVar114 = vdpps_avx(_local_9e0,auVar295,0x7f);
                fVar187 = auVar119._0_4_ + auVar138._0_4_;
                fVar212 = auVar191._0_4_;
                auVar123._0_4_ = fVar212 * fVar212;
                auVar123._4_4_ = auVar191._4_4_ * auVar191._4_4_;
                auVar123._8_4_ = auVar191._8_4_ * auVar191._8_4_;
                auVar123._12_4_ = auVar191._12_4_ * auVar191._12_4_;
                auVar138 = vsubps_avx(auVar222,auVar123);
                local_a40._0_16_ = ZEXT416((uint)fVar187);
                auVar119 = vdpps_avx(_local_9e0,auVar99,0x7f);
                fVar213 = auVar114._0_4_ - fVar212 * fVar187;
                fVar212 = auVar119._0_4_ - fVar212 * auVar139._0_4_;
                auVar119 = vrsqrtss_avx(auVar138,auVar138);
                fVar214 = auVar138._0_4_;
                fVar187 = auVar119._0_4_;
                fVar187 = fVar187 * 1.5 + fVar214 * -0.5 * fVar187 * fVar187 * fVar187;
                if (fVar214 < 0.0) {
                  local_a60._0_16_ = auVar139;
                  local_8c0._0_4_ = fVar213;
                  local_8e0._0_4_ = fVar212;
                  local_900._0_4_ = fVar187;
                  auVar305 = ZEXT1664(auVar295);
                  fVar214 = sqrtf(fVar214);
                  fVar187 = (float)local_900._0_4_;
                  fVar213 = (float)local_8c0._0_4_;
                  fVar212 = (float)local_8e0._0_4_;
                  auVar139 = local_a60._0_16_;
                }
                else {
                  auVar119 = vsqrtss_avx(auVar138,auVar138);
                  fVar214 = auVar119._0_4_;
                }
                auVar424 = ZEXT3264(_local_a80);
                auVar394 = ZEXT3264(_local_940);
                auVar377 = ZEXT3264(_local_a00);
                auVar364 = ZEXT3264(_local_a20);
                auVar114 = vpermilps_avx(local_840._0_16_,0xff);
                auVar28 = vpermilps_avx(auVar356,0xff);
                fVar213 = fVar213 * fVar187 - auVar28._0_4_;
                auVar228._0_8_ = auVar139._0_8_ ^ 0x8000000080000000;
                auVar228._8_4_ = auVar139._8_4_ ^ 0x80000000;
                auVar228._12_4_ = auVar139._12_4_ ^ 0x80000000;
                auVar252._0_4_ = -fVar213;
                auVar252._4_4_ = 0x80000000;
                auVar252._8_4_ = 0x80000000;
                auVar252._12_4_ = 0x80000000;
                auVar119 = vinsertps_avx(auVar252,ZEXT416((uint)(fVar212 * fVar187)),0x1c);
                auVar139 = vmovsldup_avx(ZEXT416((uint)(local_a40._0_4_ * fVar212 * fVar187 -
                                                       auVar139._0_4_ * fVar213)));
                auVar119 = vdivps_avx(auVar119,auVar139);
                auVar138 = vinsertps_avx(local_a40._0_16_,auVar228,0x10);
                auVar138 = vdivps_avx(auVar138,auVar139);
                auVar139 = vmovsldup_avx(auVar191);
                auVar121 = ZEXT416((uint)(fVar214 - auVar114._0_4_));
                auVar114 = vmovsldup_avx(auVar121);
                auVar177._0_4_ = auVar139._0_4_ * auVar119._0_4_ + auVar114._0_4_ * auVar138._0_4_;
                auVar177._4_4_ = auVar139._4_4_ * auVar119._4_4_ + auVar114._4_4_ * auVar138._4_4_;
                auVar177._8_4_ = auVar139._8_4_ * auVar119._8_4_ + auVar114._8_4_ * auVar138._8_4_;
                auVar177._12_4_ =
                     auVar139._12_4_ * auVar119._12_4_ + auVar114._12_4_ * auVar138._12_4_;
                auVar119 = vsubps_avx(auVar194,auVar177);
                auVar345 = ZEXT1664(auVar119);
                auVar178._8_4_ = 0x7fffffff;
                auVar178._0_8_ = 0x7fffffff7fffffff;
                auVar178._12_4_ = 0x7fffffff;
                auVar194 = vandps_avx(auVar191,auVar178);
              } while ((float)local_9c0._0_4_ <= auVar194._0_4_);
              auVar199._8_4_ = 0x7fffffff;
              auVar199._0_8_ = 0x7fffffff7fffffff;
              auVar199._12_4_ = 0x7fffffff;
              auVar194 = vandps_avx(auVar121,auVar199);
            } while ((float)local_6e0._0_4_ * 1.9073486e-06 +
                     (float)local_9c0._0_4_ + (float)local_ac0._0_4_ <= auVar194._0_4_);
            fVar187 = auVar119._0_4_ + (float)local_7a0._0_4_;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar187) &&
               (fVar212 = (ray->super_RayK<1>).tfar, fVar187 <= fVar212)) {
              auVar194 = vmovshdup_avx(auVar119);
              fVar213 = auVar194._0_4_;
              if ((0.0 <= fVar213) && (fVar213 <= 1.0)) {
                auVar194 = vrsqrtss_avx(auVar222,auVar222);
                fVar214 = auVar194._0_4_;
                pGVar20 = (context->scene->geometries).items[uVar107].ptr;
                if ((pGVar20->mask & (ray->super_RayK<1>).mask) != 0) {
                  auVar194 = ZEXT416((uint)(fVar214 * 1.5 +
                                           fVar216 * -0.5 * fVar214 * fVar214 * fVar214));
                  auVar194 = vshufps_avx(auVar194,auVar194,0);
                  auVar200._0_4_ = auVar194._0_4_ * (float)local_9e0._0_4_;
                  auVar200._4_4_ = auVar194._4_4_ * (float)local_9e0._4_4_;
                  auVar200._8_4_ = auVar194._8_4_ * fStack_9d8;
                  auVar200._12_4_ = auVar194._12_4_ * fStack_9d4;
                  auVar146._0_4_ = auVar356._0_4_ + auVar28._0_4_ * auVar200._0_4_;
                  auVar146._4_4_ = auVar356._4_4_ + auVar28._4_4_ * auVar200._4_4_;
                  auVar146._8_4_ = auVar356._8_4_ + auVar28._8_4_ * auVar200._8_4_;
                  auVar146._12_4_ = auVar356._12_4_ + auVar28._12_4_ * auVar200._12_4_;
                  auVar194 = vshufps_avx(auVar200,auVar200,0xc9);
                  auVar222 = vshufps_avx(auVar356,auVar356,0xc9);
                  auVar201._0_4_ = auVar222._0_4_ * auVar200._0_4_;
                  auVar201._4_4_ = auVar222._4_4_ * auVar200._4_4_;
                  auVar201._8_4_ = auVar222._8_4_ * auVar200._8_4_;
                  auVar201._12_4_ = auVar222._12_4_ * auVar200._12_4_;
                  auVar229._0_4_ = auVar356._0_4_ * auVar194._0_4_;
                  auVar229._4_4_ = auVar356._4_4_ * auVar194._4_4_;
                  auVar229._8_4_ = auVar356._8_4_ * auVar194._8_4_;
                  auVar229._12_4_ = auVar356._12_4_ * auVar194._12_4_;
                  auVar191 = vsubps_avx(auVar229,auVar201);
                  auVar194 = vshufps_avx(auVar191,auVar191,0xc9);
                  auVar222 = vshufps_avx(auVar146,auVar146,0xc9);
                  auVar230._0_4_ = auVar222._0_4_ * auVar194._0_4_;
                  auVar230._4_4_ = auVar222._4_4_ * auVar194._4_4_;
                  auVar230._8_4_ = auVar222._8_4_ * auVar194._8_4_;
                  auVar230._12_4_ = auVar222._12_4_ * auVar194._12_4_;
                  auVar194 = vshufps_avx(auVar191,auVar191,0xd2);
                  auVar147._0_4_ = auVar146._0_4_ * auVar194._0_4_;
                  auVar147._4_4_ = auVar146._4_4_ * auVar194._4_4_;
                  auVar147._8_4_ = auVar146._8_4_ * auVar194._8_4_;
                  auVar147._12_4_ = auVar146._12_4_ * auVar194._12_4_;
                  auVar222 = vsubps_avx(auVar230,auVar147);
                  auVar194 = vshufps_avx(auVar222,auVar222,0xe9);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    (ray->super_RayK<1>).tfar = fVar187;
                    uVar8 = vmovlps_avx(auVar194);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar8;
                    (ray->Ng).field_0.field_0.z = auVar222._0_4_;
                    ray->u = fVar213;
                    ray->v = 0.0;
                    ray->primID = local_880._0_4_;
                    ray->geomID = uVar107;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_990 = vmovlps_avx(auVar194);
                    local_988 = auVar222._0_4_;
                    local_984 = fVar213;
                    local_980 = 0;
                    local_97c = local_880._0_4_;
                    local_978 = uVar107;
                    local_974 = context->user->instID[0];
                    local_970 = context->user->instPrimID[0];
                    (ray->super_RayK<1>).tfar = fVar187;
                    local_ac4 = -1;
                    local_af8.valid = &local_ac4;
                    local_af8.geometryUserPtr = pGVar20->userPtr;
                    local_af8.context = context->user;
                    local_af8.hit = (RTCHitN *)&local_990;
                    local_af8.N = 1;
                    local_af8.ray = (RTCRayN *)ray;
                    if (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b2ee8b:
                      p_Var24 = context->args->filter;
                      if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar305 = ZEXT1664(auVar305._0_16_);
                        auVar345 = ZEXT1664(auVar345._0_16_);
                        (*p_Var24)(&local_af8);
                        auVar364 = ZEXT3264(_local_a20);
                        auVar377 = ZEXT3264(_local_a00);
                        auVar394 = ZEXT3264(_local_940);
                        auVar424 = ZEXT3264(_local_a80);
                        if (*local_af8.valid == 0) goto LAB_00b2ef46;
                      }
                      (((Vec3f *)((long)local_af8.ray + 0x30))->field_0).components[0] =
                           *(float *)local_af8.hit;
                      (((Vec3f *)((long)local_af8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_af8.hit + 4);
                      (((Vec3f *)((long)local_af8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_af8.hit + 8);
                      *(float *)((long)local_af8.ray + 0x3c) = *(float *)(local_af8.hit + 0xc);
                      *(float *)((long)local_af8.ray + 0x40) = *(float *)(local_af8.hit + 0x10);
                      *(float *)((long)local_af8.ray + 0x44) = *(float *)(local_af8.hit + 0x14);
                      *(float *)((long)local_af8.ray + 0x48) = *(float *)(local_af8.hit + 0x18);
                      *(float *)((long)local_af8.ray + 0x4c) = *(float *)(local_af8.hit + 0x1c);
                      *(float *)((long)local_af8.ray + 0x50) = *(float *)(local_af8.hit + 0x20);
                    }
                    else {
                      auVar305 = ZEXT1664(auVar305._0_16_);
                      auVar345 = ZEXT1664(auVar119);
                      (*pGVar20->intersectionFilterN)(&local_af8);
                      auVar364 = ZEXT3264(_local_a20);
                      auVar377 = ZEXT3264(_local_a00);
                      auVar394 = ZEXT3264(_local_940);
                      auVar424 = ZEXT3264(_local_a80);
                      if (*local_af8.valid != 0) goto LAB_00b2ee8b;
LAB_00b2ef46:
                      (ray->super_RayK<1>).tfar = fVar212;
                    }
                  }
                }
              }
            }
LAB_00b2ed5a:
            fVar187 = (ray->super_RayK<1>).tfar;
            auVar165._4_4_ = fVar187;
            auVar165._0_4_ = fVar187;
            auVar165._8_4_ = fVar187;
            auVar165._12_4_ = fVar187;
            auVar165._16_4_ = fVar187;
            auVar165._20_4_ = fVar187;
            auVar165._24_4_ = fVar187;
            auVar165._28_4_ = fVar187;
            auVar148 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
            auVar159 = vcmpps_avx(_local_720,auVar165,2);
            auVar159 = vandps_avx(auVar159,local_6a0);
            fVar187 = (float)local_860._0_4_;
            fVar390 = (float)local_860._4_4_;
            fVar395 = fStack_858;
            fVar396 = fStack_854;
            fVar397 = fStack_850;
            fVar398 = fStack_84c;
            fVar399 = fStack_848;
            fVar271 = fStack_844;
          }
          auVar159 = vandps_avx(local_620,local_600);
          auVar25 = vandps_avx(_local_760,_local_740);
          auVar239._0_4_ = fVar187 + local_580._0_4_;
          auVar239._4_4_ = fVar390 + local_580._4_4_;
          auVar239._8_4_ = fVar395 + local_580._8_4_;
          auVar239._12_4_ = fVar396 + local_580._12_4_;
          auVar239._16_4_ = fVar397 + local_580._16_4_;
          auVar239._20_4_ = fVar398 + local_580._20_4_;
          auVar239._24_4_ = fVar399 + local_580._24_4_;
          auVar239._28_4_ = fVar271 + local_580._28_4_;
          auVar194 = vshufps_avx(auVar148._0_16_,auVar148._0_16_,0);
          auVar261._16_16_ = auVar194;
          auVar261._0_16_ = auVar194;
          auVar148 = vcmpps_avx(auVar239,auVar261,2);
          auVar148 = vandps_avx(auVar148,auVar159);
          auVar240._0_4_ = fVar187 + local_5c0._0_4_;
          auVar240._4_4_ = fVar390 + local_5c0._4_4_;
          auVar240._8_4_ = fVar395 + local_5c0._8_4_;
          auVar240._12_4_ = fVar396 + local_5c0._12_4_;
          auVar240._16_4_ = fVar397 + local_5c0._16_4_;
          auVar240._20_4_ = fVar398 + local_5c0._20_4_;
          auVar240._24_4_ = fVar399 + local_5c0._24_4_;
          auVar240._28_4_ = fVar271 + local_5c0._28_4_;
          auVar159 = vcmpps_avx(auVar240,auVar261,2);
          auVar159 = vandps_avx(auVar159,auVar25);
          auVar159 = vorps_avx(auVar148,auVar159);
          auVar424 = ZEXT3264(auVar424._0_32_);
          if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar159 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar159 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar159 >> 0x7f,0) != '\0') ||
                (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar159 >> 0xbf,0) != '\0') ||
              (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar159[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar109 * 0x60) = auVar159;
            auVar148 = vblendvps_avx(_local_5c0,local_580,auVar148);
            *(undefined1 (*) [32])(auStack_160 + uVar109 * 0x60) = auVar148;
            uVar105 = vmovlps_avx(local_5d0);
            (&uStack_140)[uVar109 * 0xc] = uVar105;
            auStack_138[uVar109 * 0x18] = local_b8c + 1;
            uVar109 = (ulong)((int)uVar109 + 1);
          }
          goto LAB_00b2d69b;
        }
      }
      auVar424 = ZEXT3264(_local_a80);
      auVar394 = ZEXT3264(_local_940);
      auVar377 = ZEXT3264(_local_a00);
      auVar364 = ZEXT3264(_local_a20);
    }
LAB_00b2d69b:
    fVar212 = (ray->super_RayK<1>).tfar;
    auVar129._4_4_ = fVar212;
    auVar129._0_4_ = fVar212;
    auVar129._8_4_ = fVar212;
    auVar129._12_4_ = fVar212;
    auVar129._16_4_ = fVar212;
    auVar129._20_4_ = fVar212;
    auVar129._24_4_ = fVar212;
    auVar129._28_4_ = fVar212;
    while( true ) {
      uVar108 = (uint)uVar109;
      if (uVar108 == 0) {
        auVar148 = vcmpps_avx(local_340,auVar129,2);
        uVar107 = vmovmskps_avx(auVar148);
        uVar104 = (ulong)((uint)uVar104 - 1 & (uint)uVar104 & uVar107);
        goto LAB_00b2c507;
      }
      uVar105 = (ulong)(uVar108 - 1);
      lVar112 = uVar105 * 0x60;
      auVar148 = *(undefined1 (*) [32])(auStack_160 + lVar112);
      auVar158._0_4_ = fVar187 + auVar148._0_4_;
      auVar158._4_4_ = fVar390 + auVar148._4_4_;
      auVar158._8_4_ = fVar395 + auVar148._8_4_;
      auVar158._12_4_ = fVar396 + auVar148._12_4_;
      auVar158._16_4_ = fVar397 + auVar148._16_4_;
      auVar158._20_4_ = fVar398 + auVar148._20_4_;
      auVar158._24_4_ = fVar399 + auVar148._24_4_;
      auVar158._28_4_ = fVar271 + auVar148._28_4_;
      auVar25 = vcmpps_avx(auVar158,auVar129,2);
      auVar159 = vandps_avx(auVar25,*(undefined1 (*) [32])(auStack_180 + lVar112));
      local_580 = auVar159;
      auVar25 = *(undefined1 (*) [32])(auStack_180 + lVar112) & auVar25;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0x7f,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0xbf,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar25[0x1f] < '\0') break;
      uVar109 = (ulong)(uVar108 - 1);
    }
    auVar130._8_4_ = 0x7f800000;
    auVar130._0_8_ = 0x7f8000007f800000;
    auVar130._12_4_ = 0x7f800000;
    auVar130._16_4_ = 0x7f800000;
    auVar130._20_4_ = 0x7f800000;
    auVar130._24_4_ = 0x7f800000;
    auVar130._28_4_ = 0x7f800000;
    auVar148 = vblendvps_avx(auVar130,auVar148,auVar159);
    auVar25 = vshufps_avx(auVar148,auVar148,0xb1);
    auVar25 = vminps_avx(auVar148,auVar25);
    auVar342 = vshufpd_avx(auVar25,auVar25,5);
    auVar25 = vminps_avx(auVar25,auVar342);
    auVar342 = vperm2f128_avx(auVar25,auVar25,1);
    auVar25 = vminps_avx(auVar25,auVar342);
    auVar148 = vcmpps_avx(auVar148,auVar25,0);
    auVar25 = auVar159 & auVar148;
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0x7f,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0xbf,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0')
    {
      auVar159 = vandps_avx(auVar148,auVar159);
    }
    auVar117._8_8_ = 0;
    auVar117._0_8_ = (&uStack_140)[uVar105 * 0xc];
    local_b8c = auStack_138[uVar105 * 0x18];
    uVar106 = vmovmskps_avx(auVar159);
    uVar103 = 0;
    if (uVar106 != 0) {
      for (; (uVar106 >> uVar103 & 1) == 0; uVar103 = uVar103 + 1) {
      }
    }
    *(undefined4 *)(local_580 + (ulong)uVar103 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar112) = local_580;
    uVar106 = uVar108 - 1;
    if ((((((((local_580 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_580 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_580 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_580 >> 0x7f,0) != '\0') ||
          (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_580 >> 0xbf,0) != '\0') ||
        (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_580[0x1f] < '\0') {
      uVar106 = uVar108;
    }
    auVar194 = vshufps_avx(auVar117,auVar117,0);
    auVar222 = vshufps_avx(auVar117,auVar117,0x55);
    auVar222 = vsubps_avx(auVar222,auVar194);
    local_5c0._4_4_ = auVar194._4_4_ + auVar222._4_4_ * 0.14285715;
    local_5c0._0_4_ = auVar194._0_4_ + auVar222._0_4_ * 0.0;
    fStack_5b8 = auVar194._8_4_ + auVar222._8_4_ * 0.2857143;
    fStack_5b4 = auVar194._12_4_ + auVar222._12_4_ * 0.42857146;
    fStack_5b0 = auVar194._0_4_ + auVar222._0_4_ * 0.5714286;
    fStack_5ac = auVar194._4_4_ + auVar222._4_4_ * 0.71428573;
    fStack_5a8 = auVar194._8_4_ + auVar222._8_4_ * 0.8571429;
    fStack_5a4 = auVar194._12_4_ + auVar222._12_4_;
    local_5d0._8_8_ = 0;
    local_5d0._0_8_ = *(ulong *)(local_5c0 + (ulong)uVar103 * 4);
    uVar109 = (ulong)uVar106;
    uVar105 = local_880._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }